

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx::CurveNvIntersector1<4>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  undefined1 (*pauVar4) [32];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  Primitive PVar14;
  uint uVar15;
  uint uVar16;
  Geometry *pGVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [28];
  undefined1 auVar110 [28];
  undefined1 auVar111 [28];
  undefined1 auVar112 [28];
  undefined1 auVar113 [24];
  uint uVar114;
  uint uVar115;
  uint uVar116;
  long lVar117;
  ulong uVar118;
  Primitive *pPVar119;
  long lVar120;
  ulong uVar121;
  long lVar122;
  float fVar123;
  float fVar141;
  float fVar143;
  vint4 bi_2;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar150;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar151;
  float fVar164;
  float fVar165;
  vint4 bi_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar169;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar155 [32];
  float fVar167;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar166;
  float fVar168;
  float fVar170;
  float fVar174;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  float fVar175;
  float fVar190;
  float fVar191;
  vint4 ai;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar192;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar193;
  float fVar202;
  float fVar204;
  vint4 ai_2;
  undefined1 auVar198 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar206;
  undefined1 auVar197 [16];
  float fVar194;
  float fVar203;
  float fVar205;
  float fVar207;
  float fVar208;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar209;
  float fVar217;
  float fVar219;
  undefined1 auVar211 [16];
  float fVar222;
  undefined1 auVar212 [16];
  float fVar210;
  undefined1 auVar213 [16];
  float fVar225;
  undefined1 auVar214 [32];
  float fVar218;
  float fVar220;
  float fVar221;
  float fVar223;
  float fVar224;
  undefined1 auVar215 [32];
  float fVar226;
  float fVar227;
  undefined1 auVar216 [32];
  vint4 bi;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar237;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar238;
  float fVar244;
  float fVar245;
  vint4 ai_1;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar247;
  float fVar249;
  undefined1 auVar242 [32];
  float fVar246;
  float fVar248;
  float fVar250;
  float fVar251;
  undefined1 auVar243 [32];
  float fVar252;
  float fVar261;
  float fVar262;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  float fVar263;
  float fVar264;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [64];
  float fVar265;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar273;
  float fVar275;
  float fVar277;
  undefined1 auVar268 [32];
  float fVar279;
  undefined1 auVar269 [32];
  float fVar271;
  float fVar272;
  float fVar274;
  float fVar276;
  float fVar278;
  float fVar280;
  undefined1 auVar270 [64];
  undefined1 auVar281 [16];
  float fVar286;
  float fVar287;
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [16];
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar308;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar309;
  float fVar310;
  float fVar311;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  float fVar312;
  undefined1 auVar313 [32];
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar314 [64];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_7c4;
  ulong local_7c0;
  Geometry *local_7b8;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  Precalculations *local_758;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6b0 [8];
  undefined8 uStack_6a8;
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  undefined1 local_690 [8];
  undefined8 uStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5e0;
  undefined4 local_5d8;
  float local_5d4;
  undefined4 local_5d0;
  uint local_5cc;
  undefined4 local_5c8;
  uint local_5c4;
  uint local_5c0;
  RayHit *local_5b0;
  RayQueryContext *local_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 auStack_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [2] [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  uint local_200;
  uint local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar285 [64];
  undefined1 auVar292 [12];
  undefined1 auVar305 [32];
  
  PVar14 = prim[1];
  uVar121 = (ulong)(byte)PVar14;
  pPVar119 = prim + uVar121 * 0x19 + 0x16;
  fVar193 = *(float *)(prim + uVar121 * 0x19 + 0x12);
  auVar232 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar121 * 0x19 + 6));
  auVar253._0_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar253._4_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar253._8_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar253._12_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar176._0_4_ = fVar193 * auVar232._0_4_;
  auVar176._4_4_ = fVar193 * auVar232._4_4_;
  auVar176._8_4_ = fVar193 * auVar232._8_4_;
  auVar176._12_4_ = fVar193 * auVar232._12_4_;
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 4 + 6)));
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 5 + 6)));
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 6 + 6)));
  auVar213 = vcvtdq2ps_avx(auVar213);
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 0xb + 6)));
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 0xc + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 0xd + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 0x12 + 6)));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 0x13 + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar153 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 0x14 + 6)));
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar124 = vshufps_avx(auVar253,auVar253,0);
  auVar152 = vshufps_avx(auVar253,auVar253,0x55);
  auVar177 = vshufps_avx(auVar253,auVar253,0xaa);
  fVar193 = auVar177._0_4_;
  fVar209 = auVar177._4_4_;
  fVar202 = auVar177._8_4_;
  fVar217 = auVar177._12_4_;
  fVar265 = auVar152._0_4_;
  fVar271 = auVar152._4_4_;
  fVar272 = auVar152._8_4_;
  fVar274 = auVar152._12_4_;
  fVar204 = auVar124._0_4_;
  fVar219 = auVar124._4_4_;
  fVar206 = auVar124._8_4_;
  fVar222 = auVar124._12_4_;
  auVar298._0_4_ = fVar204 * auVar232._0_4_ + fVar265 * auVar183._0_4_ + fVar193 * auVar213._0_4_;
  auVar298._4_4_ = fVar219 * auVar232._4_4_ + fVar271 * auVar183._4_4_ + fVar209 * auVar213._4_4_;
  auVar298._8_4_ = fVar206 * auVar232._8_4_ + fVar272 * auVar183._8_4_ + fVar202 * auVar213._8_4_;
  auVar298._12_4_ =
       fVar222 * auVar232._12_4_ + fVar274 * auVar183._12_4_ + fVar217 * auVar213._12_4_;
  auVar303._0_4_ = fVar204 * auVar198._0_4_ + fVar265 * auVar20._0_4_ + auVar21._0_4_ * fVar193;
  auVar303._4_4_ = fVar219 * auVar198._4_4_ + fVar271 * auVar20._4_4_ + auVar21._4_4_ * fVar209;
  auVar303._8_4_ = fVar206 * auVar198._8_4_ + fVar272 * auVar20._8_4_ + auVar21._8_4_ * fVar202;
  auVar303._12_4_ = fVar222 * auVar198._12_4_ + fVar274 * auVar20._12_4_ + auVar21._12_4_ * fVar217;
  auVar254._0_4_ = fVar204 * auVar125._0_4_ + fVar265 * auVar126._0_4_ + auVar153._0_4_ * fVar193;
  auVar254._4_4_ = fVar219 * auVar125._4_4_ + fVar271 * auVar126._4_4_ + auVar153._4_4_ * fVar209;
  auVar254._8_4_ = fVar206 * auVar125._8_4_ + fVar272 * auVar126._8_4_ + auVar153._8_4_ * fVar202;
  auVar254._12_4_ =
       fVar222 * auVar125._12_4_ + fVar274 * auVar126._12_4_ + auVar153._12_4_ * fVar217;
  auVar124 = vshufps_avx(auVar176,auVar176,0);
  auVar152 = vshufps_avx(auVar176,auVar176,0x55);
  auVar177 = vshufps_avx(auVar176,auVar176,0xaa);
  fVar193 = auVar177._0_4_;
  fVar209 = auVar177._4_4_;
  fVar202 = auVar177._8_4_;
  fVar217 = auVar177._12_4_;
  fVar265 = auVar152._0_4_;
  fVar271 = auVar152._4_4_;
  fVar272 = auVar152._8_4_;
  fVar274 = auVar152._12_4_;
  fVar204 = auVar124._0_4_;
  fVar219 = auVar124._4_4_;
  fVar206 = auVar124._8_4_;
  fVar222 = auVar124._12_4_;
  auVar228._0_4_ = fVar204 * auVar232._0_4_ + fVar265 * auVar183._0_4_ + fVar193 * auVar213._0_4_;
  auVar228._4_4_ = fVar219 * auVar232._4_4_ + fVar271 * auVar183._4_4_ + fVar209 * auVar213._4_4_;
  auVar228._8_4_ = fVar206 * auVar232._8_4_ + fVar272 * auVar183._8_4_ + fVar202 * auVar213._8_4_;
  auVar228._12_4_ =
       fVar222 * auVar232._12_4_ + fVar274 * auVar183._12_4_ + fVar217 * auVar213._12_4_;
  auVar152._0_4_ = fVar204 * auVar198._0_4_ + auVar21._0_4_ * fVar193 + fVar265 * auVar20._0_4_;
  auVar152._4_4_ = fVar219 * auVar198._4_4_ + auVar21._4_4_ * fVar209 + fVar271 * auVar20._4_4_;
  auVar152._8_4_ = fVar206 * auVar198._8_4_ + auVar21._8_4_ * fVar202 + fVar272 * auVar20._8_4_;
  auVar152._12_4_ = fVar222 * auVar198._12_4_ + auVar21._12_4_ * fVar217 + fVar274 * auVar20._12_4_;
  auVar124._0_4_ = fVar204 * auVar125._0_4_ + fVar265 * auVar126._0_4_ + auVar153._0_4_ * fVar193;
  auVar124._4_4_ = fVar219 * auVar125._4_4_ + fVar271 * auVar126._4_4_ + auVar153._4_4_ * fVar209;
  auVar124._8_4_ = fVar206 * auVar125._8_4_ + fVar272 * auVar126._8_4_ + auVar153._8_4_ * fVar202;
  auVar124._12_4_ =
       fVar222 * auVar125._12_4_ + fVar274 * auVar126._12_4_ + auVar153._12_4_ * fVar217;
  auVar239._8_4_ = 0x7fffffff;
  auVar239._0_8_ = 0x7fffffff7fffffff;
  auVar239._12_4_ = 0x7fffffff;
  auVar232 = vandps_avx(auVar298,auVar239);
  auVar195._8_4_ = 0x219392ef;
  auVar195._0_8_ = 0x219392ef219392ef;
  auVar195._12_4_ = 0x219392ef;
  auVar232 = vcmpps_avx(auVar232,auVar195,1);
  auVar183 = vblendvps_avx(auVar298,auVar195,auVar232);
  auVar232 = vandps_avx(auVar303,auVar239);
  auVar232 = vcmpps_avx(auVar232,auVar195,1);
  auVar213 = vblendvps_avx(auVar303,auVar195,auVar232);
  auVar232 = vandps_avx(auVar254,auVar239);
  auVar232 = vcmpps_avx(auVar232,auVar195,1);
  auVar232 = vblendvps_avx(auVar254,auVar195,auVar232);
  auVar198 = vrcpps_avx(auVar183);
  fVar265 = auVar198._0_4_;
  auVar177._0_4_ = fVar265 * auVar183._0_4_;
  fVar271 = auVar198._4_4_;
  auVar177._4_4_ = fVar271 * auVar183._4_4_;
  fVar272 = auVar198._8_4_;
  auVar177._8_4_ = fVar272 * auVar183._8_4_;
  fVar274 = auVar198._12_4_;
  auVar177._12_4_ = fVar274 * auVar183._12_4_;
  auVar255._8_4_ = 0x3f800000;
  auVar255._0_8_ = 0x3f8000003f800000;
  auVar255._12_4_ = 0x3f800000;
  auVar183 = vsubps_avx(auVar255,auVar177);
  fVar265 = fVar265 + fVar265 * auVar183._0_4_;
  fVar271 = fVar271 + fVar271 * auVar183._4_4_;
  fVar272 = fVar272 + fVar272 * auVar183._8_4_;
  fVar274 = fVar274 + fVar274 * auVar183._12_4_;
  auVar183 = vrcpps_avx(auVar213);
  fVar193 = auVar183._0_4_;
  auVar196._0_4_ = fVar193 * auVar213._0_4_;
  fVar202 = auVar183._4_4_;
  auVar196._4_4_ = fVar202 * auVar213._4_4_;
  fVar204 = auVar183._8_4_;
  auVar196._8_4_ = fVar204 * auVar213._8_4_;
  fVar206 = auVar183._12_4_;
  auVar196._12_4_ = fVar206 * auVar213._12_4_;
  auVar183 = vsubps_avx(auVar255,auVar196);
  fVar193 = fVar193 + fVar193 * auVar183._0_4_;
  fVar202 = fVar202 + fVar202 * auVar183._4_4_;
  fVar204 = fVar204 + fVar204 * auVar183._8_4_;
  fVar206 = fVar206 + fVar206 * auVar183._12_4_;
  auVar183 = vrcpps_avx(auVar232);
  fVar209 = auVar183._0_4_;
  auVar211._0_4_ = fVar209 * auVar232._0_4_;
  fVar217 = auVar183._4_4_;
  auVar211._4_4_ = fVar217 * auVar232._4_4_;
  fVar219 = auVar183._8_4_;
  auVar211._8_4_ = fVar219 * auVar232._8_4_;
  fVar222 = auVar183._12_4_;
  auVar211._12_4_ = fVar222 * auVar232._12_4_;
  auVar183 = vsubps_avx(auVar255,auVar211);
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + uVar121 * 7 + 6);
  auVar232 = vpmovsxwd_avx(auVar232);
  fVar209 = fVar209 + fVar209 * auVar183._0_4_;
  fVar217 = fVar217 + fVar217 * auVar183._4_4_;
  fVar219 = fVar219 + fVar219 * auVar183._8_4_;
  fVar222 = fVar222 + fVar222 * auVar183._12_4_;
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar232 = vsubps_avx(auVar232,auVar228);
  auVar178._0_4_ = fVar265 * auVar232._0_4_;
  auVar178._4_4_ = fVar271 * auVar232._4_4_;
  auVar178._8_4_ = fVar272 * auVar232._8_4_;
  auVar178._12_4_ = fVar274 * auVar232._12_4_;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar121 * 9 + 6);
  auVar232 = vpmovsxwd_avx(auVar183);
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar183 = vsubps_avx(auVar232,auVar228);
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *(ulong *)(prim + uVar121 * 0xe + 6);
  auVar232 = vpmovsxwd_avx(auVar213);
  auVar229._0_4_ = fVar265 * auVar183._0_4_;
  auVar229._4_4_ = fVar271 * auVar183._4_4_;
  auVar229._8_4_ = fVar272 * auVar183._8_4_;
  auVar229._12_4_ = fVar274 * auVar183._12_4_;
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar232 = vsubps_avx(auVar232,auVar152);
  auVar240._0_4_ = auVar232._0_4_ * fVar193;
  auVar240._4_4_ = auVar232._4_4_ * fVar202;
  auVar240._8_4_ = auVar232._8_4_ * fVar204;
  auVar240._12_4_ = auVar232._12_4_ * fVar206;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  auVar232 = vpmovsxwd_avx(auVar198);
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar232 = vsubps_avx(auVar232,auVar152);
  auVar153._0_4_ = fVar193 * auVar232._0_4_;
  auVar153._4_4_ = fVar202 * auVar232._4_4_;
  auVar153._8_4_ = fVar204 * auVar232._8_4_;
  auVar153._12_4_ = fVar206 * auVar232._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar121 * 0x15 + 6);
  auVar232 = vpmovsxwd_avx(auVar20);
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar183 = vsubps_avx(auVar232,auVar124);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar121 * 0x17 + 6);
  auVar232 = vpmovsxwd_avx(auVar21);
  auVar197._0_4_ = auVar183._0_4_ * fVar209;
  auVar197._4_4_ = auVar183._4_4_ * fVar217;
  auVar197._8_4_ = auVar183._8_4_ * fVar219;
  auVar197._12_4_ = auVar183._12_4_ * fVar222;
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar232 = vsubps_avx(auVar232,auVar124);
  auVar125._0_4_ = auVar232._0_4_ * fVar209;
  auVar125._4_4_ = auVar232._4_4_ * fVar217;
  auVar125._8_4_ = auVar232._8_4_ * fVar219;
  auVar125._12_4_ = auVar232._12_4_ * fVar222;
  auVar232 = vpminsd_avx(auVar178,auVar229);
  auVar183 = vpminsd_avx(auVar240,auVar153);
  auVar232 = vmaxps_avx(auVar232,auVar183);
  auVar183 = vpminsd_avx(auVar197,auVar125);
  uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar281._4_4_ = uVar11;
  auVar281._0_4_ = uVar11;
  auVar281._8_4_ = uVar11;
  auVar281._12_4_ = uVar11;
  auVar285 = ZEXT1664(auVar281);
  auVar183 = vmaxps_avx(auVar183,auVar281);
  auVar232 = vmaxps_avx(auVar232,auVar183);
  auVar270 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
  local_270._0_4_ = auVar232._0_4_ * 0.99999964;
  local_270._4_4_ = auVar232._4_4_ * 0.99999964;
  local_270._8_4_ = auVar232._8_4_ * 0.99999964;
  local_270._12_4_ = auVar232._12_4_ * 0.99999964;
  auVar232 = vpmaxsd_avx(auVar178,auVar229);
  auVar183 = vpmaxsd_avx(auVar240,auVar153);
  auVar232 = vminps_avx(auVar232,auVar183);
  auVar183 = vpmaxsd_avx(auVar197,auVar125);
  fVar193 = (ray->super_RayK<1>).tfar;
  auVar179._4_4_ = fVar193;
  auVar179._0_4_ = fVar193;
  auVar179._8_4_ = fVar193;
  auVar179._12_4_ = fVar193;
  auVar183 = vminps_avx(auVar183,auVar179);
  auVar232 = vminps_avx(auVar232,auVar183);
  auVar183 = vpshufd_avx(ZEXT116((byte)PVar14),0);
  auVar183 = vpcmpgtd_avx(auVar183,_DAT_01f4ad30);
  auVar126._0_4_ = auVar232._0_4_ * 1.0000004;
  auVar126._4_4_ = auVar232._4_4_ * 1.0000004;
  auVar126._8_4_ = auVar232._8_4_ * 1.0000004;
  auVar126._12_4_ = auVar232._12_4_ * 1.0000004;
  auVar232 = vcmpps_avx(local_270,auVar126,2);
  auVar232 = vandps_avx(auVar232,auVar183);
  uVar114 = vmovmskps_avx(auVar232);
  local_460[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_460[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_460[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_460[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_758 = pre;
  do {
    uVar121 = (ulong)uVar114;
    if (uVar121 == 0) {
      return;
    }
    local_680 = auVar285._0_32_;
    local_6e0 = auVar270._0_32_;
    lVar117 = 0;
    if (uVar121 != 0) {
      for (; (uVar114 >> lVar117 & 1) == 0; lVar117 = lVar117 + 1) {
      }
    }
    uVar121 = uVar121 - 1 & uVar121;
    uVar114 = *(uint *)(prim + lVar117 * 4 + 6);
    lVar117 = lVar117 * 0x40;
    lVar120 = 0;
    if (uVar121 != 0) {
      for (; (uVar121 >> lVar120 & 1) == 0; lVar120 = lVar120 + 1) {
      }
    }
    uVar15 = *(uint *)(prim + 2);
    local_7c0 = (ulong)uVar15;
    pGVar17 = (context->scene->geometries).items[uVar15].ptr;
    pPVar1 = pPVar119 + lVar117;
    local_1f0 = *(undefined8 *)pPVar1;
    uStack_1e8 = *(undefined8 *)(pPVar1 + 8);
    local_7b0 = (float)local_1f0;
    fStack_7ac = (float)((ulong)local_1f0 >> 0x20);
    fStack_7a8 = (float)uStack_1e8;
    fStack_7a4 = (float)((ulong)uStack_1e8 >> 0x20);
    if (((uVar121 != 0) && (uVar118 = uVar121 - 1 & uVar121, uVar118 != 0)) &&
       (lVar120 = 0, uVar118 != 0)) {
      for (; (uVar118 >> lVar120 & 1) == 0; lVar120 = lVar120 + 1) {
      }
    }
    _local_690 = *(undefined1 (*) [16])(pPVar119 + lVar117 + 0x10);
    _local_6a0 = *(undefined1 (*) [16])(pPVar119 + lVar117 + 0x20);
    _local_6b0 = *(undefined1 (*) [16])(pPVar119 + lVar117 + 0x30);
    uVar16 = (uint)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar13 = (ray->super_RayK<1>).org.field_0;
    auVar104._12_4_ = fStack_7a4;
    auVar104._0_12_ = *(undefined1 (*) [12])pPVar1;
    auVar213 = vsubps_avx(auVar104,(undefined1  [16])aVar13);
    auVar232 = vshufps_avx(auVar213,auVar213,0);
    auVar183 = vshufps_avx(auVar213,auVar213,0x55);
    auVar213 = vshufps_avx(auVar213,auVar213,0xaa);
    fVar193 = (pre->ray_space).vx.field_0.m128[0];
    fVar209 = (pre->ray_space).vx.field_0.m128[1];
    fVar202 = (pre->ray_space).vx.field_0.m128[2];
    fVar217 = (pre->ray_space).vx.field_0.m128[3];
    fVar204 = (pre->ray_space).vy.field_0.m128[0];
    fVar219 = (pre->ray_space).vy.field_0.m128[1];
    fVar206 = (pre->ray_space).vy.field_0.m128[2];
    fVar222 = (pre->ray_space).vy.field_0.m128[3];
    fVar265 = (pre->ray_space).vz.field_0.m128[0];
    fVar271 = (pre->ray_space).vz.field_0.m128[1];
    fVar272 = (pre->ray_space).vz.field_0.m128[2];
    fVar274 = (pre->ray_space).vz.field_0.m128[3];
    auVar212._0_4_ = auVar232._0_4_ * fVar193 + auVar213._0_4_ * fVar265 + auVar183._0_4_ * fVar204;
    auVar212._4_4_ = auVar232._4_4_ * fVar209 + auVar213._4_4_ * fVar271 + auVar183._4_4_ * fVar219;
    auVar212._8_4_ = auVar232._8_4_ * fVar202 + auVar213._8_4_ * fVar272 + auVar183._8_4_ * fVar206;
    auVar212._12_4_ =
         auVar232._12_4_ * fVar217 + auVar213._12_4_ * fVar274 + auVar183._12_4_ * fVar222;
    auVar232 = vblendps_avx(auVar212,auVar104,8);
    auVar198 = vsubps_avx(_local_690,(undefined1  [16])aVar13);
    auVar183 = vshufps_avx(auVar198,auVar198,0);
    auVar213 = vshufps_avx(auVar198,auVar198,0x55);
    auVar198 = vshufps_avx(auVar198,auVar198,0xaa);
    auVar230._0_4_ = auVar183._0_4_ * fVar193 + auVar198._0_4_ * fVar265 + auVar213._0_4_ * fVar204;
    auVar230._4_4_ = auVar183._4_4_ * fVar209 + auVar198._4_4_ * fVar271 + auVar213._4_4_ * fVar219;
    auVar230._8_4_ = auVar183._8_4_ * fVar202 + auVar198._8_4_ * fVar272 + auVar213._8_4_ * fVar206;
    auVar230._12_4_ =
         auVar183._12_4_ * fVar217 + auVar198._12_4_ * fVar274 + auVar213._12_4_ * fVar222;
    _local_7a0 = auVar230;
    auVar183 = vblendps_avx(auVar230,_local_690,8);
    auVar20 = vsubps_avx(_local_6a0,(undefined1  [16])aVar13);
    auVar213 = vshufps_avx(auVar20,auVar20,0);
    auVar198 = vshufps_avx(auVar20,auVar20,0x55);
    auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
    auVar256._0_4_ = auVar213._0_4_ * fVar193 + auVar198._0_4_ * fVar204 + auVar20._0_4_ * fVar265;
    auVar256._4_4_ = auVar213._4_4_ * fVar209 + auVar198._4_4_ * fVar219 + auVar20._4_4_ * fVar271;
    auVar256._8_4_ = auVar213._8_4_ * fVar202 + auVar198._8_4_ * fVar206 + auVar20._8_4_ * fVar272;
    auVar256._12_4_ =
         auVar213._12_4_ * fVar217 + auVar198._12_4_ * fVar222 + auVar20._12_4_ * fVar274;
    auVar213 = vblendps_avx(auVar256,_local_6a0,8);
    auVar21 = vsubps_avx(_local_6b0,(undefined1  [16])aVar13);
    auVar198 = vshufps_avx(auVar21,auVar21,0);
    auVar20 = vshufps_avx(auVar21,auVar21,0x55);
    auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
    auVar154._0_4_ = auVar198._0_4_ * fVar193 + auVar21._0_4_ * fVar265 + auVar20._0_4_ * fVar204;
    auVar154._4_4_ = auVar198._4_4_ * fVar209 + auVar21._4_4_ * fVar271 + auVar20._4_4_ * fVar219;
    auVar154._8_4_ = auVar198._8_4_ * fVar202 + auVar21._8_4_ * fVar272 + auVar20._8_4_ * fVar206;
    auVar154._12_4_ =
         auVar198._12_4_ * fVar217 + auVar21._12_4_ * fVar274 + auVar20._12_4_ * fVar222;
    auVar198 = vblendps_avx(auVar154,_local_6b0,8);
    auVar241._8_4_ = 0x7fffffff;
    auVar241._0_8_ = 0x7fffffff7fffffff;
    auVar241._12_4_ = 0x7fffffff;
    auVar232 = vandps_avx(auVar232,auVar241);
    auVar183 = vandps_avx(auVar183,auVar241);
    auVar20 = vmaxps_avx(auVar232,auVar183);
    auVar232 = vandps_avx(auVar213,auVar241);
    auVar183 = vandps_avx(auVar198,auVar241);
    auVar232 = vmaxps_avx(auVar232,auVar183);
    auVar232 = vmaxps_avx(auVar20,auVar232);
    auVar183 = vmovshdup_avx(auVar232);
    auVar183 = vmaxss_avx(auVar183,auVar232);
    auVar232 = vshufpd_avx(auVar232,auVar232,1);
    auVar232 = vmaxss_avx(auVar232,auVar183);
    lVar117 = (long)(int)uVar16;
    lVar120 = lVar117 * 0x44;
    fVar293 = *(float *)(bspline_basis0 + lVar120 + 0x908);
    fVar308 = *(float *)(bspline_basis0 + lVar120 + 0x90c);
    fVar295 = *(float *)(bspline_basis0 + lVar120 + 0x910);
    fVar294 = *(float *)(bspline_basis0 + lVar120 + 0x914);
    fVar296 = *(float *)(bspline_basis0 + lVar120 + 0x918);
    fVar297 = *(float *)(bspline_basis0 + lVar120 + 0x91c);
    fVar208 = *(float *)(bspline_basis0 + lVar120 + 0x920);
    auVar183 = vshufps_avx(auVar256,auVar256,0);
    register0x00001250 = auVar183;
    _local_600 = auVar183;
    auVar213 = vshufps_avx(auVar256,auVar256,0x55);
    register0x000012d0 = auVar213;
    _local_700 = auVar213;
    pauVar4 = (undefined1 (*) [32])(bspline_basis0 + lVar120 + 0xd8c);
    fVar193 = *(float *)*pauVar4;
    fVar209 = *(float *)(bspline_basis0 + lVar120 + 0xd90);
    fVar202 = *(float *)(bspline_basis0 + lVar120 + 0xd94);
    fVar217 = *(float *)(bspline_basis0 + lVar120 + 0xd98);
    fVar204 = *(float *)(bspline_basis0 + lVar120 + 0xd9c);
    fVar219 = *(float *)(bspline_basis0 + lVar120 + 0xda0);
    fVar206 = *(float *)(bspline_basis0 + lVar120 + 0xda4);
    auVar109 = *(undefined1 (*) [28])*pauVar4;
    _auStack_4b0 = SUB3216(*pauVar4,0x10);
    auVar198 = vshufps_avx(auVar154,auVar154,0);
    register0x00001590 = auVar198;
    _local_3a0 = auVar198;
    fVar273 = auVar198._0_4_;
    fVar275 = auVar198._4_4_;
    fVar276 = auVar198._8_4_;
    fVar278 = auVar198._12_4_;
    fVar151 = auVar183._0_4_;
    fVar164 = auVar183._4_4_;
    fVar166 = auVar183._8_4_;
    fVar168 = auVar183._12_4_;
    auVar183 = vshufps_avx(auVar154,auVar154,0x55);
    register0x00001210 = auVar183;
    _local_500 = auVar183;
    fVar170 = auVar183._0_4_;
    fVar171 = auVar183._4_4_;
    fVar172 = auVar183._8_4_;
    fVar174 = auVar183._12_4_;
    fVar194 = auVar213._0_4_;
    fVar203 = auVar213._4_4_;
    fVar205 = auVar213._8_4_;
    fVar207 = auVar213._12_4_;
    auVar126 = _local_6a0;
    auVar183 = vshufps_avx(_local_6a0,_local_6a0,0xff);
    register0x00001510 = auVar183;
    _local_e0 = auVar183;
    auVar125 = _local_6b0;
    auVar213 = vshufps_avx(_local_6b0,_local_6b0,0xff);
    register0x00001450 = auVar213;
    _local_100 = auVar213;
    fVar146 = auVar213._0_4_;
    fVar147 = auVar213._4_4_;
    fVar148 = auVar213._8_4_;
    fVar123 = auVar213._12_4_;
    fVar141 = auVar183._0_4_;
    fVar143 = auVar183._4_4_;
    fVar145 = auVar183._8_4_;
    auVar213 = vshufps_avx(auVar230,auVar230,0);
    register0x000014d0 = auVar213;
    _local_640 = auVar213;
    fVar222 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar120 + 0x484);
    fVar265 = *(float *)(bspline_basis0 + lVar120 + 0x488);
    fVar271 = *(float *)(bspline_basis0 + lVar120 + 0x48c);
    fVar272 = *(float *)(bspline_basis0 + lVar120 + 0x490);
    fVar274 = *(float *)(bspline_basis0 + lVar120 + 0x494);
    fVar310 = *(float *)(bspline_basis0 + lVar120 + 0x498);
    fVar311 = *(float *)(bspline_basis0 + lVar120 + 0x49c);
    auVar110 = *(undefined1 (*) [28])(bspline_basis0 + lVar120 + 0x484);
    fVar210 = auVar213._0_4_;
    fVar218 = auVar213._4_4_;
    fVar220 = auVar213._8_4_;
    fVar223 = auVar213._12_4_;
    auVar213 = vshufps_avx(auVar230,auVar230,0x55);
    register0x00001250 = auVar213;
    _local_620 = auVar213;
    fVar238 = auVar213._0_4_;
    fVar244 = auVar213._4_4_;
    fVar245 = auVar213._8_4_;
    fVar246 = auVar213._12_4_;
    auVar153 = _local_690;
    auVar213 = vshufps_avx(_local_690,_local_690,0xff);
    register0x000015d0 = auVar213;
    _local_80 = auVar213;
    fVar173 = auVar213._0_4_;
    fVar252 = auVar213._4_4_;
    fVar261 = auVar213._8_4_;
    fVar262 = auVar213._12_4_;
    auVar213 = vshufps_avx(auVar212,auVar212,0);
    register0x00001390 = auVar213;
    _local_2c0 = auVar213;
    pauVar4 = (undefined1 (*) [32])(bspline_basis0 + lVar120);
    fVar149 = *(float *)*pauVar4;
    fVar165 = *(float *)(bspline_basis0 + lVar120 + 4);
    fVar309 = *(float *)(bspline_basis0 + lVar120 + 8);
    fVar247 = *(float *)(bspline_basis0 + lVar120 + 0xc);
    fVar221 = *(float *)(bspline_basis0 + lVar120 + 0x10);
    fVar167 = *(float *)(bspline_basis0 + lVar120 + 0x14);
    fVar249 = *(float *)(bspline_basis0 + lVar120 + 0x18);
    auVar111 = *(undefined1 (*) [28])*pauVar4;
    fVar248 = auVar213._0_4_;
    fVar250 = auVar213._4_4_;
    fVar227 = auVar213._8_4_;
    fVar226 = auVar213._12_4_;
    auVar304._0_4_ = fVar248 * fVar149 + fVar210 * fVar222 + fVar151 * fVar293 + fVar273 * fVar193;
    auVar304._4_4_ = fVar250 * fVar165 + fVar218 * fVar265 + fVar164 * fVar308 + fVar275 * fVar209;
    auVar304._8_4_ = fVar227 * fVar309 + fVar220 * fVar271 + fVar166 * fVar295 + fVar276 * fVar202;
    auVar304._12_4_ = fVar226 * fVar247 + fVar223 * fVar272 + fVar168 * fVar294 + fVar278 * fVar217;
    auVar305._16_4_ = fVar248 * fVar221 + fVar210 * fVar274 + fVar151 * fVar296 + fVar273 * fVar204;
    auVar305._0_16_ = auVar304;
    auVar305._20_4_ = fVar250 * fVar167 + fVar218 * fVar310 + fVar164 * fVar297 + fVar275 * fVar219;
    auVar305._24_4_ = fVar227 * fVar249 + fVar220 * fVar311 + fVar166 * fVar208 + fVar276 * fVar206;
    auVar305._28_4_ = fVar168 + 0.0 + 0.0 + 0.0;
    auVar213 = vshufps_avx(auVar212,auVar212,0x55);
    register0x00001290 = auVar213;
    _local_660 = auVar213;
    fVar175 = auVar213._0_4_;
    fVar190 = auVar213._4_4_;
    fVar191 = auVar213._8_4_;
    fVar192 = auVar213._12_4_;
    local_480._0_4_ = fVar175 * fVar149 + fVar238 * fVar222 + fVar194 * fVar293 + fVar170 * fVar193;
    local_480._4_4_ = fVar190 * fVar165 + fVar244 * fVar265 + fVar203 * fVar308 + fVar171 * fVar209;
    fStack_478 = fVar191 * fVar309 + fVar245 * fVar271 + fVar205 * fVar295 + fVar172 * fVar202;
    fStack_474 = fVar192 * fVar247 + fVar246 * fVar272 + fVar207 * fVar294 + fVar174 * fVar217;
    fStack_470 = fVar175 * fVar221 + fVar238 * fVar274 + fVar194 * fVar296 + fVar170 * fVar204;
    fStack_46c = fVar190 * fVar167 + fVar244 * fVar310 + fVar203 * fVar297 + fVar171 * fVar219;
    fStack_468 = fVar191 * fVar249 + fVar245 * fVar311 + fVar205 * fVar208 + fVar172 * fVar206;
    fStack_464 = fVar246 + fVar207 + fVar174 + 0.0;
    auVar105._12_4_ = fStack_7a4;
    auVar105._0_12_ = *(undefined1 (*) [12])pPVar1;
    auVar213 = vpermilps_avx(auVar105,0xff);
    register0x000013d0 = auVar213;
    _local_a0 = auVar213;
    _local_2e0 = *pauVar4;
    auVar140 = _local_2e0;
    fVar251 = auVar213._0_4_;
    fVar142 = auVar213._4_4_;
    fVar144 = auVar213._8_4_;
    local_560._0_4_ = fVar251 * fVar149 + fVar173 * fVar222 + fVar141 * fVar293 + fVar146 * fVar193;
    local_560._4_4_ = fVar142 * fVar165 + fVar252 * fVar265 + fVar143 * fVar308 + fVar147 * fVar209;
    local_560._8_4_ = fVar144 * fVar309 + fVar261 * fVar271 + fVar145 * fVar295 + fVar148 * fVar202;
    local_560._12_4_ =
         auVar213._12_4_ * fVar247 +
         fVar262 * fVar272 + auVar183._12_4_ * fVar294 + fVar123 * fVar217;
    local_560._16_4_ = fVar251 * fVar221 + fVar173 * fVar274 + fVar141 * fVar296 + fVar146 * fVar204
    ;
    local_560._20_4_ = fVar142 * fVar167 + fVar252 * fVar310 + fVar143 * fVar297 + fVar147 * fVar219
    ;
    local_560._24_4_ = fVar144 * fVar249 + fVar261 * fVar311 + fVar145 * fVar208 + fVar148 * fVar206
    ;
    local_560._28_4_ = 0.0;
    fVar193 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar120 + 0x908);
    fVar209 = *(float *)(bspline_basis1 + lVar120 + 0x90c);
    fVar202 = *(float *)(bspline_basis1 + lVar120 + 0x910);
    fVar217 = *(float *)(bspline_basis1 + lVar120 + 0x914);
    fVar204 = *(float *)(bspline_basis1 + lVar120 + 0x918);
    fVar219 = *(float *)(bspline_basis1 + lVar120 + 0x91c);
    fVar206 = *(float *)(bspline_basis1 + lVar120 + 0x920);
    auVar112 = *(undefined1 (*) [28])(bspline_basis1 + lVar120 + 0x908);
    local_300 = *(float *)(bspline_basis1 + lVar120 + 0xd8c);
    fStack_2fc = *(float *)(bspline_basis1 + lVar120 + 0xd90);
    fStack_2f8 = *(float *)(bspline_basis1 + lVar120 + 0xd94);
    fStack_2f4 = *(float *)(bspline_basis1 + lVar120 + 0xd98);
    fStack_2f0 = *(float *)(bspline_basis1 + lVar120 + 0xd9c);
    fStack_2ec = *(float *)(bspline_basis1 + lVar120 + 0xda0);
    fStack_2e8 = *(float *)(bspline_basis1 + lVar120 + 0xda4);
    uStack_2e4 = (float)*(undefined4 *)(bspline_basis1 + lVar120 + 0xda8);
    fVar149 = *(float *)(bspline_basis1 + lVar120 + 0x484);
    fVar165 = *(float *)(bspline_basis1 + lVar120 + 0x488);
    fVar309 = *(float *)(bspline_basis1 + lVar120 + 0x48c);
    fVar247 = *(float *)(bspline_basis1 + lVar120 + 0x490);
    fVar221 = *(float *)(bspline_basis1 + lVar120 + 0x494);
    fVar167 = *(float *)(bspline_basis1 + lVar120 + 0x498);
    fVar249 = *(float *)(bspline_basis1 + lVar120 + 0x49c);
    fVar237 = fVar123 + 0.0 + 0.0;
    fVar277 = *(float *)(bspline_basis1 + lVar120);
    fVar224 = *(float *)(bspline_basis1 + lVar120 + 4);
    fVar169 = *(float *)(bspline_basis1 + lVar120 + 8);
    fVar279 = *(float *)(bspline_basis1 + lVar120 + 0xc);
    fVar280 = *(float *)(bspline_basis1 + lVar120 + 0x10);
    fVar225 = *(float *)(bspline_basis1 + lVar120 + 0x14);
    fVar150 = *(float *)(bspline_basis1 + lVar120 + 0x18);
    local_3c0._0_4_ =
         fVar248 * fVar277 + fVar210 * fVar149 + fVar193 * fVar151 + fVar273 * local_300;
    local_3c0._4_4_ =
         fVar250 * fVar224 + fVar218 * fVar165 + fVar209 * fVar164 + fVar275 * fStack_2fc;
    fStack_3b8 = fVar227 * fVar169 + fVar220 * fVar309 + fVar202 * fVar166 + fVar276 * fStack_2f8;
    fStack_3b4 = fVar226 * fVar279 + fVar223 * fVar247 + fVar217 * fVar168 + fVar278 * fStack_2f4;
    fStack_3b0 = fVar248 * fVar280 + fVar210 * fVar221 + fVar204 * fVar151 + fVar273 * fStack_2f0;
    fStack_3ac = fVar250 * fVar225 + fVar218 * fVar167 + fVar219 * fVar164 + fVar275 * fStack_2ec;
    fStack_3a8 = fVar227 * fVar150 + fVar220 * fVar249 + fVar206 * fVar166 + fVar276 * fStack_2e8;
    fStack_3a4 = fVar262 + fVar278 + 0.0;
    local_3e0._0_4_ =
         fVar175 * fVar277 + fVar238 * fVar149 + fVar193 * fVar194 + local_300 * fVar170;
    local_3e0._4_4_ =
         fVar190 * fVar224 + fVar244 * fVar165 + fVar209 * fVar203 + fStack_2fc * fVar171;
    fStack_3d8 = fVar191 * fVar169 + fVar245 * fVar309 + fVar202 * fVar205 + fStack_2f8 * fVar172;
    fStack_3d4 = fVar192 * fVar279 + fVar246 * fVar247 + fVar217 * fVar207 + fStack_2f4 * fVar174;
    fStack_3d0 = fVar175 * fVar280 + fVar238 * fVar221 + fVar204 * fVar194 + fStack_2f0 * fVar170;
    fStack_3cc = fVar190 * fVar225 + fVar244 * fVar167 + fVar219 * fVar203 + fStack_2ec * fVar171;
    fStack_3c8 = fVar191 * fVar150 + fVar245 * fVar249 + fVar206 * fVar205 + fStack_2e8 * fVar172;
    fStack_3c4 = fVar278 + 0.0 + 0.0;
    auVar257._0_4_ = fVar251 * fVar277 + fVar173 * fVar149 + fVar141 * fVar193 + fVar146 * local_300
    ;
    auVar257._4_4_ =
         fVar142 * fVar224 + fVar252 * fVar165 + fVar143 * fVar209 + fVar147 * fStack_2fc;
    auVar257._8_4_ =
         fVar144 * fVar169 + fVar261 * fVar309 + fVar145 * fVar202 + fVar148 * fStack_2f8;
    auVar257._12_4_ =
         auVar213._12_4_ * fVar279 +
         fVar262 * fVar247 + auVar183._12_4_ * fVar217 + fVar123 * fStack_2f4;
    auVar257._16_4_ =
         fVar251 * fVar280 + fVar173 * fVar221 + fVar141 * fVar204 + fVar146 * fStack_2f0;
    auVar257._20_4_ =
         fVar142 * fVar225 + fVar252 * fVar167 + fVar143 * fVar219 + fVar147 * fStack_2ec;
    auVar257._24_4_ =
         fVar144 * fVar150 + fVar261 * fVar249 + fVar145 * fVar206 + fVar148 * fStack_2e8;
    auVar257._28_4_ = fVar237 + 0.0;
    auVar22 = vsubps_avx(_local_3c0,auVar305);
    _local_320 = vsubps_avx(_local_3e0,_local_480);
    fVar193 = auVar22._0_4_;
    fVar202 = auVar22._4_4_;
    auVar201._4_4_ = (float)local_480._4_4_ * fVar202;
    auVar201._0_4_ = (float)local_480._0_4_ * fVar193;
    fVar204 = auVar22._8_4_;
    auVar201._8_4_ = fStack_478 * fVar204;
    fVar206 = auVar22._12_4_;
    auVar201._12_4_ = fStack_474 * fVar206;
    fVar265 = auVar22._16_4_;
    auVar201._16_4_ = fStack_470 * fVar265;
    fVar272 = auVar22._20_4_;
    auVar201._20_4_ = fStack_46c * fVar272;
    fVar310 = auVar22._24_4_;
    auVar201._24_4_ = fStack_468 * fVar310;
    auVar201._28_4_ = 0;
    fVar209 = local_320._0_4_;
    fVar217 = local_320._4_4_;
    auVar23._4_4_ = auVar304._4_4_ * fVar217;
    auVar23._0_4_ = auVar304._0_4_ * fVar209;
    fVar219 = local_320._8_4_;
    auVar23._8_4_ = auVar304._8_4_ * fVar219;
    fVar222 = local_320._12_4_;
    auVar23._12_4_ = auVar304._12_4_ * fVar222;
    fVar271 = local_320._16_4_;
    auVar23._16_4_ = auVar305._16_4_ * fVar271;
    fVar274 = local_320._20_4_;
    auVar23._20_4_ = auVar305._20_4_ * fVar274;
    fVar311 = local_320._24_4_;
    auVar23._24_4_ = auVar305._24_4_ * fVar311;
    auVar23._28_4_ = fVar237;
    auVar23 = vsubps_avx(auVar201,auVar23);
    local_5a0 = auVar257;
    auVar201 = vmaxps_avx(local_560,auVar257);
    auVar30._4_4_ = auVar201._4_4_ * auVar201._4_4_ * (fVar202 * fVar202 + fVar217 * fVar217);
    auVar30._0_4_ = auVar201._0_4_ * auVar201._0_4_ * (fVar193 * fVar193 + fVar209 * fVar209);
    auVar30._8_4_ = auVar201._8_4_ * auVar201._8_4_ * (fVar204 * fVar204 + fVar219 * fVar219);
    auVar30._12_4_ = auVar201._12_4_ * auVar201._12_4_ * (fVar206 * fVar206 + fVar222 * fVar222);
    auVar30._16_4_ = auVar201._16_4_ * auVar201._16_4_ * (fVar265 * fVar265 + fVar271 * fVar271);
    auVar30._20_4_ = auVar201._20_4_ * auVar201._20_4_ * (fVar272 * fVar272 + fVar274 * fVar274);
    auVar30._24_4_ = auVar201._24_4_ * auVar201._24_4_ * (fVar310 * fVar310 + fVar311 * fVar311);
    auVar30._28_4_ = fStack_3a4 + fVar237;
    auVar323._4_4_ = auVar23._4_4_ * auVar23._4_4_;
    auVar323._0_4_ = auVar23._0_4_ * auVar23._0_4_;
    auVar323._8_4_ = auVar23._8_4_ * auVar23._8_4_;
    auVar323._12_4_ = auVar23._12_4_ * auVar23._12_4_;
    auVar323._16_4_ = auVar23._16_4_ * auVar23._16_4_;
    auVar323._20_4_ = auVar23._20_4_ * auVar23._20_4_;
    auVar323._24_4_ = auVar23._24_4_ * auVar23._24_4_;
    auVar323._28_4_ = auVar23._28_4_;
    auVar201 = vcmpps_avx(auVar323,auVar30,2);
    auVar231._0_4_ = (float)(int)uVar16;
    auVar231._4_12_ = auVar304._4_12_;
    local_520._0_16_ = auVar231;
    auVar183 = vshufps_avx(auVar231,auVar231,0);
    auVar233._16_16_ = auVar183;
    auVar233._0_16_ = auVar183;
    auVar23 = vcmpps_avx(_DAT_01f7b060,auVar233,1);
    auVar183 = vpermilps_avx(auVar212,0xaa);
    register0x000013d0 = auVar183;
    _local_120 = auVar183;
    auVar213 = vpermilps_avx(auVar230,0xaa);
    register0x00001590 = auVar213;
    _local_c0 = auVar213;
    auVar198 = vpermilps_avx(auVar256,0xaa);
    register0x000015d0 = auVar198;
    _local_2a0 = auVar198;
    auVar324 = ZEXT3264(_local_2a0);
    auVar20 = vpermilps_avx(auVar154,0xaa);
    register0x00001210 = auVar20;
    _local_540 = auVar20;
    auVar30 = auVar23 & auVar201;
    auVar21 = vpermilps_avx((undefined1  [16])aVar13,0xff);
    _local_780 = ZEXT1632(auVar21);
    auVar232 = ZEXT416((uint)(auVar232._0_4_ * 4.7683716e-07));
    fVar193 = fVar151;
    fVar209 = fVar164;
    fVar202 = fVar166;
    fVar217 = fVar168;
    fVar204 = fVar175;
    fVar219 = fVar190;
    fVar206 = fVar191;
    fVar222 = fVar170;
    fVar265 = fVar171;
    fVar271 = fVar172;
    fVar272 = fVar174;
    fVar274 = fVar194;
    fVar310 = fVar203;
    fVar311 = fVar205;
    if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar30 >> 0x7f,0) == '\0') &&
          (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar30 >> 0xbf,0) == '\0') &&
        (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar30[0x1f]) {
      auVar270 = ZEXT3264(local_6e0);
      auVar285 = ZEXT3264(local_680);
      auVar260 = ZEXT3264(_local_640);
      auVar314 = ZEXT3264(_local_620);
    }
    else {
      local_7b8 = pGVar17;
      auVar201 = vandps_avx(auVar201,auVar23);
      fVar252 = auVar183._0_4_;
      fVar261 = auVar183._4_4_;
      fVar262 = auVar183._8_4_;
      fVar263 = auVar183._12_4_;
      fVar286 = auVar213._0_4_;
      fVar312 = auVar213._4_4_;
      fVar315 = auVar213._8_4_;
      fVar316 = auVar213._12_4_;
      local_400._0_4_ = auVar112._0_4_;
      local_400._4_4_ = auVar112._4_4_;
      fStack_3f8 = auVar112._8_4_;
      fStack_3f4 = auVar112._12_4_;
      fStack_3f0 = auVar112._16_4_;
      fStack_3ec = auVar112._20_4_;
      fStack_3e8 = auVar112._24_4_;
      fVar317 = auVar198._0_4_;
      fVar318 = auVar198._4_4_;
      fVar319 = auVar198._8_4_;
      fVar320 = auVar198._12_4_;
      fVar123 = auVar20._0_4_;
      fVar141 = auVar20._4_4_;
      fVar143 = auVar20._8_4_;
      fVar145 = auVar20._12_4_;
      fVar237 = auVar201._28_4_ + auVar23._28_4_ + 0.0;
      local_400._0_4_ =
           fVar252 * fVar277 +
           fVar286 * fVar149 + fVar317 * (float)local_400._0_4_ + fVar123 * local_300;
      local_400._4_4_ =
           fVar261 * fVar224 +
           fVar312 * fVar165 + fVar318 * (float)local_400._4_4_ + fVar141 * fStack_2fc;
      fStack_3f8 = fVar262 * fVar169 +
                   fVar315 * fVar309 + fVar319 * fStack_3f8 + fVar143 * fStack_2f8;
      fStack_3f4 = fVar263 * fVar279 +
                   fVar316 * fVar247 + fVar320 * fStack_3f4 + fVar145 * fStack_2f4;
      fStack_3f0 = fVar252 * fVar280 +
                   fVar286 * fVar221 + fVar317 * fStack_3f0 + fVar123 * fStack_2f0;
      fStack_3ec = fVar261 * fVar225 +
                   fVar312 * fVar167 + fVar318 * fStack_3ec + fVar141 * fStack_2ec;
      fStack_3e8 = fVar262 * fVar150 +
                   fVar315 * fVar249 + fVar319 * fStack_3e8 + fVar143 * fStack_2e8;
      fStack_3e4 = *(float *)(bspline_basis1 + lVar120 + 0x1c) + fVar237;
      _local_7a0 = auVar232;
      local_2e0._0_4_ = auVar111._0_4_;
      local_2e0._4_4_ = auVar111._4_4_;
      fStack_2d8 = auVar111._8_4_;
      fStack_2d4 = auVar111._12_4_;
      fStack_2d0 = auVar111._16_4_;
      fStack_2cc = auVar111._20_4_;
      fStack_2c8 = auVar111._24_4_;
      local_4e0._0_4_ = auVar110._0_4_;
      local_4e0._4_4_ = auVar110._4_4_;
      fStack_4d8 = auVar110._8_4_;
      fStack_4d4 = auVar110._12_4_;
      fStack_4d0 = auVar110._16_4_;
      fStack_4cc = auVar110._20_4_;
      fStack_4c8 = auVar110._24_4_;
      local_4c0._0_4_ = auVar109._0_4_;
      local_4c0._4_4_ = auVar109._4_4_;
      fStack_4b8 = auVar109._8_4_;
      fStack_4b4 = auVar109._12_4_;
      auStack_4b0._0_4_ = auVar109._16_4_;
      auStack_4b0._4_4_ = auVar109._20_4_;
      fStack_4a8 = auVar109._24_4_;
      local_4a0 = fVar252 * (float)local_2e0._0_4_ +
                  fVar286 * (float)local_4e0._0_4_ +
                  fVar317 * fVar293 + fVar123 * (float)local_4c0._0_4_;
      fStack_49c = fVar261 * (float)local_2e0._4_4_ +
                   fVar312 * (float)local_4e0._4_4_ +
                   fVar318 * fVar308 + fVar141 * (float)local_4c0._4_4_;
      fStack_498 = fVar262 * fStack_2d8 +
                   fVar315 * fStack_4d8 + fVar319 * fVar295 + fVar143 * fStack_4b8;
      fStack_494 = fVar263 * fStack_2d4 +
                   fVar316 * fStack_4d4 + fVar320 * fVar294 + fVar145 * fStack_4b4;
      fStack_490 = fVar252 * fStack_2d0 +
                   fVar286 * fStack_4d0 + fVar317 * fVar296 + fVar123 * (float)auStack_4b0._0_4_;
      fStack_48c = fVar261 * fStack_2cc +
                   fVar312 * fStack_4cc + fVar318 * fVar297 + fVar141 * (float)auStack_4b0._4_4_;
      fStack_488 = fVar262 * fStack_2c8 +
                   fVar315 * fStack_4c8 + fVar319 * fVar208 + fVar143 * fStack_4a8;
      fStack_484 = fStack_3e4 + *(float *)(bspline_basis1 + lVar120 + 0x1c) + fVar237 + 0.0;
      fVar293 = *(float *)(bspline_basis0 + lVar120 + 0x1210);
      fVar308 = *(float *)(bspline_basis0 + lVar120 + 0x1214);
      fVar295 = *(float *)(bspline_basis0 + lVar120 + 0x1218);
      fVar294 = *(float *)(bspline_basis0 + lVar120 + 0x121c);
      fVar296 = *(float *)(bspline_basis0 + lVar120 + 0x1220);
      fVar297 = *(float *)(bspline_basis0 + lVar120 + 0x1224);
      fVar208 = *(float *)(bspline_basis0 + lVar120 + 0x1228);
      fVar149 = *(float *)(bspline_basis0 + lVar120 + 0x1694);
      fVar165 = *(float *)(bspline_basis0 + lVar120 + 0x1698);
      fVar309 = *(float *)(bspline_basis0 + lVar120 + 0x169c);
      fVar247 = *(float *)(bspline_basis0 + lVar120 + 0x16a0);
      fVar221 = *(float *)(bspline_basis0 + lVar120 + 0x16a4);
      fVar167 = *(float *)(bspline_basis0 + lVar120 + 0x16a8);
      fVar249 = *(float *)(bspline_basis0 + lVar120 + 0x16ac);
      fVar277 = *(float *)(bspline_basis0 + lVar120 + 0x1b18);
      fVar224 = *(float *)(bspline_basis0 + lVar120 + 0x1b1c);
      fVar169 = *(float *)(bspline_basis0 + lVar120 + 0x1b20);
      fVar279 = *(float *)(bspline_basis0 + lVar120 + 0x1b24);
      fVar280 = *(float *)(bspline_basis0 + lVar120 + 0x1b28);
      fVar225 = *(float *)(bspline_basis0 + lVar120 + 0x1b2c);
      fVar150 = *(float *)(bspline_basis0 + lVar120 + 0x1b30);
      fVar237 = *(float *)(bspline_basis0 + lVar120 + 0x1f9c);
      fVar251 = *(float *)(bspline_basis0 + lVar120 + 0x1fa0);
      fVar142 = *(float *)(bspline_basis0 + lVar120 + 0x1fa4);
      fVar144 = *(float *)(bspline_basis0 + lVar120 + 0x1fa8);
      fVar146 = *(float *)(bspline_basis0 + lVar120 + 0x1fac);
      fVar147 = *(float *)(bspline_basis0 + lVar120 + 0x1fb0);
      fVar148 = *(float *)(bspline_basis0 + lVar120 + 0x1fb4);
      fVar264 = *(float *)(bspline_basis1 + lVar120 + 0x4a0) + fVar263;
      fVar173 = *(float *)(bspline_basis0 + lVar120 + 0x1b34) +
                *(float *)(bspline_basis0 + lVar120 + 0x1fb8);
      fVar287 = *(float *)(bspline_basis0 + lVar120 + 0x16b0) + fVar173;
      local_4e0._4_4_ =
           fVar250 * fVar308 + fVar218 * fVar165 + fVar164 * fVar224 + fVar275 * fVar251;
      local_4e0._0_4_ =
           fVar248 * fVar293 + fVar210 * fVar149 + fVar151 * fVar277 + fVar273 * fVar237;
      fStack_4d8 = fVar227 * fVar295 + fVar220 * fVar309 + fVar166 * fVar169 + fVar276 * fVar142;
      fStack_4d4 = fVar226 * fVar294 + fVar223 * fVar247 + fVar168 * fVar279 + fVar278 * fVar144;
      fStack_4d0 = fVar248 * fVar296 + fVar210 * fVar221 + fVar151 * fVar280 + fVar273 * fVar146;
      fStack_4cc = fVar250 * fVar297 + fVar218 * fVar167 + fVar164 * fVar225 + fVar275 * fVar147;
      fStack_4c8 = fVar227 * fVar208 + fVar220 * fVar249 + fVar166 * fVar150 + fVar276 * fVar148;
      fStack_4c4 = *(float *)(bspline_basis0 + lVar120 + 0x16b0) +
                   *(float *)(bspline_basis0 + lVar120 + 0x1fb8) + fVar264;
      auVar155._0_4_ = fVar175 * fVar293 + fVar194 * fVar277 + fVar170 * fVar237 + fVar238 * fVar149
      ;
      auVar155._4_4_ = fVar190 * fVar308 + fVar203 * fVar224 + fVar171 * fVar251 + fVar244 * fVar165
      ;
      auVar155._8_4_ = fVar191 * fVar295 + fVar205 * fVar169 + fVar172 * fVar142 + fVar245 * fVar309
      ;
      auVar155._12_4_ =
           fVar192 * fVar294 + fVar207 * fVar279 + fVar174 * fVar144 + fVar246 * fVar247;
      auVar155._16_4_ =
           fVar175 * fVar296 + fVar194 * fVar280 + fVar170 * fVar146 + fVar238 * fVar221;
      auVar155._20_4_ =
           fVar190 * fVar297 + fVar203 * fVar225 + fVar171 * fVar147 + fVar244 * fVar167;
      auVar155._24_4_ =
           fVar191 * fVar208 + fVar205 * fVar150 + fVar172 * fVar148 + fVar245 * fVar249;
      auVar155._28_4_ = fVar173 + *(float *)(bspline_basis1 + lVar120 + 0x4a0) + fVar246 + fVar264;
      auVar199._0_4_ = fVar286 * fVar149 + fVar317 * fVar277 + fVar123 * fVar237 + fVar252 * fVar293
      ;
      auVar199._4_4_ = fVar312 * fVar165 + fVar318 * fVar224 + fVar141 * fVar251 + fVar261 * fVar308
      ;
      auVar199._8_4_ = fVar315 * fVar309 + fVar319 * fVar169 + fVar143 * fVar142 + fVar262 * fVar295
      ;
      auVar199._12_4_ =
           fVar316 * fVar247 + fVar320 * fVar279 + fVar145 * fVar144 + fVar263 * fVar294;
      auVar199._16_4_ =
           fVar286 * fVar221 + fVar317 * fVar280 + fVar123 * fVar146 + fVar252 * fVar296;
      auVar199._20_4_ =
           fVar312 * fVar167 + fVar318 * fVar225 + fVar141 * fVar147 + fVar261 * fVar297;
      auVar199._24_4_ =
           fVar315 * fVar249 + fVar319 * fVar150 + fVar143 * fVar148 + fVar262 * fVar208;
      auVar199._28_4_ = fVar287 + *(float *)(bspline_basis0 + lVar120 + 0x122c);
      fVar293 = *(float *)(bspline_basis1 + lVar120 + 0x1b18);
      fVar308 = *(float *)(bspline_basis1 + lVar120 + 0x1b1c);
      fVar295 = *(float *)(bspline_basis1 + lVar120 + 0x1b20);
      fVar294 = *(float *)(bspline_basis1 + lVar120 + 0x1b24);
      fVar296 = *(float *)(bspline_basis1 + lVar120 + 0x1b28);
      fVar297 = *(float *)(bspline_basis1 + lVar120 + 0x1b2c);
      fVar208 = *(float *)(bspline_basis1 + lVar120 + 0x1b30);
      fVar149 = *(float *)(bspline_basis1 + lVar120 + 0x1f9c);
      fVar165 = *(float *)(bspline_basis1 + lVar120 + 0x1fa0);
      fVar309 = *(float *)(bspline_basis1 + lVar120 + 0x1fa4);
      fVar247 = *(float *)(bspline_basis1 + lVar120 + 0x1fa8);
      fVar221 = *(float *)(bspline_basis1 + lVar120 + 0x1fac);
      fVar167 = *(float *)(bspline_basis1 + lVar120 + 0x1fb0);
      fVar249 = *(float *)(bspline_basis1 + lVar120 + 0x1fb4);
      fVar277 = *(float *)(bspline_basis1 + lVar120 + 0x1694);
      fVar224 = *(float *)(bspline_basis1 + lVar120 + 0x1698);
      fVar169 = *(float *)(bspline_basis1 + lVar120 + 0x169c);
      fVar279 = *(float *)(bspline_basis1 + lVar120 + 0x16a0);
      fVar280 = *(float *)(bspline_basis1 + lVar120 + 0x16a4);
      fVar225 = *(float *)(bspline_basis1 + lVar120 + 0x16a8);
      fVar150 = *(float *)(bspline_basis1 + lVar120 + 0x16ac);
      fVar237 = *(float *)(bspline_basis1 + lVar120 + 0x1210);
      fVar251 = *(float *)(bspline_basis1 + lVar120 + 0x1214);
      fVar142 = *(float *)(bspline_basis1 + lVar120 + 0x1218);
      fVar144 = *(float *)(bspline_basis1 + lVar120 + 0x121c);
      fVar146 = *(float *)(bspline_basis1 + lVar120 + 0x1220);
      fVar147 = *(float *)(bspline_basis1 + lVar120 + 0x1224);
      fVar148 = *(float *)(bspline_basis1 + lVar120 + 0x1228);
      auVar266._0_4_ = fVar248 * fVar237 + fVar210 * fVar277 + fVar151 * fVar293 + fVar273 * fVar149
      ;
      auVar266._4_4_ = fVar250 * fVar251 + fVar218 * fVar224 + fVar164 * fVar308 + fVar275 * fVar165
      ;
      auVar266._8_4_ = fVar227 * fVar142 + fVar220 * fVar169 + fVar166 * fVar295 + fVar276 * fVar309
      ;
      auVar266._12_4_ =
           fVar226 * fVar144 + fVar223 * fVar279 + fVar168 * fVar294 + fVar278 * fVar247;
      auVar266._16_4_ =
           fVar248 * fVar146 + fVar210 * fVar280 + fVar151 * fVar296 + fVar273 * fVar221;
      auVar266._20_4_ =
           fVar250 * fVar147 + fVar218 * fVar225 + fVar164 * fVar297 + fVar275 * fVar167;
      auVar266._24_4_ =
           fVar227 * fVar148 + fVar220 * fVar150 + fVar166 * fVar208 + fVar276 * fVar249;
      auVar266._28_4_ = fVar174 + fVar174 + fVar287 + fVar278;
      auVar282._0_4_ = fVar175 * fVar237 + fVar277 * fVar238 + fVar194 * fVar293 + fVar170 * fVar149
      ;
      auVar282._4_4_ = fVar190 * fVar251 + fVar224 * fVar244 + fVar203 * fVar308 + fVar171 * fVar165
      ;
      auVar282._8_4_ = fVar191 * fVar142 + fVar169 * fVar245 + fVar205 * fVar295 + fVar172 * fVar309
      ;
      auVar282._12_4_ =
           fVar192 * fVar144 + fVar279 * fVar246 + fVar207 * fVar294 + fVar174 * fVar247;
      auVar282._16_4_ =
           fVar175 * fVar146 + fVar280 * fVar238 + fVar194 * fVar296 + fVar170 * fVar221;
      auVar282._20_4_ =
           fVar190 * fVar147 + fVar225 * fVar244 + fVar203 * fVar297 + fVar171 * fVar167;
      auVar282._24_4_ =
           fVar191 * fVar148 + fVar150 * fVar245 + fVar205 * fVar208 + fVar172 * fVar249;
      auVar282._28_4_ = fVar174 + fVar174 + fVar174 + fVar287;
      auVar214._0_4_ = fVar252 * fVar237 + fVar286 * fVar277 + fVar317 * fVar293 + fVar123 * fVar149
      ;
      auVar214._4_4_ = fVar261 * fVar251 + fVar312 * fVar224 + fVar318 * fVar308 + fVar141 * fVar165
      ;
      auVar214._8_4_ = fVar262 * fVar142 + fVar315 * fVar169 + fVar319 * fVar295 + fVar143 * fVar309
      ;
      auVar214._12_4_ =
           fVar263 * fVar144 + fVar316 * fVar279 + fVar320 * fVar294 + fVar145 * fVar247;
      auVar214._16_4_ =
           fVar252 * fVar146 + fVar286 * fVar280 + fVar317 * fVar296 + fVar123 * fVar221;
      auVar214._20_4_ =
           fVar261 * fVar147 + fVar312 * fVar225 + fVar318 * fVar297 + fVar141 * fVar167;
      auVar214._24_4_ =
           fVar262 * fVar148 + fVar315 * fVar150 + fVar319 * fVar208 + fVar143 * fVar249;
      auVar214._28_4_ =
           *(float *)(bspline_basis1 + lVar120 + 0x122c) +
           *(float *)(bspline_basis1 + lVar120 + 0x16b0) +
           *(float *)(bspline_basis1 + lVar120 + 0x1b34) +
           *(float *)(bspline_basis1 + lVar120 + 0x1fb8);
      auVar187._8_4_ = 0x7fffffff;
      auVar187._0_8_ = 0x7fffffff7fffffff;
      auVar187._12_4_ = 0x7fffffff;
      auVar187._16_4_ = 0x7fffffff;
      auVar187._20_4_ = 0x7fffffff;
      auVar187._24_4_ = 0x7fffffff;
      auVar187._28_4_ = 0x7fffffff;
      auVar23 = vandps_avx(_local_4e0,auVar187);
      auVar30 = vandps_avx(auVar155,auVar187);
      auVar30 = vmaxps_avx(auVar23,auVar30);
      auVar23 = vandps_avx(auVar199,auVar187);
      auVar23 = vmaxps_avx(auVar30,auVar23);
      auVar183 = vpermilps_avx(auVar232,0);
      auVar258._16_16_ = auVar183;
      auVar258._0_16_ = auVar183;
      auVar23 = vcmpps_avx(auVar23,auVar258,1);
      auVar323 = vblendvps_avx(_local_4e0,auVar22,auVar23);
      auVar233 = vblendvps_avx(auVar155,_local_320,auVar23);
      auVar23 = vandps_avx(auVar266,auVar187);
      auVar30 = vandps_avx(auVar282,auVar187);
      auVar19 = vmaxps_avx(auVar23,auVar30);
      auVar23 = vandps_avx(auVar214,auVar187);
      auVar23 = vmaxps_avx(auVar19,auVar23);
      auVar19 = vcmpps_avx(auVar23,auVar258,1);
      auVar23 = vblendvps_avx(auVar266,auVar22,auVar19);
      auVar22 = vblendvps_avx(auVar282,_local_320,auVar19);
      fVar251 = auVar323._0_4_;
      fVar142 = auVar323._4_4_;
      fVar144 = auVar323._8_4_;
      fVar146 = auVar323._12_4_;
      fVar147 = auVar323._16_4_;
      fVar148 = auVar323._20_4_;
      fVar123 = auVar323._24_4_;
      fVar210 = auVar23._0_4_;
      fVar218 = auVar23._4_4_;
      fVar220 = auVar23._8_4_;
      fVar223 = auVar23._12_4_;
      fVar141 = auVar23._16_4_;
      fVar143 = auVar23._20_4_;
      fVar145 = auVar23._24_4_;
      fVar293 = auVar233._0_4_;
      fVar296 = auVar233._4_4_;
      fVar165 = auVar233._8_4_;
      fVar167 = auVar233._12_4_;
      fVar169 = auVar233._16_4_;
      fVar150 = auVar233._20_4_;
      fVar246 = auVar233._24_4_;
      auVar129._0_4_ = fVar293 * fVar293 + fVar251 * fVar251;
      auVar129._4_4_ = fVar296 * fVar296 + fVar142 * fVar142;
      auVar129._8_4_ = fVar165 * fVar165 + fVar144 * fVar144;
      auVar129._12_4_ = fVar167 * fVar167 + fVar146 * fVar146;
      auVar129._16_4_ = fVar169 * fVar169 + fVar147 * fVar147;
      auVar129._20_4_ = fVar150 * fVar150 + fVar148 * fVar148;
      auVar129._24_4_ = fVar246 * fVar246 + fVar123 * fVar123;
      auVar129._28_4_ = auVar282._28_4_ + auVar323._28_4_;
      auVar323 = vrsqrtps_avx(auVar129);
      fVar308 = auVar323._0_4_;
      fVar295 = auVar323._4_4_;
      auVar19._4_4_ = fVar295 * 1.5;
      auVar19._0_4_ = fVar308 * 1.5;
      fVar294 = auVar323._8_4_;
      auVar19._8_4_ = fVar294 * 1.5;
      fVar297 = auVar323._12_4_;
      auVar19._12_4_ = fVar297 * 1.5;
      fVar208 = auVar323._16_4_;
      auVar19._16_4_ = fVar208 * 1.5;
      fVar149 = auVar323._20_4_;
      auVar19._20_4_ = fVar149 * 1.5;
      fVar309 = auVar323._24_4_;
      auVar19._24_4_ = fVar309 * 1.5;
      auVar19._28_4_ = auVar30._28_4_;
      auVar25._4_4_ = fVar295 * fVar295 * fVar295 * auVar129._4_4_ * 0.5;
      auVar25._0_4_ = fVar308 * fVar308 * fVar308 * auVar129._0_4_ * 0.5;
      auVar25._8_4_ = fVar294 * fVar294 * fVar294 * auVar129._8_4_ * 0.5;
      auVar25._12_4_ = fVar297 * fVar297 * fVar297 * auVar129._12_4_ * 0.5;
      auVar25._16_4_ = fVar208 * fVar208 * fVar208 * auVar129._16_4_ * 0.5;
      auVar25._20_4_ = fVar149 * fVar149 * fVar149 * auVar129._20_4_ * 0.5;
      auVar25._24_4_ = fVar309 * fVar309 * fVar309 * auVar129._24_4_ * 0.5;
      auVar25._28_4_ = auVar129._28_4_;
      auVar323 = vsubps_avx(auVar19,auVar25);
      fVar308 = auVar323._0_4_;
      fVar297 = auVar323._4_4_;
      fVar309 = auVar323._8_4_;
      fVar249 = auVar323._12_4_;
      fVar279 = auVar323._16_4_;
      fVar238 = auVar323._20_4_;
      fVar237 = auVar323._24_4_;
      fVar227 = auVar233._28_4_;
      fVar295 = auVar22._0_4_;
      fVar208 = auVar22._4_4_;
      fVar247 = auVar22._8_4_;
      fVar277 = auVar22._12_4_;
      fVar280 = auVar22._16_4_;
      fVar244 = auVar22._20_4_;
      fVar248 = auVar22._24_4_;
      auVar130._0_4_ = fVar295 * fVar295 + fVar210 * fVar210;
      auVar130._4_4_ = fVar208 * fVar208 + fVar218 * fVar218;
      auVar130._8_4_ = fVar247 * fVar247 + fVar220 * fVar220;
      auVar130._12_4_ = fVar277 * fVar277 + fVar223 * fVar223;
      auVar130._16_4_ = fVar280 * fVar280 + fVar141 * fVar141;
      auVar130._20_4_ = fVar244 * fVar244 + fVar143 * fVar143;
      auVar130._24_4_ = fVar248 * fVar248 + fVar145 * fVar145;
      auVar130._28_4_ = auVar23._28_4_ + auVar323._28_4_;
      auVar23 = vrsqrtps_avx(auVar130);
      fVar294 = auVar23._0_4_;
      fVar149 = auVar23._4_4_;
      auVar26._4_4_ = fVar149 * 1.5;
      auVar26._0_4_ = fVar294 * 1.5;
      fVar221 = auVar23._8_4_;
      auVar26._8_4_ = fVar221 * 1.5;
      fVar224 = auVar23._12_4_;
      auVar26._12_4_ = fVar224 * 1.5;
      fVar225 = auVar23._16_4_;
      auVar26._16_4_ = fVar225 * 1.5;
      fVar245 = auVar23._20_4_;
      auVar26._20_4_ = fVar245 * 1.5;
      fVar250 = auVar23._24_4_;
      auVar26._24_4_ = fVar250 * 1.5;
      auVar26._28_4_ = auVar30._28_4_;
      fVar226 = auVar23._28_4_;
      auVar27._4_4_ = fVar149 * fVar149 * fVar149 * auVar130._4_4_ * 0.5;
      auVar27._0_4_ = fVar294 * fVar294 * fVar294 * auVar130._0_4_ * 0.5;
      auVar27._8_4_ = fVar221 * fVar221 * fVar221 * auVar130._8_4_ * 0.5;
      auVar27._12_4_ = fVar224 * fVar224 * fVar224 * auVar130._12_4_ * 0.5;
      auVar27._16_4_ = fVar225 * fVar225 * fVar225 * auVar130._16_4_ * 0.5;
      auVar27._20_4_ = fVar245 * fVar245 * fVar245 * auVar130._20_4_ * 0.5;
      auVar27._24_4_ = fVar250 * fVar250 * fVar250 * auVar130._24_4_ * 0.5;
      auVar27._28_4_ = auVar130._28_4_;
      auVar23 = vsubps_avx(auVar26,auVar27);
      fVar294 = auVar23._0_4_;
      fVar149 = auVar23._4_4_;
      fVar221 = auVar23._8_4_;
      fVar224 = auVar23._12_4_;
      fVar225 = auVar23._16_4_;
      fVar245 = auVar23._20_4_;
      fVar250 = auVar23._24_4_;
      fVar293 = (float)local_560._0_4_ * fVar293 * fVar308;
      fVar296 = local_560._4_4_ * fVar296 * fVar297;
      auVar28._4_4_ = fVar296;
      auVar28._0_4_ = fVar293;
      fVar165 = local_560._8_4_ * fVar165 * fVar309;
      auVar28._8_4_ = fVar165;
      fVar167 = local_560._12_4_ * fVar167 * fVar249;
      auVar28._12_4_ = fVar167;
      fVar169 = local_560._16_4_ * fVar169 * fVar279;
      auVar28._16_4_ = fVar169;
      fVar150 = local_560._20_4_ * fVar150 * fVar238;
      auVar28._20_4_ = fVar150;
      fVar246 = local_560._24_4_ * fVar246 * fVar237;
      auVar28._24_4_ = fVar246;
      auVar28._28_4_ = fVar227;
      local_4c0._4_4_ = auVar304._4_4_ + fVar296;
      local_4c0._0_4_ = auVar304._0_4_ + fVar293;
      fStack_4b8 = auVar304._8_4_ + fVar165;
      fStack_4b4 = auVar304._12_4_ + fVar167;
      auStack_4b0._0_4_ = auVar305._16_4_ + fVar169;
      auStack_4b0._4_4_ = auVar305._20_4_ + fVar150;
      fStack_4a8 = auVar305._24_4_ + fVar246;
      fStack_4a4 = auVar305._28_4_ + fVar227;
      fVar293 = (float)local_560._0_4_ * fVar308 * -fVar251;
      fVar296 = local_560._4_4_ * fVar297 * -fVar142;
      auVar24._4_4_ = fVar296;
      auVar24._0_4_ = fVar293;
      fVar165 = local_560._8_4_ * fVar309 * -fVar144;
      auVar24._8_4_ = fVar165;
      fVar167 = local_560._12_4_ * fVar249 * -fVar146;
      auVar24._12_4_ = fVar167;
      fVar169 = local_560._16_4_ * fVar279 * -fVar147;
      auVar24._16_4_ = fVar169;
      fVar150 = local_560._20_4_ * fVar238 * -fVar148;
      auVar24._20_4_ = fVar150;
      fVar246 = local_560._24_4_ * fVar237 * -fVar123;
      auVar24._24_4_ = fVar246;
      auVar24._28_4_ = 0x3f000000;
      local_4e0._4_4_ = fVar296 + (float)local_480._4_4_;
      local_4e0._0_4_ = fVar293 + (float)local_480._0_4_;
      fStack_4d8 = fVar165 + fStack_478;
      fStack_4d4 = fVar167 + fStack_474;
      fStack_4d0 = fVar169 + fStack_470;
      fStack_4cc = fVar150 + fStack_46c;
      fStack_4c8 = fVar246 + fStack_468;
      fStack_4c4 = fStack_464 + 0.5;
      fVar293 = (float)local_560._0_4_ * fVar308 * 0.0;
      fVar308 = local_560._4_4_ * fVar297 * 0.0;
      auVar31._4_4_ = fVar308;
      auVar31._0_4_ = fVar293;
      fVar296 = local_560._8_4_ * fVar309 * 0.0;
      auVar31._8_4_ = fVar296;
      fVar297 = local_560._12_4_ * fVar249 * 0.0;
      auVar31._12_4_ = fVar297;
      fVar165 = local_560._16_4_ * fVar279 * 0.0;
      auVar31._16_4_ = fVar165;
      fVar309 = local_560._20_4_ * fVar238 * 0.0;
      auVar31._20_4_ = fVar309;
      fVar167 = local_560._24_4_ * fVar237 * 0.0;
      auVar31._24_4_ = fVar167;
      auVar31._28_4_ = fVar263;
      auVar106._4_4_ = fStack_49c;
      auVar106._0_4_ = local_4a0;
      auVar106._8_4_ = fStack_498;
      auVar106._12_4_ = fStack_494;
      auVar106._16_4_ = fStack_490;
      auVar106._20_4_ = fStack_48c;
      auVar106._24_4_ = fStack_488;
      auVar106._28_4_ = fStack_484;
      auVar267._0_4_ = fVar293 + local_4a0;
      auVar267._4_4_ = fVar308 + fStack_49c;
      auVar267._8_4_ = fVar296 + fStack_498;
      auVar267._12_4_ = fVar297 + fStack_494;
      auVar267._16_4_ = fVar165 + fStack_490;
      auVar267._20_4_ = fVar309 + fStack_48c;
      auVar267._24_4_ = fVar167 + fStack_488;
      auVar267._28_4_ = fVar263 + fStack_484;
      fVar293 = auVar257._0_4_ * fVar295 * fVar294;
      fVar308 = auVar257._4_4_ * fVar208 * fVar149;
      auVar32._4_4_ = fVar308;
      auVar32._0_4_ = fVar293;
      fVar295 = auVar257._8_4_ * fVar247 * fVar221;
      auVar32._8_4_ = fVar295;
      fVar296 = auVar257._12_4_ * fVar277 * fVar224;
      auVar32._12_4_ = fVar296;
      fVar297 = auVar257._16_4_ * fVar280 * fVar225;
      auVar32._16_4_ = fVar297;
      fVar208 = auVar257._20_4_ * fVar244 * fVar245;
      auVar32._20_4_ = fVar208;
      fVar165 = auVar257._24_4_ * fVar248 * fVar250;
      auVar32._24_4_ = fVar165;
      auVar32._28_4_ = auVar22._28_4_;
      auVar233 = vsubps_avx(auVar305,auVar28);
      auVar288._0_4_ = (float)local_3c0._0_4_ + fVar293;
      auVar288._4_4_ = (float)local_3c0._4_4_ + fVar308;
      auVar288._8_4_ = fStack_3b8 + fVar295;
      auVar288._12_4_ = fStack_3b4 + fVar296;
      auVar288._16_4_ = fStack_3b0 + fVar297;
      auVar288._20_4_ = fStack_3ac + fVar208;
      auVar288._24_4_ = fStack_3a8 + fVar165;
      auVar288._28_4_ = fStack_3a4 + auVar22._28_4_;
      fVar293 = auVar257._0_4_ * -fVar210 * fVar294;
      fVar308 = auVar257._4_4_ * -fVar218 * fVar149;
      auVar22._4_4_ = fVar308;
      auVar22._0_4_ = fVar293;
      fVar295 = auVar257._8_4_ * -fVar220 * fVar221;
      auVar22._8_4_ = fVar295;
      fVar296 = auVar257._12_4_ * -fVar223 * fVar224;
      auVar22._12_4_ = fVar296;
      fVar297 = auVar257._16_4_ * -fVar141 * fVar225;
      auVar22._16_4_ = fVar297;
      fVar208 = auVar257._20_4_ * -fVar143 * fVar245;
      auVar22._20_4_ = fVar208;
      fVar165 = auVar257._24_4_ * -fVar145 * fVar250;
      auVar22._24_4_ = fVar165;
      auVar22._28_4_ = fVar227;
      auVar26 = vsubps_avx(_local_480,auVar24);
      auVar313._0_4_ = (float)local_3e0._0_4_ + fVar293;
      auVar313._4_4_ = (float)local_3e0._4_4_ + fVar308;
      auVar313._8_4_ = fStack_3d8 + fVar295;
      auVar313._12_4_ = fStack_3d4 + fVar296;
      auVar313._16_4_ = fStack_3d0 + fVar297;
      auVar313._20_4_ = fStack_3cc + fVar208;
      auVar313._24_4_ = fStack_3c8 + fVar165;
      auVar313._28_4_ = fStack_3c4 + fVar227;
      fVar293 = fVar294 * 0.0 * auVar257._0_4_;
      fVar308 = fVar149 * 0.0 * auVar257._4_4_;
      auVar33._4_4_ = fVar308;
      auVar33._0_4_ = fVar293;
      fVar295 = fVar221 * 0.0 * auVar257._8_4_;
      auVar33._8_4_ = fVar295;
      fVar294 = fVar224 * 0.0 * auVar257._12_4_;
      auVar33._12_4_ = fVar294;
      fVar296 = fVar225 * 0.0 * auVar257._16_4_;
      auVar33._16_4_ = fVar296;
      fVar297 = fVar245 * 0.0 * auVar257._20_4_;
      auVar33._20_4_ = fVar297;
      fVar208 = fVar250 * 0.0 * auVar257._24_4_;
      auVar33._24_4_ = fVar208;
      auVar33._28_4_ = fVar226;
      auVar19 = vsubps_avx(auVar106,auVar31);
      auVar321._0_4_ = (float)local_400._0_4_ + fVar293;
      auVar321._4_4_ = (float)local_400._4_4_ + fVar308;
      auVar321._8_4_ = fStack_3f8 + fVar295;
      auVar321._12_4_ = fStack_3f4 + fVar294;
      auVar321._16_4_ = fStack_3f0 + fVar296;
      auVar321._20_4_ = fStack_3ec + fVar297;
      auVar321._24_4_ = fStack_3e8 + fVar208;
      auVar321._28_4_ = fStack_3e4 + fVar226;
      auVar23 = vsubps_avx(_local_3c0,auVar32);
      auVar22 = vsubps_avx(_local_3e0,auVar22);
      auVar30 = vsubps_avx(_local_400,auVar33);
      auVar323 = vsubps_avx(auVar313,auVar26);
      auVar305 = vsubps_avx(auVar321,auVar19);
      auVar34._4_4_ = auVar19._4_4_ * auVar323._4_4_;
      auVar34._0_4_ = auVar19._0_4_ * auVar323._0_4_;
      auVar34._8_4_ = auVar19._8_4_ * auVar323._8_4_;
      auVar34._12_4_ = auVar19._12_4_ * auVar323._12_4_;
      auVar34._16_4_ = auVar19._16_4_ * auVar323._16_4_;
      auVar34._20_4_ = auVar19._20_4_ * auVar323._20_4_;
      auVar34._24_4_ = auVar19._24_4_ * auVar323._24_4_;
      auVar34._28_4_ = fVar226;
      auVar35._4_4_ = auVar26._4_4_ * auVar305._4_4_;
      auVar35._0_4_ = auVar26._0_4_ * auVar305._0_4_;
      auVar35._8_4_ = auVar26._8_4_ * auVar305._8_4_;
      auVar35._12_4_ = auVar26._12_4_ * auVar305._12_4_;
      auVar35._16_4_ = auVar26._16_4_ * auVar305._16_4_;
      auVar35._20_4_ = auVar26._20_4_ * auVar305._20_4_;
      auVar35._24_4_ = auVar26._24_4_ * auVar305._24_4_;
      auVar35._28_4_ = fStack_3c4;
      auVar25 = vsubps_avx(auVar35,auVar34);
      auVar36._4_4_ = auVar233._4_4_ * auVar305._4_4_;
      auVar36._0_4_ = auVar233._0_4_ * auVar305._0_4_;
      auVar36._8_4_ = auVar233._8_4_ * auVar305._8_4_;
      auVar36._12_4_ = auVar233._12_4_ * auVar305._12_4_;
      auVar36._16_4_ = auVar233._16_4_ * auVar305._16_4_;
      auVar36._20_4_ = auVar233._20_4_ * auVar305._20_4_;
      auVar36._24_4_ = auVar233._24_4_ * auVar305._24_4_;
      auVar36._28_4_ = auVar305._28_4_;
      auVar27 = vsubps_avx(auVar288,auVar233);
      auVar37._4_4_ = auVar19._4_4_ * auVar27._4_4_;
      auVar37._0_4_ = auVar19._0_4_ * auVar27._0_4_;
      auVar37._8_4_ = auVar19._8_4_ * auVar27._8_4_;
      auVar37._12_4_ = auVar19._12_4_ * auVar27._12_4_;
      auVar37._16_4_ = auVar19._16_4_ * auVar27._16_4_;
      auVar37._20_4_ = auVar19._20_4_ * auVar27._20_4_;
      auVar37._24_4_ = auVar19._24_4_ * auVar27._24_4_;
      auVar37._28_4_ = fStack_3a4;
      auVar28 = vsubps_avx(auVar37,auVar36);
      auVar38._4_4_ = auVar26._4_4_ * auVar27._4_4_;
      auVar38._0_4_ = auVar26._0_4_ * auVar27._0_4_;
      auVar38._8_4_ = auVar26._8_4_ * auVar27._8_4_;
      auVar38._12_4_ = auVar26._12_4_ * auVar27._12_4_;
      auVar38._16_4_ = auVar26._16_4_ * auVar27._16_4_;
      auVar38._20_4_ = auVar26._20_4_ * auVar27._20_4_;
      auVar38._24_4_ = auVar26._24_4_ * auVar27._24_4_;
      auVar38._28_4_ = auVar305._28_4_;
      auVar39._4_4_ = auVar233._4_4_ * auVar323._4_4_;
      auVar39._0_4_ = auVar233._0_4_ * auVar323._0_4_;
      auVar39._8_4_ = auVar233._8_4_ * auVar323._8_4_;
      auVar39._12_4_ = auVar233._12_4_ * auVar323._12_4_;
      auVar39._16_4_ = auVar233._16_4_ * auVar323._16_4_;
      auVar39._20_4_ = auVar233._20_4_ * auVar323._20_4_;
      auVar39._24_4_ = auVar233._24_4_ * auVar323._24_4_;
      auVar39._28_4_ = auVar323._28_4_;
      auVar323 = vsubps_avx(auVar39,auVar38);
      auVar131._0_4_ = auVar25._0_4_ * 0.0 + auVar323._0_4_ + auVar28._0_4_ * 0.0;
      auVar131._4_4_ = auVar25._4_4_ * 0.0 + auVar323._4_4_ + auVar28._4_4_ * 0.0;
      auVar131._8_4_ = auVar25._8_4_ * 0.0 + auVar323._8_4_ + auVar28._8_4_ * 0.0;
      auVar131._12_4_ = auVar25._12_4_ * 0.0 + auVar323._12_4_ + auVar28._12_4_ * 0.0;
      auVar131._16_4_ = auVar25._16_4_ * 0.0 + auVar323._16_4_ + auVar28._16_4_ * 0.0;
      auVar131._20_4_ = auVar25._20_4_ * 0.0 + auVar323._20_4_ + auVar28._20_4_ * 0.0;
      auVar131._24_4_ = auVar25._24_4_ * 0.0 + auVar323._24_4_ + auVar28._24_4_ * 0.0;
      auVar131._28_4_ = auVar323._28_4_ + auVar323._28_4_ + auVar28._28_4_;
      auVar25 = vcmpps_avx(auVar131,ZEXT832(0) << 0x20,2);
      local_720 = vblendvps_avx(auVar23,_local_4c0,auVar25);
      _local_580 = vblendvps_avx(auVar22,_local_4e0,auVar25);
      auVar23 = vblendvps_avx(auVar30,auVar267,auVar25);
      auVar22 = vblendvps_avx(auVar233,auVar288,auVar25);
      auVar30 = vblendvps_avx(auVar26,auVar313,auVar25);
      auVar323 = vblendvps_avx(auVar19,auVar321,auVar25);
      auVar233 = vblendvps_avx(auVar288,auVar233,auVar25);
      auVar305 = vblendvps_avx(auVar313,auVar26,auVar25);
      auVar183 = vpackssdw_avx(auVar201._0_16_,auVar201._16_16_);
      auVar19 = vblendvps_avx(auVar321,auVar19,auVar25);
      auVar233 = vsubps_avx(auVar233,local_720);
      auVar305 = vsubps_avx(auVar305,_local_580);
      auVar19 = vsubps_avx(auVar19,auVar23);
      auVar27 = vsubps_avx(_local_580,auVar30);
      fVar293 = auVar305._0_4_;
      fVar148 = auVar23._0_4_;
      fVar297 = auVar305._4_4_;
      fVar123 = auVar23._4_4_;
      auVar40._4_4_ = fVar123 * fVar297;
      auVar40._0_4_ = fVar148 * fVar293;
      fVar247 = auVar305._8_4_;
      fVar210 = auVar23._8_4_;
      auVar40._8_4_ = fVar210 * fVar247;
      fVar224 = auVar305._12_4_;
      fVar218 = auVar23._12_4_;
      auVar40._12_4_ = fVar218 * fVar224;
      fVar150 = auVar305._16_4_;
      fVar220 = auVar23._16_4_;
      auVar40._16_4_ = fVar220 * fVar150;
      fVar237 = auVar305._20_4_;
      fVar223 = auVar23._20_4_;
      auVar40._20_4_ = fVar223 * fVar237;
      fVar251 = auVar305._24_4_;
      fVar141 = auVar23._24_4_;
      auVar40._24_4_ = fVar141 * fVar251;
      auVar40._28_4_ = auVar201._28_4_;
      fVar308 = local_580._0_4_;
      fVar252 = auVar19._0_4_;
      fVar208 = local_580._4_4_;
      fVar261 = auVar19._4_4_;
      auVar41._4_4_ = fVar261 * fVar208;
      auVar41._0_4_ = fVar252 * fVar308;
      fVar221 = local_580._8_4_;
      fVar262 = auVar19._8_4_;
      auVar41._8_4_ = fVar262 * fVar221;
      fVar169 = local_580._12_4_;
      fVar263 = auVar19._12_4_;
      auVar41._12_4_ = fVar263 * fVar169;
      fVar238 = local_580._16_4_;
      fVar264 = auVar19._16_4_;
      auVar41._16_4_ = fVar264 * fVar238;
      fVar248 = local_580._20_4_;
      fVar287 = auVar19._20_4_;
      auVar41._20_4_ = fVar287 * fVar248;
      fVar142 = local_580._24_4_;
      fVar286 = auVar19._24_4_;
      uVar11 = auVar26._28_4_;
      auVar41._24_4_ = fVar286 * fVar142;
      auVar41._28_4_ = uVar11;
      auVar201 = vsubps_avx(auVar41,auVar40);
      fVar295 = local_720._0_4_;
      fVar149 = local_720._4_4_;
      auVar42._4_4_ = fVar261 * fVar149;
      auVar42._0_4_ = fVar252 * fVar295;
      fVar167 = local_720._8_4_;
      auVar42._8_4_ = fVar262 * fVar167;
      fVar279 = local_720._12_4_;
      auVar42._12_4_ = fVar263 * fVar279;
      fVar244 = local_720._16_4_;
      auVar42._16_4_ = fVar264 * fVar244;
      fVar250 = local_720._20_4_;
      auVar42._20_4_ = fVar287 * fVar250;
      fVar144 = local_720._24_4_;
      auVar42._24_4_ = fVar286 * fVar144;
      auVar42._28_4_ = uVar11;
      fVar294 = auVar233._0_4_;
      fVar165 = auVar233._4_4_;
      auVar43._4_4_ = fVar123 * fVar165;
      auVar43._0_4_ = fVar148 * fVar294;
      fVar249 = auVar233._8_4_;
      auVar43._8_4_ = fVar210 * fVar249;
      fVar280 = auVar233._12_4_;
      auVar43._12_4_ = fVar218 * fVar280;
      fVar245 = auVar233._16_4_;
      auVar43._16_4_ = fVar220 * fVar245;
      fVar227 = auVar233._20_4_;
      auVar43._20_4_ = fVar223 * fVar227;
      fVar146 = auVar233._24_4_;
      auVar43._24_4_ = fVar141 * fVar146;
      auVar43._28_4_ = auVar313._28_4_;
      auVar26 = vsubps_avx(auVar43,auVar42);
      auVar44._4_4_ = fVar208 * fVar165;
      auVar44._0_4_ = fVar308 * fVar294;
      auVar44._8_4_ = fVar221 * fVar249;
      auVar44._12_4_ = fVar169 * fVar280;
      auVar44._16_4_ = fVar238 * fVar245;
      auVar44._20_4_ = fVar248 * fVar227;
      auVar44._24_4_ = fVar142 * fVar146;
      auVar44._28_4_ = uVar11;
      auVar45._4_4_ = fVar149 * fVar297;
      auVar45._0_4_ = fVar295 * fVar293;
      auVar45._8_4_ = fVar167 * fVar247;
      auVar45._12_4_ = fVar279 * fVar224;
      auVar45._16_4_ = fVar244 * fVar150;
      auVar45._20_4_ = fVar250 * fVar237;
      auVar45._24_4_ = fVar144 * fVar251;
      auVar45._28_4_ = auVar321._28_4_;
      auVar28 = vsubps_avx(auVar45,auVar44);
      auVar24 = vsubps_avx(auVar23,auVar323);
      fVar296 = auVar28._28_4_ + auVar26._28_4_;
      auVar215._0_4_ = auVar28._0_4_ + auVar26._0_4_ * 0.0 + auVar201._0_4_ * 0.0;
      auVar215._4_4_ = auVar28._4_4_ + auVar26._4_4_ * 0.0 + auVar201._4_4_ * 0.0;
      auVar215._8_4_ = auVar28._8_4_ + auVar26._8_4_ * 0.0 + auVar201._8_4_ * 0.0;
      auVar215._12_4_ = auVar28._12_4_ + auVar26._12_4_ * 0.0 + auVar201._12_4_ * 0.0;
      auVar215._16_4_ = auVar28._16_4_ + auVar26._16_4_ * 0.0 + auVar201._16_4_ * 0.0;
      auVar215._20_4_ = auVar28._20_4_ + auVar26._20_4_ * 0.0 + auVar201._20_4_ * 0.0;
      auVar215._24_4_ = auVar28._24_4_ + auVar26._24_4_ * 0.0 + auVar201._24_4_ * 0.0;
      auVar215._28_4_ = fVar296 + 0.0;
      fVar143 = auVar27._0_4_;
      fVar145 = auVar27._4_4_;
      auVar46._4_4_ = fVar145 * auVar323._4_4_;
      auVar46._0_4_ = fVar143 * auVar323._0_4_;
      fVar273 = auVar27._8_4_;
      auVar46._8_4_ = fVar273 * auVar323._8_4_;
      fVar275 = auVar27._12_4_;
      auVar46._12_4_ = fVar275 * auVar323._12_4_;
      fVar276 = auVar27._16_4_;
      auVar46._16_4_ = fVar276 * auVar323._16_4_;
      fVar278 = auVar27._20_4_;
      auVar46._20_4_ = fVar278 * auVar323._20_4_;
      fVar173 = auVar27._24_4_;
      auVar46._24_4_ = fVar173 * auVar323._24_4_;
      auVar46._28_4_ = fVar296;
      fVar296 = auVar24._0_4_;
      fVar309 = auVar24._4_4_;
      auVar47._4_4_ = auVar30._4_4_ * fVar309;
      auVar47._0_4_ = auVar30._0_4_ * fVar296;
      fVar277 = auVar24._8_4_;
      auVar47._8_4_ = auVar30._8_4_ * fVar277;
      fVar225 = auVar24._12_4_;
      auVar47._12_4_ = auVar30._12_4_ * fVar225;
      fVar246 = auVar24._16_4_;
      auVar47._16_4_ = auVar30._16_4_ * fVar246;
      fVar226 = auVar24._20_4_;
      auVar47._20_4_ = auVar30._20_4_ * fVar226;
      fVar147 = auVar24._24_4_;
      auVar47._24_4_ = auVar30._24_4_ * fVar147;
      auVar47._28_4_ = auVar28._28_4_;
      auVar201 = vsubps_avx(auVar47,auVar46);
      auVar324 = ZEXT3264(auVar201);
      auVar26 = vsubps_avx(local_720,auVar22);
      fVar312 = auVar26._0_4_;
      fVar315 = auVar26._4_4_;
      auVar48._4_4_ = fVar315 * auVar323._4_4_;
      auVar48._0_4_ = fVar312 * auVar323._0_4_;
      fVar316 = auVar26._8_4_;
      auVar48._8_4_ = fVar316 * auVar323._8_4_;
      fVar317 = auVar26._12_4_;
      auVar48._12_4_ = fVar317 * auVar323._12_4_;
      fVar318 = auVar26._16_4_;
      auVar48._16_4_ = fVar318 * auVar323._16_4_;
      fVar319 = auVar26._20_4_;
      auVar48._20_4_ = fVar319 * auVar323._20_4_;
      fVar320 = auVar26._24_4_;
      auVar48._24_4_ = fVar320 * auVar323._24_4_;
      auVar48._28_4_ = auVar323._28_4_;
      auVar49._4_4_ = auVar22._4_4_ * fVar309;
      auVar49._0_4_ = auVar22._0_4_ * fVar296;
      auVar49._8_4_ = auVar22._8_4_ * fVar277;
      auVar49._12_4_ = auVar22._12_4_ * fVar225;
      auVar49._16_4_ = auVar22._16_4_ * fVar246;
      auVar49._20_4_ = auVar22._20_4_ * fVar226;
      auVar49._24_4_ = auVar22._24_4_ * fVar147;
      auVar49._28_4_ = 0;
      auVar26 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = auVar30._4_4_ * fVar315;
      auVar50._0_4_ = auVar30._0_4_ * fVar312;
      auVar50._8_4_ = auVar30._8_4_ * fVar316;
      auVar50._12_4_ = auVar30._12_4_ * fVar317;
      auVar50._16_4_ = auVar30._16_4_ * fVar318;
      auVar50._20_4_ = auVar30._20_4_ * fVar319;
      auVar50._24_4_ = auVar30._24_4_ * fVar320;
      auVar50._28_4_ = auVar323._28_4_;
      auVar51._4_4_ = auVar22._4_4_ * fVar145;
      auVar51._0_4_ = auVar22._0_4_ * fVar143;
      auVar51._8_4_ = auVar22._8_4_ * fVar273;
      auVar51._12_4_ = auVar22._12_4_ * fVar275;
      auVar51._16_4_ = auVar22._16_4_ * fVar276;
      auVar51._20_4_ = auVar22._20_4_ * fVar278;
      auVar51._24_4_ = auVar22._24_4_ * fVar173;
      auVar51._28_4_ = auVar22._28_4_;
      auVar22 = vsubps_avx(auVar51,auVar50);
      auVar188._0_4_ = auVar201._0_4_ * 0.0 + auVar22._0_4_ + auVar26._0_4_ * 0.0;
      auVar188._4_4_ = auVar201._4_4_ * 0.0 + auVar22._4_4_ + auVar26._4_4_ * 0.0;
      auVar188._8_4_ = auVar201._8_4_ * 0.0 + auVar22._8_4_ + auVar26._8_4_ * 0.0;
      auVar188._12_4_ = auVar201._12_4_ * 0.0 + auVar22._12_4_ + auVar26._12_4_ * 0.0;
      auVar188._16_4_ = auVar201._16_4_ * 0.0 + auVar22._16_4_ + auVar26._16_4_ * 0.0;
      auVar188._20_4_ = auVar201._20_4_ * 0.0 + auVar22._20_4_ + auVar26._20_4_ * 0.0;
      auVar188._24_4_ = auVar201._24_4_ * 0.0 + auVar22._24_4_ + auVar26._24_4_ * 0.0;
      auVar188._28_4_ = auVar22._28_4_ + auVar22._28_4_ + auVar26._28_4_;
      auVar201 = vmaxps_avx(auVar215,auVar188);
      auVar201 = vcmpps_avx(auVar201,ZEXT832(0) << 0x20,2);
      auVar213 = vpackssdw_avx(auVar201._0_16_,auVar201._16_16_);
      auVar183 = vpand_avx(auVar183,auVar213);
      auVar213 = vpmovsxwd_avx(auVar183);
      auVar198 = vpunpckhwd_avx(auVar183,auVar183);
      auVar132._16_16_ = auVar198;
      auVar132._0_16_ = auVar213;
      if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar132 >> 0x7f,0) == '\0') &&
            (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar198 >> 0x3f,0) == '\0') &&
          (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar198[0xf]
         ) {
LAB_007bba58:
        auVar157._8_8_ = local_460[1]._8_8_;
        auVar157._0_8_ = local_460[1]._0_8_;
        auVar157._16_8_ = local_460[1]._16_8_;
        auVar157._24_8_ = local_460[1]._24_8_;
        auVar270 = ZEXT3264(local_6e0);
        auVar285 = ZEXT3264(local_680);
      }
      else {
        auVar324 = ZEXT3264(auVar215);
        auVar52._4_4_ = fVar309 * fVar297;
        auVar52._0_4_ = fVar296 * fVar293;
        auVar52._8_4_ = fVar277 * fVar247;
        auVar52._12_4_ = fVar225 * fVar224;
        auVar52._16_4_ = fVar246 * fVar150;
        auVar52._20_4_ = fVar226 * fVar237;
        auVar52._24_4_ = fVar147 * fVar251;
        auVar52._28_4_ = auVar198._12_4_;
        auVar299._0_4_ = fVar143 * fVar252;
        auVar299._4_4_ = fVar145 * fVar261;
        auVar299._8_4_ = fVar273 * fVar262;
        auVar299._12_4_ = fVar275 * fVar263;
        auVar299._16_4_ = fVar276 * fVar264;
        auVar299._20_4_ = fVar278 * fVar287;
        auVar299._24_4_ = fVar173 * fVar286;
        auVar299._28_4_ = 0;
        auVar22 = vsubps_avx(auVar299,auVar52);
        auVar53._4_4_ = fVar315 * fVar261;
        auVar53._0_4_ = fVar312 * fVar252;
        auVar53._8_4_ = fVar316 * fVar262;
        auVar53._12_4_ = fVar317 * fVar263;
        auVar53._16_4_ = fVar318 * fVar264;
        auVar53._20_4_ = fVar319 * fVar287;
        auVar53._24_4_ = fVar320 * fVar286;
        auVar53._28_4_ = auVar19._28_4_;
        auVar54._4_4_ = fVar309 * fVar165;
        auVar54._0_4_ = fVar296 * fVar294;
        auVar54._8_4_ = fVar277 * fVar249;
        auVar54._12_4_ = fVar225 * fVar280;
        auVar54._16_4_ = fVar246 * fVar245;
        auVar54._20_4_ = fVar226 * fVar227;
        auVar54._24_4_ = fVar147 * fVar146;
        auVar54._28_4_ = auVar24._28_4_;
        auVar30 = vsubps_avx(auVar54,auVar53);
        auVar55._4_4_ = fVar145 * fVar165;
        auVar55._0_4_ = fVar143 * fVar294;
        auVar55._8_4_ = fVar273 * fVar249;
        auVar55._12_4_ = fVar275 * fVar280;
        auVar55._16_4_ = fVar276 * fVar245;
        auVar55._20_4_ = fVar278 * fVar227;
        auVar55._24_4_ = fVar173 * fVar146;
        auVar55._28_4_ = auVar233._28_4_;
        auVar56._4_4_ = fVar315 * fVar297;
        auVar56._0_4_ = fVar312 * fVar293;
        auVar56._8_4_ = fVar316 * fVar247;
        auVar56._12_4_ = fVar317 * fVar224;
        auVar56._16_4_ = fVar318 * fVar150;
        auVar56._20_4_ = fVar319 * fVar237;
        auVar56._24_4_ = fVar320 * fVar251;
        auVar56._28_4_ = auVar305._28_4_;
        auVar323 = vsubps_avx(auVar56,auVar55);
        auVar259._0_4_ = auVar22._0_4_ * 0.0 + auVar323._0_4_ + auVar30._0_4_ * 0.0;
        auVar259._4_4_ = auVar22._4_4_ * 0.0 + auVar323._4_4_ + auVar30._4_4_ * 0.0;
        auVar259._8_4_ = auVar22._8_4_ * 0.0 + auVar323._8_4_ + auVar30._8_4_ * 0.0;
        auVar259._12_4_ = auVar22._12_4_ * 0.0 + auVar323._12_4_ + auVar30._12_4_ * 0.0;
        auVar259._16_4_ = auVar22._16_4_ * 0.0 + auVar323._16_4_ + auVar30._16_4_ * 0.0;
        auVar259._20_4_ = auVar22._20_4_ * 0.0 + auVar323._20_4_ + auVar30._20_4_ * 0.0;
        auVar259._24_4_ = auVar22._24_4_ * 0.0 + auVar323._24_4_ + auVar30._24_4_ * 0.0;
        auVar259._28_4_ = auVar305._28_4_ + auVar323._28_4_ + auVar233._28_4_;
        auVar201 = vrcpps_avx(auVar259);
        fVar294 = auVar201._0_4_;
        fVar296 = auVar201._4_4_;
        auVar57._4_4_ = auVar259._4_4_ * fVar296;
        auVar57._0_4_ = auVar259._0_4_ * fVar294;
        fVar297 = auVar201._8_4_;
        auVar57._8_4_ = auVar259._8_4_ * fVar297;
        fVar165 = auVar201._12_4_;
        auVar57._12_4_ = auVar259._12_4_ * fVar165;
        fVar309 = auVar201._16_4_;
        auVar57._16_4_ = auVar259._16_4_ * fVar309;
        fVar247 = auVar201._20_4_;
        auVar57._20_4_ = auVar259._20_4_ * fVar247;
        fVar249 = auVar201._24_4_;
        auVar57._24_4_ = auVar259._24_4_ * fVar249;
        auVar57._28_4_ = auVar24._28_4_;
        auVar300._8_4_ = 0x3f800000;
        auVar300._0_8_ = 0x3f8000003f800000;
        auVar300._12_4_ = 0x3f800000;
        auVar300._16_4_ = 0x3f800000;
        auVar300._20_4_ = 0x3f800000;
        auVar300._24_4_ = 0x3f800000;
        auVar300._28_4_ = 0x3f800000;
        auVar201 = vsubps_avx(auVar300,auVar57);
        fVar294 = auVar201._0_4_ * fVar294 + fVar294;
        fVar296 = auVar201._4_4_ * fVar296 + fVar296;
        fVar297 = auVar201._8_4_ * fVar297 + fVar297;
        fVar165 = auVar201._12_4_ * fVar165 + fVar165;
        fVar309 = auVar201._16_4_ * fVar309 + fVar309;
        fVar247 = auVar201._20_4_ * fVar247 + fVar247;
        fVar249 = auVar201._24_4_ * fVar249 + fVar249;
        auVar58._4_4_ =
             (auVar22._4_4_ * fVar149 + auVar30._4_4_ * fVar208 + auVar323._4_4_ * fVar123) *
             fVar296;
        auVar58._0_4_ =
             (auVar22._0_4_ * fVar295 + auVar30._0_4_ * fVar308 + auVar323._0_4_ * fVar148) *
             fVar294;
        auVar58._8_4_ =
             (auVar22._8_4_ * fVar167 + auVar30._8_4_ * fVar221 + auVar323._8_4_ * fVar210) *
             fVar297;
        auVar58._12_4_ =
             (auVar22._12_4_ * fVar279 + auVar30._12_4_ * fVar169 + auVar323._12_4_ * fVar218) *
             fVar165;
        auVar58._16_4_ =
             (auVar22._16_4_ * fVar244 + auVar30._16_4_ * fVar238 + auVar323._16_4_ * fVar220) *
             fVar309;
        auVar58._20_4_ =
             (auVar22._20_4_ * fVar250 + auVar30._20_4_ * fVar248 + auVar323._20_4_ * fVar223) *
             fVar247;
        auVar58._24_4_ =
             (auVar22._24_4_ * fVar144 + auVar30._24_4_ * fVar142 + auVar323._24_4_ * fVar141) *
             fVar249;
        auVar58._28_4_ = auVar215._28_4_ + auVar23._28_4_;
        auVar133._16_16_ = auVar21;
        auVar133._0_16_ = auVar21;
        auVar201 = vcmpps_avx(auVar133,auVar58,2);
        fVar293 = (ray->super_RayK<1>).tfar;
        auVar156._4_4_ = fVar293;
        auVar156._0_4_ = fVar293;
        auVar156._8_4_ = fVar293;
        auVar156._12_4_ = fVar293;
        auVar156._16_4_ = fVar293;
        auVar156._20_4_ = fVar293;
        auVar156._24_4_ = fVar293;
        auVar156._28_4_ = fVar293;
        auVar23 = vcmpps_avx(auVar58,auVar156,2);
        auVar201 = vandps_avx(auVar23,auVar201);
        auVar213 = vpackssdw_avx(auVar201._0_16_,auVar201._16_16_);
        auVar183 = vpand_avx(auVar183,auVar213);
        auVar213 = vpmovsxwd_avx(auVar183);
        auVar198 = vpshufd_avx(auVar183,0xee);
        auVar198 = vpmovsxwd_avx(auVar198);
        auVar134._16_16_ = auVar198;
        auVar134._0_16_ = auVar213;
        if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar134 >> 0x7f,0) == '\0') &&
              (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar198 >> 0x3f,0) == '\0') &&
            (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar198[0xf]) goto LAB_007bba58;
        auVar201 = vcmpps_avx(ZEXT832(0) << 0x20,auVar259,4);
        auVar213 = vpackssdw_avx(auVar201._0_16_,auVar201._16_16_);
        auVar183 = vpand_avx(auVar183,auVar213);
        auVar213 = vpmovsxwd_avx(auVar183);
        auVar183 = vpunpckhwd_avx(auVar183,auVar183);
        auVar234._16_16_ = auVar183;
        auVar234._0_16_ = auVar213;
        auVar157._8_8_ = local_460[1]._8_8_;
        auVar157._0_8_ = local_460[1]._0_8_;
        auVar157._16_8_ = local_460[1]._16_8_;
        auVar157._24_8_ = local_460[1]._24_8_;
        auVar270 = ZEXT3264(local_6e0);
        auVar285 = ZEXT3264(local_680);
        if ((((((((auVar234 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar234 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar234 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar234 >> 0x7f,0) != '\0') ||
              (auVar234 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar183 >> 0x3f,0) != '\0') ||
            (auVar234 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar183[0xf] < '\0') {
          auVar135._0_4_ = auVar215._0_4_ * fVar294;
          auVar135._4_4_ = auVar215._4_4_ * fVar296;
          auVar135._8_4_ = auVar215._8_4_ * fVar297;
          auVar135._12_4_ = auVar215._12_4_ * fVar165;
          auVar135._16_4_ = auVar215._16_4_ * fVar309;
          auVar135._20_4_ = auVar215._20_4_ * fVar247;
          auVar135._24_4_ = auVar215._24_4_ * fVar249;
          auVar135._28_4_ = 0;
          auVar59._4_4_ = auVar188._4_4_ * fVar296;
          auVar59._0_4_ = auVar188._0_4_ * fVar294;
          auVar59._8_4_ = auVar188._8_4_ * fVar297;
          auVar59._12_4_ = auVar188._12_4_ * fVar165;
          auVar59._16_4_ = auVar188._16_4_ * fVar309;
          auVar59._20_4_ = auVar188._20_4_ * fVar247;
          auVar59._24_4_ = auVar188._24_4_ * fVar249;
          auVar59._28_4_ = SUB84(local_460[1]._24_8_,4);
          auVar242._8_4_ = 0x3f800000;
          auVar242._0_8_ = 0x3f8000003f800000;
          auVar242._12_4_ = 0x3f800000;
          auVar242._16_4_ = 0x3f800000;
          auVar242._20_4_ = 0x3f800000;
          auVar242._24_4_ = 0x3f800000;
          auVar242._28_4_ = 0x3f800000;
          auVar201 = vsubps_avx(auVar242,auVar135);
          auVar201 = vblendvps_avx(auVar201,auVar135,auVar25);
          auVar270 = ZEXT3264(auVar201);
          auVar201 = vsubps_avx(auVar242,auVar59);
          _local_340 = vblendvps_avx(auVar201,auVar59,auVar25);
          auVar285 = ZEXT3264(auVar58);
          auVar157 = auVar234;
        }
      }
      auVar314 = ZEXT3264(_local_620);
      auVar260 = ZEXT3264(_local_640);
      if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar157 >> 0x7f,0) != '\0') ||
            (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar157 >> 0xbf,0) != '\0') ||
          (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar157[0x1f] < '\0') {
        auVar201 = vsubps_avx(auVar257,local_560);
        fVar308 = (float)local_560._0_4_ + auVar270._0_4_ * auVar201._0_4_;
        fVar295 = local_560._4_4_ + auVar270._4_4_ * auVar201._4_4_;
        fVar294 = local_560._8_4_ + auVar270._8_4_ * auVar201._8_4_;
        fVar296 = local_560._12_4_ + auVar270._12_4_ * auVar201._12_4_;
        fVar297 = local_560._16_4_ + auVar270._16_4_ * auVar201._16_4_;
        fVar208 = local_560._20_4_ + auVar270._20_4_ * auVar201._20_4_;
        fVar149 = local_560._24_4_ + auVar270._24_4_ * auVar201._24_4_;
        fVar165 = auVar201._28_4_ + 0.0;
        fVar293 = pre->depth_scale;
        auVar60._4_4_ = (fVar295 + fVar295) * fVar293;
        auVar60._0_4_ = (fVar308 + fVar308) * fVar293;
        auVar60._8_4_ = (fVar294 + fVar294) * fVar293;
        auVar60._12_4_ = (fVar296 + fVar296) * fVar293;
        auVar60._16_4_ = (fVar297 + fVar297) * fVar293;
        auVar60._20_4_ = (fVar208 + fVar208) * fVar293;
        auVar60._24_4_ = (fVar149 + fVar149) * fVar293;
        auVar60._28_4_ = fVar165 + fVar165;
        local_220 = auVar285._0_32_;
        auVar201 = vcmpps_avx(local_220,auVar60,6);
        auVar23 = auVar157 & auVar201;
        if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar23 >> 0x7f,0) != '\0') ||
              (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0xbf,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar23[0x1f] < '\0') {
          local_340._0_4_ = (float)local_340._0_4_ + (float)local_340._0_4_ + -1.0;
          local_340._4_4_ = (float)local_340._4_4_ + (float)local_340._4_4_ + -1.0;
          uStack_338._0_4_ = (float)uStack_338 + (float)uStack_338 + -1.0;
          uStack_338._4_4_ = uStack_338._4_4_ + uStack_338._4_4_ + -1.0;
          uStack_330._0_4_ = (float)uStack_330 + (float)uStack_330 + -1.0;
          uStack_330._4_4_ = uStack_330._4_4_ + uStack_330._4_4_ + -1.0;
          uStack_328._0_4_ = (float)uStack_328 + (float)uStack_328 + -1.0;
          uStack_328._4_4_ = uStack_328._4_4_ + uStack_328._4_4_ + -1.0;
          local_260 = auVar270._0_32_;
          auVar113 = _local_340;
          auVar23 = _local_340;
          local_240 = (float)local_340._0_4_;
          fStack_23c = (float)local_340._4_4_;
          fStack_238 = (float)uStack_338;
          fStack_234 = uStack_338._4_4_;
          fStack_230 = (float)uStack_330;
          fStack_22c = uStack_330._4_4_;
          fStack_228 = (float)uStack_328;
          fStack_224 = uStack_328._4_4_;
          local_200 = 0;
          local_1fc = uVar16;
          local_1e0 = local_690;
          uStack_1d8 = uStack_688;
          local_1d0 = local_6a0;
          uStack_1c8 = uStack_698;
          local_1c0 = local_6b0;
          uStack_1b8 = uStack_6a8;
          local_5a0._0_8_ = lVar117;
          _local_6b0 = auVar125;
          _local_6a0 = auVar126;
          _local_690 = auVar153;
          _local_340 = auVar23;
          if ((pGVar17->mask & (ray->super_RayK<1>).mask) != 0) {
            auVar201 = vandps_avx(auVar201,auVar157);
            local_460[0] = auVar201;
            auVar180._0_4_ = 1.0 / auVar231._0_4_;
            auVar180._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar232 = vshufps_avx(auVar180,auVar180,0);
            local_180[0] = auVar232._0_4_ * (auVar270._0_4_ + 0.0);
            local_180[1] = auVar232._4_4_ * (auVar270._4_4_ + 1.0);
            local_180[2] = auVar232._8_4_ * (auVar270._8_4_ + 2.0);
            local_180[3] = auVar232._12_4_ * (auVar270._12_4_ + 3.0);
            fStack_170 = auVar232._0_4_ * (auVar270._16_4_ + 4.0);
            fStack_16c = auVar232._4_4_ * (auVar270._20_4_ + 5.0);
            fStack_168 = auVar232._8_4_ * (auVar270._24_4_ + 6.0);
            fStack_164 = auVar270._28_4_ + 7.0;
            uStack_330 = auVar113._16_8_;
            uStack_328 = auVar23._24_8_;
            local_160 = local_340;
            uStack_158 = uStack_338;
            uStack_150 = uStack_330;
            uStack_148 = uStack_328;
            local_140 = local_220;
            auVar158._8_4_ = 0x7f800000;
            auVar158._0_8_ = 0x7f8000007f800000;
            auVar158._12_4_ = 0x7f800000;
            auVar158._16_4_ = 0x7f800000;
            auVar158._20_4_ = 0x7f800000;
            auVar158._24_4_ = 0x7f800000;
            auVar158._28_4_ = 0x7f800000;
            auVar23 = vblendvps_avx(auVar158,local_220,auVar201);
            auVar22 = vshufps_avx(auVar23,auVar23,0xb1);
            auVar22 = vminps_avx(auVar23,auVar22);
            auVar30 = vshufpd_avx(auVar22,auVar22,5);
            auVar22 = vminps_avx(auVar22,auVar30);
            auVar30 = vperm2f128_avx(auVar22,auVar22,1);
            auVar22 = vminps_avx(auVar22,auVar30);
            auVar23 = vcmpps_avx(auVar23,auVar22,0);
            auVar22 = auVar201 & auVar23;
            if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0x7f,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar22 >> 0xbf,0) != '\0') ||
                (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar22[0x1f] < '\0') {
              auVar201 = vandps_avx(auVar23,auVar201);
            }
            uVar115 = vmovmskps_avx(auVar201);
            uVar116 = 0;
            if (uVar115 != 0) {
              for (; (uVar115 >> uVar116 & 1) == 0; uVar116 = uVar116 + 1) {
              }
            }
            uVar118 = (ulong)uVar116;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_5a0._8_24_ = auVar257._8_24_;
              local_680 = local_220;
              local_560 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
              local_6e0 = auVar270._0_32_;
              local_5a8 = context;
              _local_2e0 = auVar140;
              do {
                local_5d4 = local_180[uVar118];
                local_5d0 = *(undefined4 *)((long)&local_160 + uVar118 * 4);
                local_720._0_8_ = uVar118;
                (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar118 * 4);
                local_750.context = context->user;
                fVar209 = 1.0 - local_5d4;
                fVar193 = local_5d4 * fVar209 * 4.0;
                auVar232 = ZEXT416((uint)(local_5d4 * local_5d4 * 0.5));
                auVar232 = vshufps_avx(auVar232,auVar232,0);
                auVar183 = ZEXT416((uint)((fVar209 * fVar209 + fVar193) * 0.5));
                auVar183 = vshufps_avx(auVar183,auVar183,0);
                auVar213 = ZEXT416((uint)((-local_5d4 * local_5d4 - fVar193) * 0.5));
                auVar213 = vshufps_avx(auVar213,auVar213,0);
                auVar198 = ZEXT416((uint)(fVar209 * -fVar209 * 0.5));
                auVar198 = vshufps_avx(auVar198,auVar198,0);
                auVar186._0_4_ =
                     auVar198._0_4_ * local_7b0 +
                     auVar213._0_4_ * (float)local_690._0_4_ +
                     auVar232._0_4_ * (float)local_6b0._0_4_ +
                     auVar183._0_4_ * (float)local_6a0._0_4_;
                auVar186._4_4_ =
                     auVar198._4_4_ * fStack_7ac +
                     auVar213._4_4_ * (float)local_690._4_4_ +
                     auVar232._4_4_ * (float)local_6b0._4_4_ +
                     auVar183._4_4_ * (float)local_6a0._4_4_;
                auVar186._8_4_ =
                     auVar198._8_4_ * fStack_7a8 +
                     auVar213._8_4_ * (float)uStack_688 +
                     auVar232._8_4_ * (float)uStack_6a8 + auVar183._8_4_ * (float)uStack_698;
                auVar186._12_4_ =
                     auVar198._12_4_ * fStack_7a4 +
                     auVar213._12_4_ * uStack_688._4_4_ +
                     auVar232._12_4_ * uStack_6a8._4_4_ + auVar183._12_4_ * uStack_698._4_4_;
                local_5e0 = vmovlps_avx(auVar186);
                local_5d8 = vextractps_avx(auVar186,2);
                local_5cc = uVar114;
                local_5c8 = (int)local_7c0;
                local_5c4 = (local_750.context)->instID[0];
                local_5c0 = (local_750.context)->instPrimID[0];
                local_7c4 = -1;
                local_750.valid = &local_7c4;
                local_750.geometryUserPtr = local_7b8->userPtr;
                local_750.ray = (RTCRayN *)ray;
                local_750.hit = (RTCHitN *)&local_5e0;
                local_750.N = 1;
                if (local_7b8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_007bbcc5:
                  p_Var18 = context->args->filter;
                  if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_7b8->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar324 = ZEXT1664(auVar324._0_16_);
                    (*p_Var18)(&local_750);
                    auVar314 = ZEXT3264(_local_620);
                    auVar260 = ZEXT3264(_local_640);
                    auVar270 = ZEXT3264(local_6e0);
                    context = local_5a8;
                    pre = local_758;
                    fVar194 = (float)local_700._0_4_;
                    fVar203 = (float)local_700._4_4_;
                    fVar205 = fStack_6f8;
                    fVar207 = fStack_6f4;
                    fVar274 = fStack_6f0;
                    fVar310 = fStack_6ec;
                    fVar311 = fStack_6e8;
                    if (*local_750.valid == 0) goto LAB_007bbdb9;
                  }
                  (((Vec3f *)((long)local_750.ray + 0x30))->field_0).components[0] =
                       *(float *)local_750.hit;
                  (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_750.hit + 4);
                  (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_750.hit + 8);
                  *(float *)((long)local_750.ray + 0x3c) = *(float *)(local_750.hit + 0xc);
                  *(float *)((long)local_750.ray + 0x40) = *(float *)(local_750.hit + 0x10);
                  *(float *)((long)local_750.ray + 0x44) = *(float *)(local_750.hit + 0x14);
                  *(float *)((long)local_750.ray + 0x48) = *(float *)(local_750.hit + 0x18);
                  *(float *)((long)local_750.ray + 0x4c) = *(float *)(local_750.hit + 0x1c);
                  *(float *)((long)local_750.ray + 0x50) = *(float *)(local_750.hit + 0x20);
                }
                else {
                  auVar324 = ZEXT1664(auVar324._0_16_);
                  (*local_7b8->intersectionFilterN)(&local_750);
                  auVar314 = ZEXT3264(_local_620);
                  auVar260 = ZEXT3264(_local_640);
                  auVar270 = ZEXT3264(local_6e0);
                  context = local_5a8;
                  pre = local_758;
                  fVar194 = (float)local_700._0_4_;
                  fVar203 = (float)local_700._4_4_;
                  fVar205 = fStack_6f8;
                  fVar207 = fStack_6f4;
                  fVar274 = fStack_6f0;
                  fVar310 = fStack_6ec;
                  fVar311 = fStack_6e8;
                  if (*local_750.valid != 0) goto LAB_007bbcc5;
LAB_007bbdb9:
                  (ray->super_RayK<1>).tfar = (float)local_560._0_4_;
                  context = local_5a8;
                  pre = local_758;
                }
                *(undefined4 *)(local_460[0] + local_720._0_8_ * 4) = 0;
                auVar22 = local_460[0];
                fVar193 = (ray->super_RayK<1>).tfar;
                auVar140._4_4_ = fVar193;
                auVar140._0_4_ = fVar193;
                auVar140._8_4_ = fVar193;
                auVar140._12_4_ = fVar193;
                auVar140._16_4_ = fVar193;
                auVar140._20_4_ = fVar193;
                auVar140._24_4_ = fVar193;
                auVar140._28_4_ = fVar193;
                auVar285 = ZEXT3264(local_680);
                auVar23 = vcmpps_avx(local_680,auVar140,2);
                auVar201 = vandps_avx(auVar23,local_460[0]);
                local_460[0] = auVar201;
                auVar22 = auVar22 & auVar23;
                fVar175 = (float)local_660._0_4_;
                fVar190 = (float)local_660._4_4_;
                fVar191 = fStack_658;
                fVar192 = fStack_654;
                fVar204 = fStack_650;
                fVar219 = fStack_64c;
                fVar206 = fStack_648;
                auVar21 = _local_780;
                if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar22 >> 0x7f,0) == '\0') &&
                      (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar22 >> 0xbf,0) == '\0') &&
                    (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar22[0x1f]) goto LAB_007baa1e;
                local_560 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                auVar162._8_4_ = 0x7f800000;
                auVar162._0_8_ = 0x7f8000007f800000;
                auVar162._12_4_ = 0x7f800000;
                auVar162._16_4_ = 0x7f800000;
                auVar162._20_4_ = 0x7f800000;
                auVar162._24_4_ = 0x7f800000;
                auVar162._28_4_ = 0x7f800000;
                auVar23 = vblendvps_avx(auVar162,local_680,auVar201);
                auVar22 = vshufps_avx(auVar23,auVar23,0xb1);
                auVar22 = vminps_avx(auVar23,auVar22);
                auVar30 = vshufpd_avx(auVar22,auVar22,5);
                auVar22 = vminps_avx(auVar22,auVar30);
                auVar30 = vperm2f128_avx(auVar22,auVar22,1);
                auVar22 = vminps_avx(auVar22,auVar30);
                auVar23 = vcmpps_avx(auVar23,auVar22,0);
                auVar22 = auVar201 & auVar23;
                if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar22 >> 0x7f,0) != '\0') ||
                      (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0xbf,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar22[0x1f] < '\0') {
                  auVar201 = vandps_avx(auVar23,auVar201);
                }
                uVar116 = vmovmskps_avx(auVar201);
                uVar15 = 0;
                if (uVar116 != 0) {
                  for (; (uVar116 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                uVar118 = (ulong)uVar15;
              } while( true );
            }
            fVar193 = local_180[uVar118];
            fVar209 = *(float *)((long)&local_160 + uVar118 * 4);
            fVar217 = 1.0 - fVar193;
            fVar202 = fVar193 * fVar217 * 4.0;
            auVar232 = ZEXT416((uint)(fVar193 * fVar193 * 0.5));
            auVar232 = vshufps_avx(auVar232,auVar232,0);
            auVar183 = ZEXT416((uint)((fVar217 * fVar217 + fVar202) * 0.5));
            auVar183 = vshufps_avx(auVar183,auVar183,0);
            auVar213 = ZEXT416((uint)((-fVar193 * fVar193 - fVar202) * 0.5));
            auVar213 = vshufps_avx(auVar213,auVar213,0);
            auVar198 = ZEXT416((uint)(fVar217 * -fVar217 * 0.5));
            auVar198 = vshufps_avx(auVar198,auVar198,0);
            auVar181._0_4_ =
                 auVar198._0_4_ * local_7b0 +
                 auVar213._0_4_ * (float)local_690._0_4_ +
                 auVar232._0_4_ * (float)local_6b0._0_4_ + auVar183._0_4_ * (float)local_6a0._0_4_;
            auVar181._4_4_ =
                 auVar198._4_4_ * fStack_7ac +
                 auVar213._4_4_ * (float)local_690._4_4_ +
                 auVar232._4_4_ * (float)local_6b0._4_4_ + auVar183._4_4_ * (float)local_6a0._4_4_;
            auVar181._8_4_ =
                 auVar198._8_4_ * fStack_7a8 +
                 auVar213._8_4_ * (float)uStack_688 +
                 auVar232._8_4_ * (float)uStack_6a8 + auVar183._8_4_ * (float)uStack_698;
            auVar181._12_4_ =
                 auVar198._12_4_ * fStack_7a4 +
                 auVar213._12_4_ * uStack_688._4_4_ +
                 auVar232._12_4_ * uStack_6a8._4_4_ + auVar183._12_4_ * uStack_698._4_4_;
            (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar118 * 4);
            uVar12 = vmovlps_avx(auVar181);
            *(undefined8 *)&(ray->Ng).field_0 = uVar12;
            fVar202 = (float)vextractps_avx(auVar181,2);
            (ray->Ng).field_0.field_0.z = fVar202;
            ray->u = fVar193;
            ray->v = fVar209;
            ray->primID = uVar114;
            ray->geomID = uVar15;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
          }
LAB_007baa1e:
          _local_780 = auVar21;
          lVar117 = local_5a0._0_8_;
          fVar151 = (float)local_600._0_4_;
          fVar164 = (float)local_600._4_4_;
          fVar166 = fStack_5f8;
          fVar168 = fStack_5f4;
          fVar193 = fStack_5f0;
          fVar209 = fStack_5ec;
          fVar202 = fStack_5e8;
          fVar217 = fStack_5e4;
          fVar170 = (float)local_500._0_4_;
          fVar171 = (float)local_500._4_4_;
          fVar172 = fStack_4f8;
          fVar174 = fStack_4f4;
          fVar222 = fStack_4f0;
          fVar265 = fStack_4ec;
          fVar271 = fStack_4e8;
          fVar272 = fStack_4e4;
          auVar21 = _local_780;
        }
        _local_780 = auVar21;
        auVar232 = _local_7a0;
        auVar21 = _local_780;
      }
    }
    _local_780 = auVar21;
    auVar163 = ZEXT3264(local_420);
    if (8 < (int)uVar16) {
      _local_4c0 = vpshufd_avx(ZEXT416(uVar16),0);
      auVar232 = vshufps_avx(auVar232,auVar232,0);
      register0x00001210 = auVar232;
      _local_400 = auVar232;
      local_300 = local_780._0_4_;
      fStack_2fc = local_780._4_4_;
      fStack_2f8 = local_780._8_4_;
      fStack_2f4 = local_780._12_4_;
      auVar128._0_4_ = 1.0 / (float)local_520._0_4_;
      auVar128._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar232 = vshufps_avx(auVar128,auVar128,0);
      register0x00001210 = auVar232;
      _local_320 = auVar232;
      lVar122 = 8;
      local_6e0 = auVar270._0_32_;
      local_680 = auVar285._0_32_;
      fStack_2f0 = local_300;
      fStack_2ec = fStack_2fc;
      fStack_2e8 = fStack_2f8;
      uStack_2e4 = fStack_2f4;
LAB_007bab02:
      local_420 = auVar163._0_32_;
      if (lVar122 < lVar117) {
        pauVar2 = (undefined1 (*) [28])(bspline_basis0 + lVar122 * 4 + lVar120);
        fVar293 = *(float *)*pauVar2;
        fVar308 = *(float *)(*pauVar2 + 4);
        fVar295 = *(float *)(*pauVar2 + 8);
        fVar294 = *(float *)(*pauVar2 + 0xc);
        fVar296 = *(float *)(*pauVar2 + 0x10);
        fVar297 = *(float *)(*pauVar2 + 0x14);
        fVar208 = *(float *)(*pauVar2 + 0x18);
        auVar112 = *pauVar2;
        pauVar5 = (undefined1 (*) [28])(lVar120 + 0x21fffac + lVar122 * 4);
        fVar149 = *(float *)*pauVar5;
        fVar165 = *(float *)(*pauVar5 + 4);
        fVar309 = *(float *)(*pauVar5 + 8);
        fVar247 = *(float *)(*pauVar5 + 0xc);
        fVar221 = *(float *)(*pauVar5 + 0x10);
        fVar167 = *(float *)(*pauVar5 + 0x14);
        fVar249 = *(float *)(*pauVar5 + 0x18);
        auVar111 = *pauVar5;
        pauVar5 = (undefined1 (*) [28])(lVar120 + 0x2200430 + lVar122 * 4);
        fVar277 = *(float *)*pauVar5;
        fVar224 = *(float *)(*pauVar5 + 4);
        fVar169 = *(float *)(*pauVar5 + 8);
        fVar279 = *(float *)(*pauVar5 + 0xc);
        fVar280 = *(float *)(*pauVar5 + 0x10);
        fVar225 = *(float *)(*pauVar5 + 0x14);
        fVar150 = *(float *)(*pauVar5 + 0x18);
        auVar110 = *pauVar5;
        pauVar5 = (undefined1 (*) [28])(lVar120 + 0x22008b4 + lVar122 * 4);
        fVar238 = *(float *)*pauVar5;
        fVar244 = *(float *)(*pauVar5 + 4);
        fVar245 = *(float *)(*pauVar5 + 8);
        fVar246 = *(float *)(*pauVar5 + 0xc);
        fVar237 = *(float *)(*pauVar5 + 0x10);
        fVar248 = *(float *)(*pauVar5 + 0x14);
        fVar250 = *(float *)(*pauVar5 + 0x18);
        auVar109 = *pauVar5;
        fVar227 = *(float *)pauVar5[1];
        fVar226 = fVar227 + fVar227 + fVar217;
        local_7a0._0_4_ =
             fVar293 * (float)local_2c0._0_4_ +
             (float)local_3a0._0_4_ * fVar238 + fVar151 * fVar277 + auVar260._0_4_ * fVar149;
        local_7a0._4_4_ =
             fVar308 * (float)local_2c0._4_4_ +
             (float)local_3a0._4_4_ * fVar244 + fVar164 * fVar224 + auVar260._4_4_ * fVar165;
        fStack_798 = fVar295 * fStack_2b8 +
                     fStack_398 * fVar245 + fVar166 * fVar169 + auVar260._8_4_ * fVar309;
        fStack_794 = fVar294 * fStack_2b4 +
                     fStack_394 * fVar246 + fVar168 * fVar279 + auVar260._12_4_ * fVar247;
        fStack_790 = fVar296 * fStack_2b0 +
                     fStack_390 * fVar237 + fVar193 * fVar280 + auVar260._16_4_ * fVar221;
        fStack_78c = fVar297 * fStack_2ac +
                     fStack_38c * fVar248 + fVar209 * fVar225 + auVar260._20_4_ * fVar167;
        fStack_788 = fVar208 * fStack_2a8 +
                     fStack_388 * fVar250 + fVar202 * fVar150 + auVar260._24_4_ * fVar249;
        fStack_784 = fVar227 + fVar217 + auVar324._28_4_ + fVar227 + fVar227;
        local_520._0_4_ =
             fVar194 * fVar277 + fVar170 * fVar238 + auVar314._0_4_ * fVar149 + fVar293 * fVar175;
        local_520._4_4_ =
             fVar203 * fVar224 + fVar171 * fVar244 + auVar314._4_4_ * fVar165 + fVar308 * fVar190;
        local_520._8_4_ =
             fVar205 * fVar169 + fVar172 * fVar245 + auVar314._8_4_ * fVar309 + fVar295 * fVar191;
        local_520._12_4_ =
             fVar207 * fVar279 + fVar174 * fVar246 + auVar314._12_4_ * fVar247 + fVar294 * fVar192;
        local_520._16_4_ =
             fVar274 * fVar280 + fVar222 * fVar237 + auVar314._16_4_ * fVar221 + fVar296 * fVar204;
        local_520._20_4_ =
             fVar310 * fVar225 + fVar265 * fVar248 + auVar314._20_4_ * fVar167 + fVar297 * fVar219;
        local_520._24_4_ =
             fVar311 * fVar150 + fVar271 * fVar250 + auVar314._24_4_ * fVar249 + fVar208 * fVar206;
        local_520._28_4_ = fVar227 + auVar163._28_4_ + fVar227 + fStack_784;
        local_780._0_4_ =
             fVar293 * (float)local_a0._0_4_ +
             (float)local_80._0_4_ * fVar149 +
             fVar277 * (float)local_e0._0_4_ + fVar238 * (float)local_100._0_4_;
        local_780._4_4_ =
             fVar308 * (float)local_a0._4_4_ +
             (float)local_80._4_4_ * fVar165 +
             fVar224 * (float)local_e0._4_4_ + fVar244 * (float)local_100._4_4_;
        fStack_778 = fVar295 * fStack_98 +
                     fStack_78 * fVar309 + fVar169 * fStack_d8 + fVar245 * fStack_f8;
        fStack_774 = fVar294 * fStack_94 +
                     fStack_74 * fVar247 + fVar279 * fStack_d4 + fVar246 * fStack_f4;
        fStack_770 = fVar296 * fStack_90 +
                     fStack_70 * fVar221 + fVar280 * fStack_d0 + fVar237 * fStack_f0;
        fStack_76c = fVar297 * fStack_8c +
                     fStack_6c * fVar167 + fVar225 * fStack_cc + fVar248 * fStack_ec;
        fStack_768 = fVar208 * fStack_88 +
                     fStack_68 * fVar249 + fVar150 * fStack_c8 + fVar250 * fStack_e8;
        fStack_764 = fStack_784 + fVar226;
        pfVar3 = (float *)(bspline_basis1 + lVar122 * 4 + lVar120);
        fVar293 = *pfVar3;
        fVar308 = pfVar3[1];
        fVar295 = pfVar3[2];
        fVar294 = pfVar3[3];
        fVar296 = pfVar3[4];
        fVar297 = pfVar3[5];
        fVar208 = pfVar3[6];
        auVar324 = ZEXT3264(auVar314._0_32_);
        pfVar6 = (float *)(lVar120 + 0x22023cc + lVar122 * 4);
        fVar149 = *pfVar6;
        fVar165 = pfVar6[1];
        fVar309 = pfVar6[2];
        fVar247 = pfVar6[3];
        fVar221 = pfVar6[4];
        fVar167 = pfVar6[5];
        fVar249 = pfVar6[6];
        pfVar7 = (float *)(lVar120 + 0x2202850 + lVar122 * 4);
        fVar277 = *pfVar7;
        fVar224 = pfVar7[1];
        fVar169 = pfVar7[2];
        fVar279 = pfVar7[3];
        fVar280 = pfVar7[4];
        fVar225 = pfVar7[5];
        fVar150 = pfVar7[6];
        pfVar8 = (float *)(lVar120 + 0x2202cd4 + lVar122 * 4);
        fVar238 = *pfVar8;
        fVar244 = pfVar8[1];
        fVar245 = pfVar8[2];
        fVar246 = pfVar8[3];
        fVar237 = pfVar8[4];
        fVar248 = pfVar8[5];
        fVar250 = pfVar8[6];
        fVar217 = pfVar8[7];
        fVar251 = *(float *)pauVar2[1] + fVar217;
        fVar227 = fVar217 + fVar217 + fVar226;
        local_560._0_4_ =
             (float)local_2c0._0_4_ * fVar293 +
             fVar149 * auVar260._0_4_ + fVar277 * fVar151 + (float)local_3a0._0_4_ * fVar238;
        local_560._4_4_ =
             (float)local_2c0._4_4_ * fVar308 +
             fVar165 * auVar260._4_4_ + fVar224 * fVar164 + (float)local_3a0._4_4_ * fVar244;
        local_560._8_4_ =
             fStack_2b8 * fVar295 +
             fVar309 * auVar260._8_4_ + fVar169 * fVar166 + fStack_398 * fVar245;
        local_560._12_4_ =
             fStack_2b4 * fVar294 +
             fVar247 * auVar260._12_4_ + fVar279 * fVar168 + fStack_394 * fVar246;
        local_560._16_4_ =
             fStack_2b0 * fVar296 +
             fVar221 * auVar260._16_4_ + fVar280 * fVar193 + fStack_390 * fVar237;
        local_560._20_4_ =
             fStack_2ac * fVar297 +
             fVar167 * auVar260._20_4_ + fVar225 * fVar209 + fStack_38c * fVar248;
        local_560._24_4_ =
             fStack_2a8 * fVar208 +
             fVar249 * auVar260._24_4_ + fVar150 * fVar202 + fStack_388 * fVar250;
        local_560._28_4_ = fVar251 + fVar227;
        auVar235._0_4_ =
             fVar175 * fVar293 + auVar314._0_4_ * fVar149 + fVar170 * fVar238 + fVar194 * fVar277;
        auVar235._4_4_ =
             fVar190 * fVar308 + auVar314._4_4_ * fVar165 + fVar171 * fVar244 + fVar203 * fVar224;
        auVar235._8_4_ =
             fVar191 * fVar295 + auVar314._8_4_ * fVar309 + fVar172 * fVar245 + fVar205 * fVar169;
        auVar235._12_4_ =
             fVar192 * fVar294 + auVar314._12_4_ * fVar247 + fVar174 * fVar246 + fVar207 * fVar279;
        auVar235._16_4_ =
             fVar204 * fVar296 + auVar314._16_4_ * fVar221 + fVar222 * fVar237 + fVar274 * fVar280;
        auVar235._20_4_ =
             fVar219 * fVar297 + auVar314._20_4_ * fVar167 + fVar265 * fVar248 + fVar310 * fVar225;
        auVar235._24_4_ =
             fVar206 * fVar208 + auVar314._24_4_ * fVar249 + fVar271 * fVar250 + fVar311 * fVar150;
        auVar235._28_4_ = fVar227 + fVar217 + fVar272 + fVar217;
        auVar189._0_4_ =
             (float)local_80._0_4_ * fVar149 +
             fVar238 * (float)local_100._0_4_ + fVar277 * (float)local_e0._0_4_ +
             (float)local_a0._0_4_ * fVar293;
        auVar189._4_4_ =
             (float)local_80._4_4_ * fVar165 +
             fVar244 * (float)local_100._4_4_ + fVar224 * (float)local_e0._4_4_ +
             (float)local_a0._4_4_ * fVar308;
        auVar189._8_4_ =
             fStack_78 * fVar309 + fVar245 * fStack_f8 + fVar169 * fStack_d8 + fStack_98 * fVar295;
        auVar189._12_4_ =
             fStack_74 * fVar247 + fVar246 * fStack_f4 + fVar279 * fStack_d4 + fStack_94 * fVar294;
        auVar189._16_4_ =
             fStack_70 * fVar221 + fVar237 * fStack_f0 + fVar280 * fStack_d0 + fStack_90 * fVar296;
        auVar189._20_4_ =
             fStack_6c * fVar167 + fVar248 * fStack_ec + fVar225 * fStack_cc + fStack_8c * fVar297;
        auVar189._24_4_ =
             fStack_68 * fVar249 + fVar250 * fStack_e8 + fVar150 * fStack_c8 + fStack_88 * fVar208;
        auVar189._28_4_ = fVar217 + fVar251 + fVar227;
        auVar23 = vsubps_avx(local_560,_local_7a0);
        local_5a0 = auVar235;
        auVar22 = vsubps_avx(auVar235,local_520);
        fVar193 = auVar23._0_4_;
        fVar202 = auVar23._4_4_;
        auVar61._4_4_ = local_520._4_4_ * fVar202;
        auVar61._0_4_ = (float)local_520._0_4_ * fVar193;
        fVar204 = auVar23._8_4_;
        auVar61._8_4_ = local_520._8_4_ * fVar204;
        fVar206 = auVar23._12_4_;
        auVar61._12_4_ = local_520._12_4_ * fVar206;
        fVar265 = auVar23._16_4_;
        auVar61._16_4_ = local_520._16_4_ * fVar265;
        fVar272 = auVar23._20_4_;
        auVar61._20_4_ = local_520._20_4_ * fVar272;
        fVar310 = auVar23._24_4_;
        auVar61._24_4_ = local_520._24_4_ * fVar310;
        auVar61._28_4_ = fVar227;
        fVar209 = auVar22._0_4_;
        fVar217 = auVar22._4_4_;
        auVar62._4_4_ = (float)local_7a0._4_4_ * fVar217;
        auVar62._0_4_ = (float)local_7a0._0_4_ * fVar209;
        fVar219 = auVar22._8_4_;
        auVar62._8_4_ = fStack_798 * fVar219;
        fVar222 = auVar22._12_4_;
        auVar62._12_4_ = fStack_794 * fVar222;
        fVar271 = auVar22._16_4_;
        auVar62._16_4_ = fStack_790 * fVar271;
        fVar274 = auVar22._20_4_;
        auVar62._20_4_ = fStack_78c * fVar274;
        fVar311 = auVar22._24_4_;
        auVar62._24_4_ = fStack_788 * fVar311;
        auVar62._28_4_ = auVar235._28_4_;
        auVar30 = vsubps_avx(auVar61,auVar62);
        local_720 = auVar189;
        auVar201 = vmaxps_avx(_local_780,auVar189);
        auVar63._4_4_ = auVar201._4_4_ * auVar201._4_4_ * (fVar202 * fVar202 + fVar217 * fVar217);
        auVar63._0_4_ = auVar201._0_4_ * auVar201._0_4_ * (fVar193 * fVar193 + fVar209 * fVar209);
        auVar63._8_4_ = auVar201._8_4_ * auVar201._8_4_ * (fVar204 * fVar204 + fVar219 * fVar219);
        auVar63._12_4_ = auVar201._12_4_ * auVar201._12_4_ * (fVar206 * fVar206 + fVar222 * fVar222)
        ;
        auVar63._16_4_ = auVar201._16_4_ * auVar201._16_4_ * (fVar265 * fVar265 + fVar271 * fVar271)
        ;
        auVar63._20_4_ = auVar201._20_4_ * auVar201._20_4_ * (fVar272 * fVar272 + fVar274 * fVar274)
        ;
        auVar63._24_4_ = auVar201._24_4_ * auVar201._24_4_ * (fVar310 * fVar310 + fVar311 * fVar311)
        ;
        auVar63._28_4_ = local_560._28_4_ + auVar235._28_4_;
        auVar64._4_4_ = auVar30._4_4_ * auVar30._4_4_;
        auVar64._0_4_ = auVar30._0_4_ * auVar30._0_4_;
        auVar64._8_4_ = auVar30._8_4_ * auVar30._8_4_;
        auVar64._12_4_ = auVar30._12_4_ * auVar30._12_4_;
        auVar64._16_4_ = auVar30._16_4_ * auVar30._16_4_;
        auVar64._20_4_ = auVar30._20_4_ * auVar30._20_4_;
        auVar64._24_4_ = auVar30._24_4_ * auVar30._24_4_;
        auVar64._28_4_ = auVar30._28_4_;
        _local_4e0 = vcmpps_avx(auVar64,auVar63,2);
        local_200 = (uint)lVar122;
        auVar183 = vpshufd_avx(ZEXT416(local_200),0);
        auVar232 = vpor_avx(auVar183,_DAT_01f4ad30);
        auVar183 = vpor_avx(auVar183,_DAT_01f7afa0);
        auVar232 = vpcmpgtd_avx(_local_4c0,auVar232);
        auVar183 = vpcmpgtd_avx(_local_4c0,auVar183);
        register0x00001290 = auVar183;
        _local_2e0 = auVar232;
        auVar201 = _local_2e0 & _local_4e0;
        local_5a0._0_8_ = lVar117;
        local_720._0_8_ = prim;
        fVar175 = (float)local_660._0_4_;
        fVar190 = (float)local_660._4_4_;
        fVar191 = fStack_658;
        fVar192 = fStack_654;
        fVar204 = fStack_650;
        fVar219 = fStack_64c;
        fVar206 = fStack_648;
        fVar194 = (float)local_700._0_4_;
        fVar203 = (float)local_700._4_4_;
        fVar205 = fStack_6f8;
        fVar207 = fStack_6f4;
        fVar274 = fStack_6f0;
        fVar310 = fStack_6ec;
        fVar311 = fStack_6e8;
        if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar201 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar201 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar201 >> 0x7f,0) != '\0') ||
              (auVar201 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar201 >> 0xbf,0) != '\0') ||
            (auVar201 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar201[0x1f] < '\0') {
          local_4a0 = fVar293 * (float)local_120._0_4_ +
                      fVar149 * (float)local_c0._0_4_ +
                      fVar277 * (float)local_2a0._0_4_ + (float)local_540._0_4_ * fVar238;
          fStack_49c = fVar308 * (float)local_120._4_4_ +
                       fVar165 * (float)local_c0._4_4_ +
                       fVar224 * (float)local_2a0._4_4_ + (float)local_540._4_4_ * fVar244;
          fStack_498 = fVar295 * fStack_118 +
                       fVar309 * fStack_b8 + fVar169 * fStack_298 + fStack_538 * fVar245;
          fStack_494 = fVar294 * fStack_114 +
                       fVar247 * fStack_b4 + fVar279 * fStack_294 + fStack_534 * fVar246;
          fStack_490 = fVar296 * fStack_110 +
                       fVar221 * fStack_b0 + fVar280 * fStack_290 + fStack_530 * fVar237;
          fStack_48c = fVar297 * fStack_10c +
                       fVar167 * fStack_ac + fVar225 * fStack_28c + fStack_52c * fVar248;
          fStack_488 = fVar208 * fStack_108 +
                       fVar249 * fStack_a8 + fVar150 * fStack_288 + fStack_528 * fVar250;
          fStack_484 = *(float *)pauVar2[1] + fStack_764 + pfVar3[7] + 0.0;
          local_480._0_4_ = auVar111._0_4_;
          local_480._4_4_ = auVar111._4_4_;
          fStack_478 = auVar111._8_4_;
          fStack_474 = auVar111._12_4_;
          fStack_470 = auVar111._16_4_;
          fStack_46c = auVar111._20_4_;
          fStack_468 = auVar111._24_4_;
          local_3c0._0_4_ = auVar110._0_4_;
          local_3c0._4_4_ = auVar110._4_4_;
          fStack_3b8 = auVar110._8_4_;
          fStack_3b4 = auVar110._12_4_;
          fStack_3b0 = auVar110._16_4_;
          fStack_3ac = auVar110._20_4_;
          fStack_3a8 = auVar110._24_4_;
          fVar151 = (float)local_2a0._0_4_ * (float)local_3c0._0_4_;
          fVar164 = (float)local_2a0._4_4_ * (float)local_3c0._4_4_;
          fVar166 = fStack_298 * fStack_3b8;
          fVar168 = fStack_294 * fStack_3b4;
          fVar170 = fStack_290 * fStack_3b0;
          fVar171 = fStack_28c * fStack_3ac;
          fVar172 = fStack_288 * fStack_3a8;
          local_3e0._0_4_ = auVar109._0_4_;
          local_3e0._4_4_ = auVar109._4_4_;
          fStack_3d8 = auVar109._8_4_;
          fStack_3d4 = auVar109._12_4_;
          fStack_3d0 = auVar109._16_4_;
          fStack_3cc = auVar109._20_4_;
          fStack_3c8 = auVar109._24_4_;
          fVar238 = (float)local_540._0_4_ * (float)local_3e0._0_4_;
          fVar244 = (float)local_540._4_4_ * (float)local_3e0._4_4_;
          fVar245 = fStack_538 * fStack_3d8;
          fVar246 = fStack_534 * fStack_3d4;
          fVar237 = fStack_530 * fStack_3d0;
          fVar248 = fStack_52c * fStack_3cc;
          fVar250 = fStack_528 * fStack_3c8;
          pfVar8 = (float *)(lVar120 + 0x2201640 + lVar122 * 4);
          fVar193 = *pfVar8;
          fVar209 = pfVar8[1];
          fVar202 = pfVar8[2];
          fVar217 = pfVar8[3];
          fVar222 = pfVar8[4];
          fVar265 = pfVar8[5];
          fVar271 = pfVar8[6];
          pfVar9 = (float *)(lVar120 + 0x2201ac4 + lVar122 * 4);
          fVar272 = *pfVar9;
          fVar293 = pfVar9[1];
          fVar308 = pfVar9[2];
          fVar295 = pfVar9[3];
          fVar294 = pfVar9[4];
          fVar296 = pfVar9[5];
          fVar297 = pfVar9[6];
          fVar227 = pfVar6[7] + 0.0;
          pfVar10 = (float *)(lVar120 + 0x22011bc + lVar122 * 4);
          fVar208 = *pfVar10;
          fVar149 = pfVar10[1];
          fVar165 = pfVar10[2];
          fVar309 = pfVar10[3];
          fVar247 = pfVar10[4];
          fVar221 = pfVar10[5];
          fVar167 = pfVar10[6];
          fVar150 = pfVar8[7] + pfVar9[7];
          fVar174 = pfVar9[7] + fVar227;
          fVar227 = pfVar6[7] + pfVar7[7] + fVar227;
          pfVar6 = (float *)(lVar120 + 0x2200d38 + lVar122 * 4);
          fVar249 = *pfVar6;
          fVar277 = pfVar6[1];
          fVar224 = pfVar6[2];
          fVar169 = pfVar6[3];
          fVar279 = pfVar6[4];
          fVar280 = pfVar6[5];
          fVar225 = pfVar6[6];
          local_3c0._4_4_ =
               (float)local_2c0._4_4_ * fVar277 +
               fVar149 * (float)local_640._4_4_ +
               (float)local_600._4_4_ * fVar209 + (float)local_3a0._4_4_ * fVar293;
          local_3c0._0_4_ =
               (float)local_2c0._0_4_ * fVar249 +
               fVar208 * (float)local_640._0_4_ +
               (float)local_600._0_4_ * fVar193 + (float)local_3a0._0_4_ * fVar272;
          fStack_3b8 = fStack_2b8 * fVar224 +
                       fVar165 * fStack_638 + fStack_5f8 * fVar202 + fStack_398 * fVar308;
          fStack_3b4 = fStack_2b4 * fVar169 +
                       fVar309 * fStack_634 + fStack_5f4 * fVar217 + fStack_394 * fVar295;
          fStack_3b0 = fStack_2b0 * fVar279 +
                       fVar247 * fStack_630 + fStack_5f0 * fVar222 + fStack_390 * fVar294;
          fStack_3ac = fStack_2ac * fVar280 +
                       fVar221 * fStack_62c + fStack_5ec * fVar265 + fStack_38c * fVar296;
          fStack_3a8 = fStack_2a8 * fVar225 +
                       fVar167 * fStack_628 + fStack_5e8 * fVar271 + fStack_388 * fVar297;
          fStack_3a4 = fVar150 + fVar174;
          local_3e0._4_4_ =
               fVar277 * (float)local_660._4_4_ +
               (float)local_700._4_4_ * fVar209 + (float)local_500._4_4_ * fVar293 +
               fVar149 * (float)local_620._4_4_;
          local_3e0._0_4_ =
               fVar249 * (float)local_660._0_4_ +
               (float)local_700._0_4_ * fVar193 + (float)local_500._0_4_ * fVar272 +
               fVar208 * (float)local_620._0_4_;
          fStack_3d8 = fVar224 * fStack_658 +
                       fStack_6f8 * fVar202 + fStack_4f8 * fVar308 + fVar165 * fStack_618;
          fStack_3d4 = fVar169 * fStack_654 +
                       fStack_6f4 * fVar217 + fStack_4f4 * fVar295 + fVar309 * fStack_614;
          fStack_3d0 = fVar279 * fStack_650 +
                       fStack_6f0 * fVar222 + fStack_4f0 * fVar294 + fVar247 * fStack_610;
          fStack_3cc = fVar280 * fStack_64c +
                       fStack_6ec * fVar265 + fStack_4ec * fVar296 + fVar221 * fStack_60c;
          fStack_3c8 = fVar225 * fStack_648 +
                       fStack_6e8 * fVar271 + fStack_4e8 * fVar297 + fVar167 * fStack_608;
          fStack_3c4 = fVar174 + fVar227;
          auVar306._0_4_ =
               fVar208 * (float)local_c0._0_4_ +
               (float)local_2a0._0_4_ * fVar193 + (float)local_540._0_4_ * fVar272 +
               fVar249 * (float)local_120._0_4_;
          auVar306._4_4_ =
               fVar149 * (float)local_c0._4_4_ +
               (float)local_2a0._4_4_ * fVar209 + (float)local_540._4_4_ * fVar293 +
               fVar277 * (float)local_120._4_4_;
          auVar306._8_4_ =
               fVar165 * fStack_b8 + fStack_298 * fVar202 + fStack_538 * fVar308 +
               fVar224 * fStack_118;
          auVar306._12_4_ =
               fVar309 * fStack_b4 + fStack_294 * fVar217 + fStack_534 * fVar295 +
               fVar169 * fStack_114;
          auVar306._16_4_ =
               fVar247 * fStack_b0 + fStack_290 * fVar222 + fStack_530 * fVar294 +
               fVar279 * fStack_110;
          auVar306._20_4_ =
               fVar221 * fStack_ac + fStack_28c * fVar265 + fStack_52c * fVar296 +
               fVar280 * fStack_10c;
          auVar306._24_4_ =
               fVar167 * fStack_a8 + fStack_288 * fVar271 + fStack_528 * fVar297 +
               fVar225 * fStack_108;
          auVar306._28_4_ = pfVar10[7] + fVar150 + fVar227;
          pfVar6 = (float *)(lVar120 + 0x2203a60 + lVar122 * 4);
          fVar193 = *pfVar6;
          fVar209 = pfVar6[1];
          fVar202 = pfVar6[2];
          fVar217 = pfVar6[3];
          fVar222 = pfVar6[4];
          fVar265 = pfVar6[5];
          fVar271 = pfVar6[6];
          pfVar7 = (float *)(lVar120 + 0x2203ee4 + lVar122 * 4);
          fVar272 = *pfVar7;
          fVar293 = pfVar7[1];
          fVar308 = pfVar7[2];
          fVar295 = pfVar7[3];
          fVar294 = pfVar7[4];
          fVar296 = pfVar7[5];
          fVar297 = pfVar7[6];
          pfVar8 = (float *)(lVar120 + 0x22035dc + lVar122 * 4);
          fVar208 = *pfVar8;
          fVar149 = pfVar8[1];
          fVar165 = pfVar8[2];
          fVar309 = pfVar8[3];
          fVar247 = pfVar8[4];
          fVar221 = pfVar8[5];
          fVar167 = pfVar8[6];
          pfVar9 = (float *)(lVar120 + 0x2203158 + lVar122 * 4);
          fVar249 = *pfVar9;
          fVar277 = pfVar9[1];
          fVar224 = pfVar9[2];
          fVar169 = pfVar9[3];
          fVar279 = pfVar9[4];
          fVar280 = pfVar9[5];
          fVar225 = pfVar9[6];
          auVar283._0_4_ =
               (float)local_2c0._0_4_ * fVar249 +
               fVar208 * (float)local_640._0_4_ +
               (float)local_600._0_4_ * fVar193 + (float)local_3a0._0_4_ * fVar272;
          auVar283._4_4_ =
               (float)local_2c0._4_4_ * fVar277 +
               fVar149 * (float)local_640._4_4_ +
               (float)local_600._4_4_ * fVar209 + (float)local_3a0._4_4_ * fVar293;
          auVar283._8_4_ =
               fStack_2b8 * fVar224 +
               fVar165 * fStack_638 + fStack_5f8 * fVar202 + fStack_398 * fVar308;
          auVar283._12_4_ =
               fStack_2b4 * fVar169 +
               fVar309 * fStack_634 + fStack_5f4 * fVar217 + fStack_394 * fVar295;
          auVar283._16_4_ =
               fStack_2b0 * fVar279 +
               fVar247 * fStack_630 + fStack_5f0 * fVar222 + fStack_390 * fVar294;
          auVar283._20_4_ =
               fStack_2ac * fVar280 +
               fVar221 * fStack_62c + fStack_5ec * fVar265 + fStack_38c * fVar296;
          auVar283._24_4_ =
               fStack_2a8 * fVar225 +
               fVar167 * fStack_628 + fStack_5e8 * fVar271 + fStack_388 * fVar297;
          auVar283._28_4_ = fStack_384 + fStack_384 + fStack_5e4 + fStack_384;
          auVar301._0_4_ =
               fVar249 * (float)local_660._0_4_ +
               fVar208 * (float)local_620._0_4_ +
               (float)local_700._0_4_ * fVar193 + (float)local_500._0_4_ * fVar272;
          auVar301._4_4_ =
               fVar277 * (float)local_660._4_4_ +
               fVar149 * (float)local_620._4_4_ +
               (float)local_700._4_4_ * fVar209 + (float)local_500._4_4_ * fVar293;
          auVar301._8_4_ =
               fVar224 * fStack_658 +
               fVar165 * fStack_618 + fStack_6f8 * fVar202 + fStack_4f8 * fVar308;
          auVar301._12_4_ =
               fVar169 * fStack_654 +
               fVar309 * fStack_614 + fStack_6f4 * fVar217 + fStack_4f4 * fVar295;
          auVar301._16_4_ =
               fVar279 * fStack_650 +
               fVar247 * fStack_610 + fStack_6f0 * fVar222 + fStack_4f0 * fVar294;
          auVar301._20_4_ =
               fVar280 * fStack_64c +
               fVar221 * fStack_60c + fStack_6ec * fVar265 + fStack_4ec * fVar296;
          auVar301._24_4_ =
               fVar225 * fStack_648 +
               fVar167 * fStack_608 + fStack_6e8 * fVar271 + fStack_4e8 * fVar297;
          auVar301._28_4_ = fStack_384 + fStack_384 + fStack_4e4 + fStack_384;
          auVar236._8_4_ = 0x7fffffff;
          auVar236._0_8_ = 0x7fffffff7fffffff;
          auVar236._12_4_ = 0x7fffffff;
          auVar236._16_4_ = 0x7fffffff;
          auVar236._20_4_ = 0x7fffffff;
          auVar236._24_4_ = 0x7fffffff;
          auVar236._28_4_ = 0x7fffffff;
          auVar201 = vandps_avx(_local_3c0,auVar236);
          auVar30 = vandps_avx(_local_3e0,auVar236);
          auVar30 = vmaxps_avx(auVar201,auVar30);
          auVar201 = vandps_avx(auVar306,auVar236);
          auVar30 = vmaxps_avx(auVar30,auVar201);
          auVar30 = vcmpps_avx(auVar30,_local_400,1);
          auVar323 = vblendvps_avx(_local_3c0,auVar23,auVar30);
          auVar136._0_4_ =
               fVar249 * (float)local_120._0_4_ +
               fVar208 * (float)local_c0._0_4_ +
               fVar272 * (float)local_540._0_4_ + (float)local_2a0._0_4_ * fVar193;
          auVar136._4_4_ =
               fVar277 * (float)local_120._4_4_ +
               fVar149 * (float)local_c0._4_4_ +
               fVar293 * (float)local_540._4_4_ + (float)local_2a0._4_4_ * fVar209;
          auVar136._8_4_ =
               fVar224 * fStack_118 +
               fVar165 * fStack_b8 + fVar308 * fStack_538 + fStack_298 * fVar202;
          auVar136._12_4_ =
               fVar169 * fStack_114 +
               fVar309 * fStack_b4 + fVar295 * fStack_534 + fStack_294 * fVar217;
          auVar136._16_4_ =
               fVar279 * fStack_110 +
               fVar247 * fStack_b0 + fVar294 * fStack_530 + fStack_290 * fVar222;
          auVar136._20_4_ =
               fVar280 * fStack_10c +
               fVar221 * fStack_ac + fVar296 * fStack_52c + fStack_28c * fVar265;
          auVar136._24_4_ =
               fVar225 * fStack_108 +
               fVar167 * fStack_a8 + fVar297 * fStack_528 + fStack_288 * fVar271;
          auVar136._28_4_ = auVar201._28_4_ + pfVar8[7] + pfVar7[7] + pfVar6[7];
          auVar140 = vblendvps_avx(_local_3e0,auVar22,auVar30);
          auVar201 = vandps_avx(auVar283,auVar236);
          auVar30 = vandps_avx(auVar301,auVar236);
          auVar233 = vmaxps_avx(auVar201,auVar30);
          auVar201 = vandps_avx(auVar136,auVar236);
          auVar201 = vmaxps_avx(auVar233,auVar201);
          local_580._0_4_ = auVar112._0_4_;
          local_580._4_4_ = auVar112._4_4_;
          fStack_578 = auVar112._8_4_;
          fStack_574 = auVar112._12_4_;
          fStack_570 = auVar112._16_4_;
          fStack_56c = auVar112._20_4_;
          fStack_568 = auVar112._24_4_;
          auVar30 = vcmpps_avx(auVar201,_local_400,1);
          auVar201 = vblendvps_avx(auVar283,auVar23,auVar30);
          auVar137._0_4_ =
               (float)local_120._0_4_ * (float)local_580._0_4_ +
               (float)local_c0._0_4_ * (float)local_480._0_4_ + fVar151 + fVar238;
          auVar137._4_4_ =
               (float)local_120._4_4_ * (float)local_580._4_4_ +
               (float)local_c0._4_4_ * (float)local_480._4_4_ + fVar164 + fVar244;
          auVar137._8_4_ = fStack_118 * fStack_578 + fStack_b8 * fStack_478 + fVar166 + fVar245;
          auVar137._12_4_ = fStack_114 * fStack_574 + fStack_b4 * fStack_474 + fVar168 + fVar246;
          auVar137._16_4_ = fStack_110 * fStack_570 + fStack_b0 * fStack_470 + fVar170 + fVar237;
          auVar137._20_4_ = fStack_10c * fStack_56c + fStack_ac * fStack_46c + fVar171 + fVar248;
          auVar137._24_4_ = fStack_108 * fStack_568 + fStack_a8 * fStack_468 + fVar172 + fVar250;
          auVar137._28_4_ = auVar233._28_4_ + fStack_484 + pfVar3[7] + 0.0;
          auVar23 = vblendvps_avx(auVar301,auVar22,auVar30);
          fVar172 = auVar323._0_4_;
          fVar174 = auVar323._4_4_;
          fVar238 = auVar323._8_4_;
          fVar244 = auVar323._12_4_;
          fVar245 = auVar323._16_4_;
          fVar246 = auVar323._20_4_;
          fVar237 = auVar323._24_4_;
          fVar248 = auVar323._28_4_;
          fVar208 = auVar201._0_4_;
          fVar165 = auVar201._4_4_;
          fVar247 = auVar201._8_4_;
          fVar167 = auVar201._12_4_;
          fVar277 = auVar201._16_4_;
          fVar169 = auVar201._20_4_;
          fVar280 = auVar201._24_4_;
          fVar193 = auVar140._0_4_;
          fVar202 = auVar140._4_4_;
          fVar222 = auVar140._8_4_;
          fVar271 = auVar140._12_4_;
          fVar293 = auVar140._16_4_;
          fVar295 = auVar140._20_4_;
          fVar296 = auVar140._24_4_;
          auVar289._0_4_ = fVar193 * fVar193 + fVar172 * fVar172;
          auVar289._4_4_ = fVar202 * fVar202 + fVar174 * fVar174;
          auVar289._8_4_ = fVar222 * fVar222 + fVar238 * fVar238;
          auVar289._12_4_ = fVar271 * fVar271 + fVar244 * fVar244;
          auVar289._16_4_ = fVar293 * fVar293 + fVar245 * fVar245;
          auVar289._20_4_ = fVar295 * fVar295 + fVar246 * fVar246;
          auVar289._24_4_ = fVar296 * fVar296 + fVar237 * fVar237;
          auVar289._28_4_ = fStack_2a4 + auVar22._28_4_;
          auVar22 = vrsqrtps_avx(auVar289);
          fVar209 = auVar22._0_4_;
          fVar217 = auVar22._4_4_;
          auVar65._4_4_ = fVar217 * 1.5;
          auVar65._0_4_ = fVar209 * 1.5;
          fVar265 = auVar22._8_4_;
          auVar65._8_4_ = fVar265 * 1.5;
          fVar272 = auVar22._12_4_;
          auVar65._12_4_ = fVar272 * 1.5;
          fVar308 = auVar22._16_4_;
          auVar65._16_4_ = fVar308 * 1.5;
          fVar294 = auVar22._20_4_;
          auVar65._20_4_ = fVar294 * 1.5;
          fVar297 = auVar22._24_4_;
          auVar65._24_4_ = fVar297 * 1.5;
          auVar65._28_4_ = auVar301._28_4_;
          auVar66._4_4_ = fVar217 * fVar217 * fVar217 * auVar289._4_4_ * 0.5;
          auVar66._0_4_ = fVar209 * fVar209 * fVar209 * auVar289._0_4_ * 0.5;
          auVar66._8_4_ = fVar265 * fVar265 * fVar265 * auVar289._8_4_ * 0.5;
          auVar66._12_4_ = fVar272 * fVar272 * fVar272 * auVar289._12_4_ * 0.5;
          auVar66._16_4_ = fVar308 * fVar308 * fVar308 * auVar289._16_4_ * 0.5;
          auVar66._20_4_ = fVar294 * fVar294 * fVar294 * auVar289._20_4_ * 0.5;
          auVar66._24_4_ = fVar297 * fVar297 * fVar297 * auVar289._24_4_ * 0.5;
          auVar66._28_4_ = auVar289._28_4_;
          auVar30 = vsubps_avx(auVar65,auVar66);
          fVar150 = auVar30._0_4_;
          fVar151 = auVar30._4_4_;
          fVar164 = auVar30._8_4_;
          fVar166 = auVar30._12_4_;
          fVar168 = auVar30._16_4_;
          fVar170 = auVar30._20_4_;
          fVar171 = auVar30._24_4_;
          fVar209 = auVar23._0_4_;
          fVar217 = auVar23._4_4_;
          fVar265 = auVar23._8_4_;
          fVar272 = auVar23._12_4_;
          fVar308 = auVar23._16_4_;
          fVar294 = auVar23._20_4_;
          fVar297 = auVar23._24_4_;
          auVar268._0_4_ = fVar209 * fVar209 + fVar208 * fVar208;
          auVar268._4_4_ = fVar217 * fVar217 + fVar165 * fVar165;
          auVar268._8_4_ = fVar265 * fVar265 + fVar247 * fVar247;
          auVar268._12_4_ = fVar272 * fVar272 + fVar167 * fVar167;
          auVar268._16_4_ = fVar308 * fVar308 + fVar277 * fVar277;
          auVar268._20_4_ = fVar294 * fVar294 + fVar169 * fVar169;
          auVar268._24_4_ = fVar297 * fVar297 + fVar280 * fVar280;
          auVar268._28_4_ = auVar22._28_4_ + auVar201._28_4_;
          auVar201 = vrsqrtps_avx(auVar268);
          fVar149 = auVar201._0_4_;
          fVar309 = auVar201._4_4_;
          auVar67._4_4_ = fVar309 * 1.5;
          auVar67._0_4_ = fVar149 * 1.5;
          fVar221 = auVar201._8_4_;
          auVar67._8_4_ = fVar221 * 1.5;
          fVar249 = auVar201._12_4_;
          auVar67._12_4_ = fVar249 * 1.5;
          fVar224 = auVar201._16_4_;
          auVar67._16_4_ = fVar224 * 1.5;
          fVar279 = auVar201._20_4_;
          auVar67._20_4_ = fVar279 * 1.5;
          fVar225 = auVar201._24_4_;
          auVar67._24_4_ = fVar225 * 1.5;
          auVar67._28_4_ = auVar301._28_4_;
          auVar68._4_4_ = fVar309 * fVar309 * fVar309 * auVar268._4_4_ * 0.5;
          auVar68._0_4_ = fVar149 * fVar149 * fVar149 * auVar268._0_4_ * 0.5;
          auVar68._8_4_ = fVar221 * fVar221 * fVar221 * auVar268._8_4_ * 0.5;
          auVar68._12_4_ = fVar249 * fVar249 * fVar249 * auVar268._12_4_ * 0.5;
          auVar68._16_4_ = fVar224 * fVar224 * fVar224 * auVar268._16_4_ * 0.5;
          auVar68._20_4_ = fVar279 * fVar279 * fVar279 * auVar268._20_4_ * 0.5;
          auVar68._24_4_ = fVar225 * fVar225 * fVar225 * auVar268._24_4_ * 0.5;
          auVar68._28_4_ = auVar268._28_4_;
          auVar23 = vsubps_avx(auVar67,auVar68);
          fVar149 = auVar23._0_4_;
          fVar309 = auVar23._4_4_;
          fVar221 = auVar23._8_4_;
          fVar249 = auVar23._12_4_;
          fVar224 = auVar23._16_4_;
          fVar279 = auVar23._20_4_;
          fVar225 = auVar23._24_4_;
          fVar193 = (float)local_780._0_4_ * fVar150 * fVar193;
          fVar202 = (float)local_780._4_4_ * fVar151 * fVar202;
          auVar69._4_4_ = fVar202;
          auVar69._0_4_ = fVar193;
          fVar222 = fStack_778 * fVar164 * fVar222;
          auVar69._8_4_ = fVar222;
          fVar271 = fStack_774 * fVar166 * fVar271;
          auVar69._12_4_ = fVar271;
          fVar293 = fStack_770 * fVar168 * fVar293;
          auVar69._16_4_ = fVar293;
          fVar295 = fStack_76c * fVar170 * fVar295;
          auVar69._20_4_ = fVar295;
          fVar296 = fStack_768 * fVar171 * fVar296;
          auVar69._24_4_ = fVar296;
          auVar69._28_4_ = auVar201._28_4_;
          local_580._4_4_ = fVar202 + (float)local_7a0._4_4_;
          local_580._0_4_ = fVar193 + (float)local_7a0._0_4_;
          fStack_578 = fVar222 + fStack_798;
          fStack_574 = fVar271 + fStack_794;
          fStack_570 = fVar293 + fStack_790;
          fStack_56c = fVar295 + fStack_78c;
          fStack_568 = fVar296 + fStack_788;
          fStack_564 = auVar201._28_4_ + fStack_784;
          fVar193 = (float)local_780._0_4_ * fVar150 * -fVar172;
          fVar202 = (float)local_780._4_4_ * fVar151 * -fVar174;
          auVar70._4_4_ = fVar202;
          auVar70._0_4_ = fVar193;
          fVar222 = fStack_778 * fVar164 * -fVar238;
          auVar70._8_4_ = fVar222;
          fVar271 = fStack_774 * fVar166 * -fVar244;
          auVar70._12_4_ = fVar271;
          fVar293 = fStack_770 * fVar168 * -fVar245;
          auVar70._16_4_ = fVar293;
          fVar295 = fStack_76c * fVar170 * -fVar246;
          auVar70._20_4_ = fVar295;
          fVar296 = fStack_768 * fVar171 * -fVar237;
          auVar70._24_4_ = fVar296;
          auVar70._28_4_ = -fVar248;
          local_480._4_4_ = local_520._4_4_ + fVar202;
          local_480._0_4_ = (float)local_520._0_4_ + fVar193;
          fStack_478 = local_520._8_4_ + fVar222;
          fStack_474 = local_520._12_4_ + fVar271;
          fStack_470 = local_520._16_4_ + fVar293;
          fStack_46c = local_520._20_4_ + fVar295;
          fStack_468 = local_520._24_4_ + fVar296;
          fStack_464 = local_520._28_4_ + -fVar248;
          fVar193 = fVar150 * 0.0 * (float)local_780._0_4_;
          fVar202 = fVar151 * 0.0 * (float)local_780._4_4_;
          auVar71._4_4_ = fVar202;
          auVar71._0_4_ = fVar193;
          fVar222 = fVar164 * 0.0 * fStack_778;
          auVar71._8_4_ = fVar222;
          fVar271 = fVar166 * 0.0 * fStack_774;
          auVar71._12_4_ = fVar271;
          fVar293 = fVar168 * 0.0 * fStack_770;
          auVar71._16_4_ = fVar293;
          fVar295 = fVar170 * 0.0 * fStack_76c;
          auVar71._20_4_ = fVar295;
          fVar296 = fVar171 * 0.0 * fStack_768;
          auVar71._24_4_ = fVar296;
          auVar71._28_4_ = fVar248;
          auVar233 = vsubps_avx(_local_7a0,auVar69);
          auVar322._0_4_ = fVar193 + auVar137._0_4_;
          auVar322._4_4_ = fVar202 + auVar137._4_4_;
          auVar322._8_4_ = fVar222 + auVar137._8_4_;
          auVar322._12_4_ = fVar271 + auVar137._12_4_;
          auVar322._16_4_ = fVar293 + auVar137._16_4_;
          auVar322._20_4_ = fVar295 + auVar137._20_4_;
          auVar322._24_4_ = fVar296 + auVar137._24_4_;
          auVar322._28_4_ = fVar248 + auVar137._28_4_;
          fVar193 = auVar189._0_4_ * fVar149 * fVar209;
          fVar209 = auVar189._4_4_ * fVar309 * fVar217;
          auVar72._4_4_ = fVar209;
          auVar72._0_4_ = fVar193;
          fVar202 = auVar189._8_4_ * fVar221 * fVar265;
          auVar72._8_4_ = fVar202;
          fVar217 = auVar189._12_4_ * fVar249 * fVar272;
          auVar72._12_4_ = fVar217;
          fVar222 = auVar189._16_4_ * fVar224 * fVar308;
          auVar72._16_4_ = fVar222;
          fVar265 = auVar189._20_4_ * fVar279 * fVar294;
          auVar72._20_4_ = fVar265;
          fVar271 = auVar189._24_4_ * fVar225 * fVar297;
          auVar72._24_4_ = fVar271;
          auVar72._28_4_ = fStack_784;
          auVar25 = vsubps_avx(local_520,auVar70);
          auVar307._0_4_ = (float)local_560._0_4_ + fVar193;
          auVar307._4_4_ = local_560._4_4_ + fVar209;
          auVar307._8_4_ = local_560._8_4_ + fVar202;
          auVar307._12_4_ = local_560._12_4_ + fVar217;
          auVar307._16_4_ = local_560._16_4_ + fVar222;
          auVar307._20_4_ = local_560._20_4_ + fVar265;
          auVar307._24_4_ = local_560._24_4_ + fVar271;
          auVar307._28_4_ = local_560._28_4_ + fStack_784;
          fVar193 = fVar149 * -fVar208 * auVar189._0_4_;
          fVar209 = fVar309 * -fVar165 * auVar189._4_4_;
          auVar73._4_4_ = fVar209;
          auVar73._0_4_ = fVar193;
          fVar202 = fVar221 * -fVar247 * auVar189._8_4_;
          auVar73._8_4_ = fVar202;
          fVar217 = fVar249 * -fVar167 * auVar189._12_4_;
          auVar73._12_4_ = fVar217;
          fVar222 = fVar224 * -fVar277 * auVar189._16_4_;
          auVar73._16_4_ = fVar222;
          fVar265 = fVar279 * -fVar169 * auVar189._20_4_;
          auVar73._20_4_ = fVar265;
          fVar271 = fVar225 * -fVar280 * auVar189._24_4_;
          auVar73._24_4_ = fVar271;
          auVar73._28_4_ = fStack_764;
          auVar26 = vsubps_avx(auVar137,auVar71);
          auVar216._0_4_ = auVar235._0_4_ + fVar193;
          auVar216._4_4_ = auVar235._4_4_ + fVar209;
          auVar216._8_4_ = auVar235._8_4_ + fVar202;
          auVar216._12_4_ = auVar235._12_4_ + fVar217;
          auVar216._16_4_ = auVar235._16_4_ + fVar222;
          auVar216._20_4_ = auVar235._20_4_ + fVar265;
          auVar216._24_4_ = auVar235._24_4_ + fVar271;
          auVar216._28_4_ = auVar235._28_4_ + fStack_764;
          fVar193 = fVar149 * 0.0 * auVar189._0_4_;
          fVar209 = fVar309 * 0.0 * auVar189._4_4_;
          auVar74._4_4_ = fVar209;
          auVar74._0_4_ = fVar193;
          fVar202 = fVar221 * 0.0 * auVar189._8_4_;
          auVar74._8_4_ = fVar202;
          fVar217 = fVar249 * 0.0 * auVar189._12_4_;
          auVar74._12_4_ = fVar217;
          fVar222 = fVar224 * 0.0 * auVar189._16_4_;
          auVar74._16_4_ = fVar222;
          fVar265 = fVar279 * 0.0 * auVar189._20_4_;
          auVar74._20_4_ = fVar265;
          fVar271 = fVar225 * 0.0 * auVar189._24_4_;
          auVar74._24_4_ = fVar271;
          auVar74._28_4_ = auVar137._28_4_;
          auVar201 = vsubps_avx(local_560,auVar72);
          auVar107._4_4_ = fStack_49c;
          auVar107._0_4_ = local_4a0;
          auVar107._8_4_ = fStack_498;
          auVar107._12_4_ = fStack_494;
          auVar107._16_4_ = fStack_490;
          auVar107._20_4_ = fStack_48c;
          auVar107._24_4_ = fStack_488;
          auVar107._28_4_ = fStack_484;
          auVar284._0_4_ = local_4a0 + fVar193;
          auVar284._4_4_ = fStack_49c + fVar209;
          auVar284._8_4_ = fStack_498 + fVar202;
          auVar284._12_4_ = fStack_494 + fVar217;
          auVar284._16_4_ = fStack_490 + fVar222;
          auVar284._20_4_ = fStack_48c + fVar265;
          auVar284._24_4_ = fStack_488 + fVar271;
          auVar284._28_4_ = fStack_484 + auVar137._28_4_;
          auVar22 = vsubps_avx(auVar235,auVar73);
          auVar30 = vsubps_avx(auVar107,auVar74);
          auVar323 = vsubps_avx(auVar216,auVar25);
          auVar140 = vsubps_avx(auVar284,auVar26);
          auVar75._4_4_ = auVar26._4_4_ * auVar323._4_4_;
          auVar75._0_4_ = auVar26._0_4_ * auVar323._0_4_;
          auVar75._8_4_ = auVar26._8_4_ * auVar323._8_4_;
          auVar75._12_4_ = auVar26._12_4_ * auVar323._12_4_;
          auVar75._16_4_ = auVar26._16_4_ * auVar323._16_4_;
          auVar75._20_4_ = auVar26._20_4_ * auVar323._20_4_;
          auVar75._24_4_ = auVar26._24_4_ * auVar323._24_4_;
          auVar75._28_4_ = auVar301._28_4_;
          auVar76._4_4_ = auVar25._4_4_ * auVar140._4_4_;
          auVar76._0_4_ = auVar25._0_4_ * auVar140._0_4_;
          auVar76._8_4_ = auVar25._8_4_ * auVar140._8_4_;
          auVar76._12_4_ = auVar25._12_4_ * auVar140._12_4_;
          auVar76._16_4_ = auVar25._16_4_ * auVar140._16_4_;
          auVar76._20_4_ = auVar25._20_4_ * auVar140._20_4_;
          auVar76._24_4_ = auVar25._24_4_ * auVar140._24_4_;
          auVar76._28_4_ = fStack_484;
          auVar257 = vsubps_avx(auVar76,auVar75);
          auVar77._4_4_ = auVar233._4_4_ * auVar140._4_4_;
          auVar77._0_4_ = auVar233._0_4_ * auVar140._0_4_;
          auVar77._8_4_ = auVar233._8_4_ * auVar140._8_4_;
          auVar77._12_4_ = auVar233._12_4_ * auVar140._12_4_;
          auVar77._16_4_ = auVar233._16_4_ * auVar140._16_4_;
          auVar77._20_4_ = auVar233._20_4_ * auVar140._20_4_;
          auVar77._24_4_ = auVar233._24_4_ * auVar140._24_4_;
          auVar77._28_4_ = auVar140._28_4_;
          auVar140 = vsubps_avx(auVar307,auVar233);
          auVar78._4_4_ = auVar26._4_4_ * auVar140._4_4_;
          auVar78._0_4_ = auVar26._0_4_ * auVar140._0_4_;
          auVar78._8_4_ = auVar26._8_4_ * auVar140._8_4_;
          auVar78._12_4_ = auVar26._12_4_ * auVar140._12_4_;
          auVar78._16_4_ = auVar26._16_4_ * auVar140._16_4_;
          auVar78._20_4_ = auVar26._20_4_ * auVar140._20_4_;
          auVar78._24_4_ = auVar26._24_4_ * auVar140._24_4_;
          auVar78._28_4_ = auVar23._28_4_;
          auVar305 = vsubps_avx(auVar78,auVar77);
          auVar79._4_4_ = auVar25._4_4_ * auVar140._4_4_;
          auVar79._0_4_ = auVar25._0_4_ * auVar140._0_4_;
          auVar79._8_4_ = auVar25._8_4_ * auVar140._8_4_;
          auVar79._12_4_ = auVar25._12_4_ * auVar140._12_4_;
          auVar79._16_4_ = auVar25._16_4_ * auVar140._16_4_;
          auVar79._20_4_ = auVar25._20_4_ * auVar140._20_4_;
          auVar79._24_4_ = auVar25._24_4_ * auVar140._24_4_;
          auVar79._28_4_ = auVar23._28_4_;
          auVar80._4_4_ = auVar233._4_4_ * auVar323._4_4_;
          auVar80._0_4_ = auVar233._0_4_ * auVar323._0_4_;
          auVar80._8_4_ = auVar233._8_4_ * auVar323._8_4_;
          auVar80._12_4_ = auVar233._12_4_ * auVar323._12_4_;
          auVar80._16_4_ = auVar233._16_4_ * auVar323._16_4_;
          auVar80._20_4_ = auVar233._20_4_ * auVar323._20_4_;
          auVar80._24_4_ = auVar233._24_4_ * auVar323._24_4_;
          auVar80._28_4_ = auVar323._28_4_;
          auVar23 = vsubps_avx(auVar80,auVar79);
          auVar159._0_4_ = auVar257._0_4_ * 0.0 + auVar23._0_4_ + auVar305._0_4_ * 0.0;
          auVar159._4_4_ = auVar257._4_4_ * 0.0 + auVar23._4_4_ + auVar305._4_4_ * 0.0;
          auVar159._8_4_ = auVar257._8_4_ * 0.0 + auVar23._8_4_ + auVar305._8_4_ * 0.0;
          auVar159._12_4_ = auVar257._12_4_ * 0.0 + auVar23._12_4_ + auVar305._12_4_ * 0.0;
          auVar159._16_4_ = auVar257._16_4_ * 0.0 + auVar23._16_4_ + auVar305._16_4_ * 0.0;
          auVar159._20_4_ = auVar257._20_4_ * 0.0 + auVar23._20_4_ + auVar305._20_4_ * 0.0;
          auVar159._24_4_ = auVar257._24_4_ * 0.0 + auVar23._24_4_ + auVar305._24_4_ * 0.0;
          auVar159._28_4_ = auVar257._28_4_ + auVar23._28_4_ + auVar305._28_4_;
          auVar19 = vcmpps_avx(auVar159,ZEXT832(0) << 0x20,2);
          auVar201 = vblendvps_avx(auVar201,_local_580,auVar19);
          auVar23 = vblendvps_avx(auVar22,_local_480,auVar19);
          auVar22 = vblendvps_avx(auVar30,auVar322,auVar19);
          auVar30 = vblendvps_avx(auVar233,auVar307,auVar19);
          auVar323 = vblendvps_avx(auVar25,auVar216,auVar19);
          auVar140 = vblendvps_avx(auVar26,auVar284,auVar19);
          auVar233 = vblendvps_avx(auVar307,auVar233,auVar19);
          auVar257 = vblendvps_avx(auVar216,auVar25,auVar19);
          auVar305 = vblendvps_avx(auVar284,auVar26,auVar19);
          _local_7a0 = vandps_avx(_local_2e0,_local_4e0);
          auVar233 = vsubps_avx(auVar233,auVar201);
          auVar27 = vsubps_avx(auVar257,auVar23);
          auVar305 = vsubps_avx(auVar305,auVar22);
          auVar28 = vsubps_avx(auVar23,auVar323);
          fVar193 = auVar27._0_4_;
          fVar146 = auVar22._0_4_;
          fVar272 = auVar27._4_4_;
          fVar147 = auVar22._4_4_;
          auVar81._4_4_ = fVar147 * fVar272;
          auVar81._0_4_ = fVar146 * fVar193;
          fVar208 = auVar27._8_4_;
          fVar148 = auVar22._8_4_;
          auVar81._8_4_ = fVar148 * fVar208;
          fVar249 = auVar27._12_4_;
          fVar123 = auVar22._12_4_;
          auVar81._12_4_ = fVar123 * fVar249;
          fVar150 = auVar27._16_4_;
          fVar210 = auVar22._16_4_;
          auVar81._16_4_ = fVar210 * fVar150;
          fVar172 = auVar27._20_4_;
          fVar218 = auVar22._20_4_;
          auVar81._20_4_ = fVar218 * fVar172;
          fVar248 = auVar27._24_4_;
          fVar220 = auVar22._24_4_;
          auVar81._24_4_ = fVar220 * fVar248;
          auVar81._28_4_ = auVar257._28_4_;
          fVar209 = auVar23._0_4_;
          fVar223 = auVar305._0_4_;
          fVar293 = auVar23._4_4_;
          fVar141 = auVar305._4_4_;
          auVar82._4_4_ = fVar141 * fVar293;
          auVar82._0_4_ = fVar223 * fVar209;
          fVar149 = auVar23._8_4_;
          fVar143 = auVar305._8_4_;
          auVar82._8_4_ = fVar143 * fVar149;
          fVar277 = auVar23._12_4_;
          fVar145 = auVar305._12_4_;
          auVar82._12_4_ = fVar145 * fVar277;
          fVar151 = auVar23._16_4_;
          fVar273 = auVar305._16_4_;
          auVar82._16_4_ = fVar273 * fVar151;
          fVar174 = auVar23._20_4_;
          fVar275 = auVar305._20_4_;
          auVar82._20_4_ = fVar275 * fVar174;
          fVar250 = auVar23._24_4_;
          fVar276 = auVar305._24_4_;
          uVar11 = auVar25._28_4_;
          auVar82._24_4_ = fVar276 * fVar250;
          auVar82._28_4_ = uVar11;
          auVar257 = vsubps_avx(auVar82,auVar81);
          fVar202 = auVar201._0_4_;
          fVar308 = auVar201._4_4_;
          auVar83._4_4_ = fVar141 * fVar308;
          auVar83._0_4_ = fVar223 * fVar202;
          fVar165 = auVar201._8_4_;
          auVar83._8_4_ = fVar143 * fVar165;
          fVar224 = auVar201._12_4_;
          auVar83._12_4_ = fVar145 * fVar224;
          fVar164 = auVar201._16_4_;
          auVar83._16_4_ = fVar273 * fVar164;
          fVar238 = auVar201._20_4_;
          auVar83._20_4_ = fVar275 * fVar238;
          fVar227 = auVar201._24_4_;
          auVar83._24_4_ = fVar276 * fVar227;
          auVar83._28_4_ = uVar11;
          fVar217 = auVar233._0_4_;
          fVar295 = auVar233._4_4_;
          auVar84._4_4_ = fVar147 * fVar295;
          auVar84._0_4_ = fVar146 * fVar217;
          fVar309 = auVar233._8_4_;
          auVar84._8_4_ = fVar148 * fVar309;
          fVar169 = auVar233._12_4_;
          auVar84._12_4_ = fVar123 * fVar169;
          fVar166 = auVar233._16_4_;
          auVar84._16_4_ = fVar210 * fVar166;
          fVar244 = auVar233._20_4_;
          auVar84._20_4_ = fVar218 * fVar244;
          fVar226 = auVar233._24_4_;
          auVar84._24_4_ = fVar220 * fVar226;
          auVar84._28_4_ = auVar307._28_4_;
          auVar25 = vsubps_avx(auVar84,auVar83);
          auVar85._4_4_ = fVar293 * fVar295;
          auVar85._0_4_ = fVar209 * fVar217;
          auVar85._8_4_ = fVar149 * fVar309;
          auVar85._12_4_ = fVar277 * fVar169;
          auVar85._16_4_ = fVar151 * fVar166;
          auVar85._20_4_ = fVar174 * fVar244;
          auVar85._24_4_ = fVar250 * fVar226;
          auVar85._28_4_ = uVar11;
          auVar86._4_4_ = fVar308 * fVar272;
          auVar86._0_4_ = fVar202 * fVar193;
          auVar86._8_4_ = fVar165 * fVar208;
          auVar86._12_4_ = fVar224 * fVar249;
          auVar86._16_4_ = fVar164 * fVar150;
          auVar86._20_4_ = fVar238 * fVar172;
          auVar86._24_4_ = fVar227 * fVar248;
          auVar86._28_4_ = auVar26._28_4_;
          auVar26 = vsubps_avx(auVar86,auVar85);
          auVar29 = vsubps_avx(auVar22,auVar140);
          fVar265 = auVar26._28_4_ + auVar25._28_4_;
          auVar290._0_4_ = auVar26._0_4_ + auVar25._0_4_ * 0.0 + auVar257._0_4_ * 0.0;
          auVar290._4_4_ = auVar26._4_4_ + auVar25._4_4_ * 0.0 + auVar257._4_4_ * 0.0;
          auVar290._8_4_ = auVar26._8_4_ + auVar25._8_4_ * 0.0 + auVar257._8_4_ * 0.0;
          auVar290._12_4_ = auVar26._12_4_ + auVar25._12_4_ * 0.0 + auVar257._12_4_ * 0.0;
          auVar290._16_4_ = auVar26._16_4_ + auVar25._16_4_ * 0.0 + auVar257._16_4_ * 0.0;
          auVar290._20_4_ = auVar26._20_4_ + auVar25._20_4_ * 0.0 + auVar257._20_4_ * 0.0;
          auVar290._24_4_ = auVar26._24_4_ + auVar25._24_4_ * 0.0 + auVar257._24_4_ * 0.0;
          auVar290._28_4_ = fVar265 + auVar257._28_4_;
          fVar222 = auVar28._0_4_;
          fVar294 = auVar28._4_4_;
          auVar87._4_4_ = auVar140._4_4_ * fVar294;
          auVar87._0_4_ = auVar140._0_4_ * fVar222;
          fVar247 = auVar28._8_4_;
          auVar87._8_4_ = auVar140._8_4_ * fVar247;
          fVar279 = auVar28._12_4_;
          auVar87._12_4_ = auVar140._12_4_ * fVar279;
          fVar168 = auVar28._16_4_;
          auVar87._16_4_ = auVar140._16_4_ * fVar168;
          fVar245 = auVar28._20_4_;
          auVar87._20_4_ = auVar140._20_4_ * fVar245;
          fVar251 = auVar28._24_4_;
          auVar87._24_4_ = auVar140._24_4_ * fVar251;
          auVar87._28_4_ = fVar265;
          fVar265 = auVar29._0_4_;
          fVar296 = auVar29._4_4_;
          auVar88._4_4_ = auVar323._4_4_ * fVar296;
          auVar88._0_4_ = auVar323._0_4_ * fVar265;
          fVar221 = auVar29._8_4_;
          auVar88._8_4_ = auVar323._8_4_ * fVar221;
          fVar280 = auVar29._12_4_;
          auVar88._12_4_ = auVar323._12_4_ * fVar280;
          fVar170 = auVar29._16_4_;
          auVar88._16_4_ = auVar323._16_4_ * fVar170;
          fVar246 = auVar29._20_4_;
          auVar88._20_4_ = auVar323._20_4_ * fVar246;
          fVar142 = auVar29._24_4_;
          auVar88._24_4_ = auVar323._24_4_ * fVar142;
          auVar88._28_4_ = auVar26._28_4_;
          auVar22 = vsubps_avx(auVar88,auVar87);
          auVar201 = vsubps_avx(auVar201,auVar30);
          fVar271 = auVar201._0_4_;
          fVar297 = auVar201._4_4_;
          auVar89._4_4_ = auVar140._4_4_ * fVar297;
          auVar89._0_4_ = auVar140._0_4_ * fVar271;
          fVar167 = auVar201._8_4_;
          auVar89._8_4_ = auVar140._8_4_ * fVar167;
          fVar225 = auVar201._12_4_;
          auVar89._12_4_ = auVar140._12_4_ * fVar225;
          fVar171 = auVar201._16_4_;
          auVar89._16_4_ = auVar140._16_4_ * fVar171;
          fVar237 = auVar201._20_4_;
          auVar89._20_4_ = auVar140._20_4_ * fVar237;
          fVar144 = auVar201._24_4_;
          auVar89._24_4_ = auVar140._24_4_ * fVar144;
          auVar89._28_4_ = auVar140._28_4_;
          auVar90._4_4_ = fVar296 * auVar30._4_4_;
          auVar90._0_4_ = fVar265 * auVar30._0_4_;
          auVar90._8_4_ = fVar221 * auVar30._8_4_;
          auVar90._12_4_ = fVar280 * auVar30._12_4_;
          auVar90._16_4_ = fVar170 * auVar30._16_4_;
          auVar90._20_4_ = fVar246 * auVar30._20_4_;
          auVar90._24_4_ = fVar142 * auVar30._24_4_;
          auVar90._28_4_ = auVar257._28_4_;
          auVar201 = vsubps_avx(auVar89,auVar90);
          auVar324 = ZEXT1264(ZEXT412(0)) << 0x20;
          auVar91._4_4_ = auVar323._4_4_ * fVar297;
          auVar91._0_4_ = auVar323._0_4_ * fVar271;
          auVar91._8_4_ = auVar323._8_4_ * fVar167;
          auVar91._12_4_ = auVar323._12_4_ * fVar225;
          auVar91._16_4_ = auVar323._16_4_ * fVar171;
          auVar91._20_4_ = auVar323._20_4_ * fVar237;
          auVar91._24_4_ = auVar323._24_4_ * fVar144;
          auVar91._28_4_ = auVar323._28_4_;
          auVar92._4_4_ = fVar294 * auVar30._4_4_;
          auVar92._0_4_ = fVar222 * auVar30._0_4_;
          auVar92._8_4_ = fVar247 * auVar30._8_4_;
          auVar92._12_4_ = fVar279 * auVar30._12_4_;
          auVar92._16_4_ = fVar168 * auVar30._16_4_;
          auVar92._20_4_ = fVar245 * auVar30._20_4_;
          auVar92._24_4_ = fVar251 * auVar30._24_4_;
          auVar92._28_4_ = auVar30._28_4_;
          auVar30 = vsubps_avx(auVar92,auVar91);
          auVar323 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar138._0_4_ = auVar22._0_4_ * 0.0 + auVar30._0_4_ + auVar201._0_4_ * 0.0;
          auVar138._4_4_ = auVar22._4_4_ * 0.0 + auVar30._4_4_ + auVar201._4_4_ * 0.0;
          auVar138._8_4_ = auVar22._8_4_ * 0.0 + auVar30._8_4_ + auVar201._8_4_ * 0.0;
          auVar138._12_4_ = auVar22._12_4_ * 0.0 + auVar30._12_4_ + auVar201._12_4_ * 0.0;
          auVar138._16_4_ = auVar22._16_4_ * 0.0 + auVar30._16_4_ + auVar201._16_4_ * 0.0;
          auVar138._20_4_ = auVar22._20_4_ * 0.0 + auVar30._20_4_ + auVar201._20_4_ * 0.0;
          auVar138._24_4_ = auVar22._24_4_ * 0.0 + auVar30._24_4_ + auVar201._24_4_ * 0.0;
          auVar138._28_4_ = auVar201._28_4_ + auVar30._28_4_ + auVar201._28_4_;
          auVar201 = vmaxps_avx(auVar290,auVar138);
          auVar201 = vcmpps_avx(auVar201,auVar323,2);
          auVar22 = _local_7a0 & auVar201;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar22 >> 0x7f,0) == '\0') &&
                (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar22 >> 0xbf,0) == '\0') &&
              (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar22[0x1f]) {
LAB_007bb6ca:
            auVar292 = auVar29._4_12_;
            auVar163 = ZEXT3264(CONCAT824(local_460[1]._24_8_,
                                          CONCAT816(local_460[1]._16_8_,
                                                    CONCAT88(local_460[1]._8_8_,local_460[1]._0_8_))
                                         ));
          }
          else {
            auVar22 = vandps_avx(auVar201,_local_7a0);
            auVar93._4_4_ = fVar296 * fVar272;
            auVar93._0_4_ = fVar265 * fVar193;
            auVar93._8_4_ = fVar221 * fVar208;
            auVar93._12_4_ = fVar280 * fVar249;
            auVar93._16_4_ = fVar170 * fVar150;
            auVar93._20_4_ = fVar246 * fVar172;
            auVar93._24_4_ = fVar142 * fVar248;
            auVar93._28_4_ = local_7a0._28_4_;
            auVar94._4_4_ = fVar294 * fVar141;
            auVar94._0_4_ = fVar222 * fVar223;
            auVar94._8_4_ = fVar247 * fVar143;
            auVar94._12_4_ = fVar279 * fVar145;
            auVar94._16_4_ = fVar168 * fVar273;
            auVar94._20_4_ = fVar245 * fVar275;
            auVar94._24_4_ = fVar251 * fVar276;
            auVar94._28_4_ = auVar201._28_4_;
            auVar30 = vsubps_avx(auVar94,auVar93);
            auVar95._4_4_ = fVar297 * fVar141;
            auVar95._0_4_ = fVar271 * fVar223;
            auVar95._8_4_ = fVar167 * fVar143;
            auVar95._12_4_ = fVar225 * fVar145;
            auVar95._16_4_ = fVar171 * fVar273;
            auVar95._20_4_ = fVar237 * fVar275;
            auVar95._24_4_ = fVar144 * fVar276;
            auVar95._28_4_ = auVar305._28_4_;
            auVar96._4_4_ = fVar296 * fVar295;
            auVar96._0_4_ = fVar265 * fVar217;
            auVar96._8_4_ = fVar221 * fVar309;
            auVar96._12_4_ = fVar280 * fVar169;
            auVar96._16_4_ = fVar170 * fVar166;
            auVar96._20_4_ = fVar246 * fVar244;
            auVar96._24_4_ = fVar142 * fVar226;
            auVar96._28_4_ = auVar29._28_4_;
            auVar140 = vsubps_avx(auVar96,auVar95);
            auVar97._4_4_ = fVar294 * fVar295;
            auVar97._0_4_ = fVar222 * fVar217;
            auVar97._8_4_ = fVar247 * fVar309;
            auVar97._12_4_ = fVar279 * fVar169;
            auVar97._16_4_ = fVar168 * fVar166;
            auVar97._20_4_ = fVar245 * fVar244;
            auVar97._24_4_ = fVar251 * fVar226;
            auVar97._28_4_ = auVar233._28_4_;
            auVar98._4_4_ = fVar297 * fVar272;
            auVar98._0_4_ = fVar271 * fVar193;
            auVar98._8_4_ = fVar167 * fVar208;
            auVar98._12_4_ = fVar225 * fVar249;
            auVar98._16_4_ = fVar171 * fVar150;
            auVar98._20_4_ = fVar237 * fVar172;
            auVar98._24_4_ = fVar144 * fVar248;
            auVar98._28_4_ = auVar27._28_4_;
            auVar257 = vsubps_avx(auVar98,auVar97);
            auVar269._0_4_ = auVar30._0_4_ * 0.0 + auVar257._0_4_ + auVar140._0_4_ * 0.0;
            auVar269._4_4_ = auVar30._4_4_ * 0.0 + auVar257._4_4_ + auVar140._4_4_ * 0.0;
            auVar269._8_4_ = auVar30._8_4_ * 0.0 + auVar257._8_4_ + auVar140._8_4_ * 0.0;
            auVar269._12_4_ = auVar30._12_4_ * 0.0 + auVar257._12_4_ + auVar140._12_4_ * 0.0;
            auVar269._16_4_ = auVar30._16_4_ * 0.0 + auVar257._16_4_ + auVar140._16_4_ * 0.0;
            auVar269._20_4_ = auVar30._20_4_ * 0.0 + auVar257._20_4_ + auVar140._20_4_ * 0.0;
            auVar269._24_4_ = auVar30._24_4_ * 0.0 + auVar257._24_4_ + auVar140._24_4_ * 0.0;
            auVar269._28_4_ = auVar28._28_4_ + auVar257._28_4_ + auVar233._28_4_;
            auVar201 = vrcpps_avx(auVar269);
            fVar217 = auVar201._0_4_;
            fVar222 = auVar201._4_4_;
            auVar99._4_4_ = auVar269._4_4_ * fVar222;
            auVar99._0_4_ = auVar269._0_4_ * fVar217;
            fVar265 = auVar201._8_4_;
            auVar99._8_4_ = auVar269._8_4_ * fVar265;
            fVar271 = auVar201._12_4_;
            auVar99._12_4_ = auVar269._12_4_ * fVar271;
            fVar193 = auVar201._16_4_;
            auVar99._16_4_ = auVar269._16_4_ * fVar193;
            fVar272 = auVar201._20_4_;
            auVar99._20_4_ = auVar269._20_4_ * fVar272;
            fVar295 = auVar201._24_4_;
            auVar99._24_4_ = auVar269._24_4_ * fVar295;
            auVar99._28_4_ = auVar29._28_4_;
            auVar302._8_4_ = 0x3f800000;
            auVar302._0_8_ = 0x3f8000003f800000;
            auVar302._12_4_ = 0x3f800000;
            auVar302._16_4_ = 0x3f800000;
            auVar302._20_4_ = 0x3f800000;
            auVar302._24_4_ = 0x3f800000;
            auVar302._28_4_ = 0x3f800000;
            auVar201 = vsubps_avx(auVar302,auVar99);
            auVar291._0_4_ = auVar201._0_4_ * fVar217;
            auVar291._4_4_ = auVar201._4_4_ * fVar222;
            auVar291._8_4_ = auVar201._8_4_ * fVar265;
            auVar291._12_4_ = auVar201._12_4_ * fVar271;
            fVar294 = auVar201._16_4_ * fVar193;
            auVar29._16_4_ = fVar294;
            auVar29._0_16_ = auVar291;
            fVar296 = auVar201._20_4_ * fVar272;
            auVar29._20_4_ = fVar296;
            fVar297 = auVar201._24_4_ * fVar295;
            auVar29._24_4_ = fVar297;
            auVar29._28_4_ = auVar201._28_4_;
            auVar292 = auVar291._4_12_;
            fVar217 = auVar291._0_4_ + fVar217;
            fVar222 = auVar291._4_4_ + fVar222;
            fVar265 = auVar291._8_4_ + fVar265;
            fVar271 = auVar291._12_4_ + fVar271;
            fVar294 = fVar294 + fVar193;
            fVar296 = fVar296 + fVar272;
            fVar297 = fVar297 + fVar295;
            auVar100._4_4_ =
                 (fVar308 * auVar30._4_4_ + auVar140._4_4_ * fVar293 + fVar147 * auVar257._4_4_) *
                 fVar222;
            auVar100._0_4_ =
                 (fVar202 * auVar30._0_4_ + auVar140._0_4_ * fVar209 + fVar146 * auVar257._0_4_) *
                 fVar217;
            auVar100._8_4_ =
                 (fVar165 * auVar30._8_4_ + auVar140._8_4_ * fVar149 + fVar148 * auVar257._8_4_) *
                 fVar265;
            auVar100._12_4_ =
                 (fVar224 * auVar30._12_4_ + auVar140._12_4_ * fVar277 + fVar123 * auVar257._12_4_)
                 * fVar271;
            auVar100._16_4_ =
                 (fVar164 * auVar30._16_4_ + auVar140._16_4_ * fVar151 + fVar210 * auVar257._16_4_)
                 * fVar294;
            auVar100._20_4_ =
                 (fVar238 * auVar30._20_4_ + auVar140._20_4_ * fVar174 + fVar218 * auVar257._20_4_)
                 * fVar296;
            auVar100._24_4_ =
                 (fVar227 * auVar30._24_4_ + auVar140._24_4_ * fVar250 + fVar220 * auVar257._24_4_)
                 * fVar297;
            auVar100._28_4_ = auVar23._28_4_ + auVar257._28_4_;
            fVar193 = (ray->super_RayK<1>).tfar;
            auVar200._4_4_ = fVar193;
            auVar200._0_4_ = fVar193;
            auVar200._8_4_ = fVar193;
            auVar200._12_4_ = fVar193;
            auVar200._16_4_ = fVar193;
            auVar200._20_4_ = fVar193;
            auVar200._24_4_ = fVar193;
            auVar200._28_4_ = fVar193;
            auVar108._4_4_ = fStack_2fc;
            auVar108._0_4_ = local_300;
            auVar108._8_4_ = fStack_2f8;
            auVar108._12_4_ = fStack_2f4;
            auVar108._16_4_ = fStack_2f0;
            auVar108._20_4_ = fStack_2ec;
            auVar108._24_4_ = fStack_2e8;
            auVar108._28_4_ = uStack_2e4;
            auVar23 = vcmpps_avx(auVar108,auVar100,2);
            auVar201 = vcmpps_avx(auVar100,auVar200,2);
            auVar201 = vandps_avx(auVar23,auVar201);
            auVar30 = auVar22 & auVar201;
            if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar30 >> 0x7f,0) == '\0') &&
                  (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar30 >> 0xbf,0) == '\0') &&
                (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar30[0x1f]) goto LAB_007bb6ca;
            auVar201 = vandps_avx(auVar22,auVar201);
            auVar22 = vcmpps_avx(auVar269,auVar323,4);
            auVar30 = auVar201 & auVar22;
            auVar163 = ZEXT3264(CONCAT824(local_460[1]._24_8_,
                                          CONCAT816(local_460[1]._16_8_,
                                                    CONCAT88(local_460[1]._8_8_,local_460[1]._0_8_))
                                         ));
            if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0x7f,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0xbf,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar30[0x1f] < '\0') {
              auVar201 = vandps_avx(auVar22,auVar201);
              auVar163 = ZEXT3264(auVar201);
              auVar101._4_4_ = auVar290._4_4_ * fVar222;
              auVar101._0_4_ = auVar290._0_4_ * fVar217;
              auVar101._8_4_ = auVar290._8_4_ * fVar265;
              auVar101._12_4_ = auVar290._12_4_ * fVar271;
              auVar101._16_4_ = auVar290._16_4_ * fVar294;
              auVar101._20_4_ = auVar290._20_4_ * fVar296;
              auVar101._24_4_ = auVar290._24_4_ * fVar297;
              auVar101._28_4_ = auVar23._28_4_;
              auVar102._4_4_ = auVar138._4_4_ * fVar222;
              auVar102._0_4_ = auVar138._0_4_ * fVar217;
              auVar102._8_4_ = auVar138._8_4_ * fVar265;
              auVar102._12_4_ = auVar138._12_4_ * fVar271;
              auVar102._16_4_ = auVar138._16_4_ * fVar294;
              auVar102._20_4_ = auVar138._20_4_ * fVar296;
              auVar102._24_4_ = auVar138._24_4_ * fVar297;
              auVar102._28_4_ = auVar138._28_4_;
              auVar243._8_4_ = 0x3f800000;
              auVar243._0_8_ = 0x3f8000003f800000;
              auVar243._12_4_ = 0x3f800000;
              auVar243._16_4_ = 0x3f800000;
              auVar243._20_4_ = 0x3f800000;
              auVar243._24_4_ = 0x3f800000;
              auVar243._28_4_ = 0x3f800000;
              auVar201 = vsubps_avx(auVar243,auVar101);
              local_420 = vblendvps_avx(auVar201,auVar101,auVar19);
              auVar201 = vsubps_avx(auVar243,auVar102);
              _local_380 = vblendvps_avx(auVar201,auVar102,auVar19);
              local_360 = auVar100;
            }
          }
          auVar285 = ZEXT3264(local_680);
          auVar270 = ZEXT3264(local_6e0);
          auVar201 = auVar163._0_32_;
          auVar260 = ZEXT3264(_local_640);
          auVar314 = ZEXT3264(_local_620);
          if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar201 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar201 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar201 >> 0x7f,0) == '\0') &&
                (auVar163 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar201 >> 0xbf,0) == '\0') &&
              (auVar163 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar163[0x1f]) {
            auVar163 = ZEXT3264(local_420);
            goto LAB_007bb40e;
          }
          auVar23 = vsubps_avx(auVar189,_local_780);
          fVar209 = (float)local_780._0_4_ + auVar23._0_4_ * local_420._0_4_;
          fVar202 = (float)local_780._4_4_ + auVar23._4_4_ * local_420._4_4_;
          fVar217 = fStack_778 + auVar23._8_4_ * local_420._8_4_;
          fVar222 = fStack_774 + auVar23._12_4_ * local_420._12_4_;
          fVar265 = fStack_770 + auVar23._16_4_ * local_420._16_4_;
          fVar271 = fStack_76c + auVar23._20_4_ * local_420._20_4_;
          fVar272 = fStack_768 + auVar23._24_4_ * local_420._24_4_;
          fVar293 = fStack_764 + auVar23._28_4_;
          fVar193 = pre->depth_scale;
          auVar103._4_4_ = (fVar202 + fVar202) * fVar193;
          auVar103._0_4_ = (fVar209 + fVar209) * fVar193;
          auVar103._8_4_ = (fVar217 + fVar217) * fVar193;
          auVar103._12_4_ = (fVar222 + fVar222) * fVar193;
          auVar103._16_4_ = (fVar265 + fVar265) * fVar193;
          auVar103._20_4_ = (fVar271 + fVar271) * fVar193;
          auVar103._24_4_ = (fVar272 + fVar272) * fVar193;
          auVar103._28_4_ = fVar293 + fVar293;
          auVar23 = vcmpps_avx(local_360,auVar103,6);
          auVar22 = auVar201 & auVar23;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar22 >> 0x7f,0) == '\0') &&
                (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar22 >> 0xbf,0) == '\0') &&
              (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar22[0x1f]) {
            auVar163 = ZEXT3264(local_420);
            goto LAB_007bb40e;
          }
          local_380._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
          local_380._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
          uStack_378._0_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
          uStack_378._4_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
          uStack_370._0_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
          uStack_370._4_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
          uStack_368._0_4_ = (float)uStack_368 + (float)uStack_368 + -1.0;
          uStack_368._4_4_ = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
          local_260 = local_420;
          auVar113 = _local_380;
          auVar22 = _local_380;
          local_240 = (float)local_380._0_4_;
          fStack_23c = (float)local_380._4_4_;
          fStack_238 = (float)uStack_378;
          fStack_234 = uStack_378._4_4_;
          fStack_230 = (float)uStack_370;
          fStack_22c = uStack_370._4_4_;
          fStack_228 = (float)uStack_368;
          fStack_224 = uStack_368._4_4_;
          local_220 = local_360;
          local_1fc = uVar16;
          local_1f0 = CONCAT44(fStack_7ac,local_7b0);
          uStack_1e8 = CONCAT44(fStack_7a4,fStack_7a8);
          local_1e0 = local_690;
          uStack_1d8 = uStack_688;
          local_1d0 = local_6a0;
          uStack_1c8 = uStack_698;
          local_1c0 = local_6b0;
          uStack_1b8 = uStack_6a8;
          pGVar17 = (context->scene->geometries).items[local_7c0].ptr;
          local_780 = (undefined1  [8])pGVar17;
          if ((pGVar17->mask & (ray->super_RayK<1>).mask) != 0) {
            auVar201 = vandps_avx(auVar23,auVar201);
            local_460[0] = auVar201;
            auVar182._0_4_ = (float)(int)local_200;
            auVar182._4_12_ = auVar292;
            auVar232 = vshufps_avx(auVar182,auVar182,0);
            local_180[0] = (auVar232._0_4_ + local_420._0_4_ + 0.0) * (float)local_320._0_4_;
            local_180[1] = (auVar232._4_4_ + local_420._4_4_ + 1.0) * (float)local_320._4_4_;
            local_180[2] = (auVar232._8_4_ + local_420._8_4_ + 2.0) * fStack_318;
            local_180[3] = (auVar232._12_4_ + local_420._12_4_ + 3.0) * fStack_314;
            fStack_170 = (auVar232._0_4_ + local_420._16_4_ + 4.0) * fStack_310;
            fStack_16c = (auVar232._4_4_ + local_420._20_4_ + 5.0) * fStack_30c;
            fStack_168 = (auVar232._8_4_ + local_420._24_4_ + 6.0) * fStack_308;
            fStack_164 = auVar232._12_4_ + local_420._28_4_ + 7.0;
            uStack_370 = auVar113._16_8_;
            uStack_368 = auVar22._24_8_;
            local_160 = local_380;
            uStack_158 = uStack_378;
            uStack_150 = uStack_370;
            uStack_148 = uStack_368;
            local_140 = local_360;
            auVar160._8_4_ = 0x7f800000;
            auVar160._0_8_ = 0x7f8000007f800000;
            auVar160._12_4_ = 0x7f800000;
            auVar160._16_4_ = 0x7f800000;
            auVar160._20_4_ = 0x7f800000;
            auVar160._24_4_ = 0x7f800000;
            auVar160._28_4_ = 0x7f800000;
            auVar23 = vblendvps_avx(auVar160,local_360,auVar201);
            auVar30 = vshufps_avx(auVar23,auVar23,0xb1);
            auVar30 = vminps_avx(auVar23,auVar30);
            auVar323 = vshufpd_avx(auVar30,auVar30,5);
            auVar30 = vminps_avx(auVar30,auVar323);
            auVar323 = vperm2f128_avx(auVar30,auVar30,1);
            auVar30 = vminps_avx(auVar30,auVar323);
            auVar23 = vcmpps_avx(auVar23,auVar30,0);
            auVar30 = auVar201 & auVar23;
            if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0x7f,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0xbf,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar30[0x1f] < '\0') {
              auVar201 = vandps_avx(auVar23,auVar201);
            }
            uVar116 = vmovmskps_avx(auVar201);
            uVar15 = 0;
            if (uVar116 != 0) {
              for (; (uVar116 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar118 = (ulong)uVar15;
            _local_380 = auVar22;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_5a0._8_24_ = auVar235._8_24_;
              local_520._0_8_ = pPVar119;
              local_720._8_24_ = auVar189._8_24_;
              _local_7a0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
              local_5b0 = ray;
              do {
                local_5d4 = local_180[uVar118];
                local_5d0 = *(undefined4 *)((long)&local_160 + uVar118 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar118 * 4);
                local_750.context = context->user;
                fVar209 = 1.0 - local_5d4;
                fVar193 = local_5d4 * fVar209 * 4.0;
                auVar232 = ZEXT416((uint)(local_5d4 * local_5d4 * 0.5));
                auVar232 = vshufps_avx(auVar232,auVar232,0);
                auVar183 = ZEXT416((uint)((fVar209 * fVar209 + fVar193) * 0.5));
                auVar183 = vshufps_avx(auVar183,auVar183,0);
                auVar213 = ZEXT416((uint)((-local_5d4 * local_5d4 - fVar193) * 0.5));
                auVar213 = vshufps_avx(auVar213,auVar213,0);
                auVar198 = ZEXT416((uint)(fVar209 * -fVar209 * 0.5));
                auVar198 = vshufps_avx(auVar198,auVar198,0);
                auVar185._0_4_ =
                     auVar198._0_4_ * local_7b0 +
                     auVar213._0_4_ * (float)local_690._0_4_ +
                     auVar232._0_4_ * (float)local_6b0._0_4_ +
                     auVar183._0_4_ * (float)local_6a0._0_4_;
                auVar185._4_4_ =
                     auVar198._4_4_ * fStack_7ac +
                     auVar213._4_4_ * (float)local_690._4_4_ +
                     auVar232._4_4_ * (float)local_6b0._4_4_ +
                     auVar183._4_4_ * (float)local_6a0._4_4_;
                auVar185._8_4_ =
                     auVar198._8_4_ * fStack_7a8 +
                     auVar213._8_4_ * (float)uStack_688 +
                     auVar232._8_4_ * (float)uStack_6a8 + auVar183._8_4_ * (float)uStack_698;
                auVar185._12_4_ =
                     auVar198._12_4_ * fStack_7a4 +
                     auVar213._12_4_ * uStack_688._4_4_ +
                     auVar232._12_4_ * uStack_6a8._4_4_ + auVar183._12_4_ * uStack_698._4_4_;
                local_5e0 = vmovlps_avx(auVar185);
                local_5d8 = vextractps_avx(auVar185,2);
                local_5cc = uVar114;
                local_5c8 = (int)local_7c0;
                local_5c4 = (local_750.context)->instID[0];
                local_5c0 = (local_750.context)->instPrimID[0];
                local_7c4 = -1;
                local_750.valid = &local_7c4;
                local_750.geometryUserPtr = *(void **)((long)local_780 + 0x18);
                local_750.ray = (RTCRayN *)ray;
                local_750.hit = (RTCHitN *)&local_5e0;
                local_750.N = 1;
                if (*(code **)((long)local_780 + 0x40) == (code *)0x0) {
LAB_007bb8c0:
                  p_Var18 = context->args->filter;
                  if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)((long)local_780 + 0x3e) & 0x40) != 0)))) {
                    auVar324 = ZEXT1664(auVar324._0_16_);
                    (*p_Var18)(&local_750);
                    ray = local_5b0;
                    if (*local_750.valid == 0) goto LAB_007bb95a;
                  }
                  (((Vec3f *)((long)local_750.ray + 0x30))->field_0).components[0] =
                       *(float *)local_750.hit;
                  (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_750.hit + 4);
                  (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_750.hit + 8);
                  *(float *)((long)local_750.ray + 0x3c) = *(float *)(local_750.hit + 0xc);
                  *(float *)((long)local_750.ray + 0x40) = *(float *)(local_750.hit + 0x10);
                  *(float *)((long)local_750.ray + 0x44) = *(float *)(local_750.hit + 0x14);
                  *(float *)((long)local_750.ray + 0x48) = *(float *)(local_750.hit + 0x18);
                  *(float *)((long)local_750.ray + 0x4c) = *(float *)(local_750.hit + 0x1c);
                  *(float *)((long)local_750.ray + 0x50) = *(float *)(local_750.hit + 0x20);
                }
                else {
                  auVar324 = ZEXT1664(auVar324._0_16_);
                  (**(code **)((long)local_780 + 0x40))(&local_750);
                  ray = local_5b0;
                  if (*local_750.valid != 0) goto LAB_007bb8c0;
LAB_007bb95a:
                  (local_5b0->super_RayK<1>).tfar = (float)local_7a0._0_4_;
                  ray = local_5b0;
                }
                *(undefined4 *)(local_460[0] + uVar118 * 4) = 0;
                auVar22 = local_460[0];
                fVar193 = (ray->super_RayK<1>).tfar;
                auVar139._4_4_ = fVar193;
                auVar139._0_4_ = fVar193;
                auVar139._8_4_ = fVar193;
                auVar139._12_4_ = fVar193;
                auVar139._16_4_ = fVar193;
                auVar139._20_4_ = fVar193;
                auVar139._24_4_ = fVar193;
                auVar139._28_4_ = fVar193;
                auVar23 = vcmpps_avx(local_360,auVar139,2);
                auVar201 = vandps_avx(auVar23,local_460[0]);
                local_460[0] = auVar201;
                auVar22 = auVar22 & auVar23;
                if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar22 >> 0x7f,0) == '\0') &&
                      (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar22 >> 0xbf,0) == '\0') &&
                    (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar22[0x1f]) goto LAB_007bb9f3;
                auVar161._8_4_ = 0x7f800000;
                auVar161._0_8_ = 0x7f8000007f800000;
                auVar161._12_4_ = 0x7f800000;
                auVar161._16_4_ = 0x7f800000;
                auVar161._20_4_ = 0x7f800000;
                auVar161._24_4_ = 0x7f800000;
                auVar161._28_4_ = 0x7f800000;
                auVar23 = vblendvps_avx(auVar161,local_360,auVar201);
                auVar22 = vshufps_avx(auVar23,auVar23,0xb1);
                auVar22 = vminps_avx(auVar23,auVar22);
                auVar30 = vshufpd_avx(auVar22,auVar22,5);
                auVar22 = vminps_avx(auVar22,auVar30);
                auVar30 = vperm2f128_avx(auVar22,auVar22,1);
                auVar22 = vminps_avx(auVar22,auVar30);
                auVar23 = vcmpps_avx(auVar23,auVar22,0);
                auVar22 = auVar201 & auVar23;
                if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar22 >> 0x7f,0) != '\0') ||
                      (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0xbf,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar22[0x1f] < '\0') {
                  auVar201 = vandps_avx(auVar23,auVar201);
                }
                _local_7a0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                uVar116 = vmovmskps_avx(auVar201);
                uVar15 = 0;
                if (uVar116 != 0) {
                  for (; (uVar116 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                uVar118 = (ulong)uVar15;
              } while( true );
            }
            fVar193 = local_180[uVar118];
            fVar209 = *(float *)((long)&local_160 + uVar118 * 4);
            fVar217 = 1.0 - fVar193;
            fVar202 = fVar193 * fVar217 * 4.0;
            auVar232 = ZEXT416((uint)(fVar193 * fVar193 * 0.5));
            auVar232 = vshufps_avx(auVar232,auVar232,0);
            auVar183 = ZEXT416((uint)((fVar217 * fVar217 + fVar202) * 0.5));
            auVar183 = vshufps_avx(auVar183,auVar183,0);
            auVar213 = ZEXT416((uint)((-fVar193 * fVar193 - fVar202) * 0.5));
            auVar213 = vshufps_avx(auVar213,auVar213,0);
            auVar198 = ZEXT416((uint)(fVar217 * -fVar217 * 0.5));
            auVar198 = vshufps_avx(auVar198,auVar198,0);
            auVar184._0_4_ =
                 auVar198._0_4_ * local_7b0 +
                 auVar213._0_4_ * (float)local_690._0_4_ +
                 auVar232._0_4_ * (float)local_6b0._0_4_ + auVar183._0_4_ * (float)local_6a0._0_4_;
            auVar184._4_4_ =
                 auVar198._4_4_ * fStack_7ac +
                 auVar213._4_4_ * (float)local_690._4_4_ +
                 auVar232._4_4_ * (float)local_6b0._4_4_ + auVar183._4_4_ * (float)local_6a0._4_4_;
            auVar184._8_4_ =
                 auVar198._8_4_ * fStack_7a8 +
                 auVar213._8_4_ * (float)uStack_688 +
                 auVar232._8_4_ * (float)uStack_6a8 + auVar183._8_4_ * (float)uStack_698;
            auVar184._12_4_ =
                 auVar198._12_4_ * fStack_7a4 +
                 auVar213._12_4_ * uStack_688._4_4_ +
                 auVar232._12_4_ * uStack_6a8._4_4_ + auVar183._12_4_ * uStack_698._4_4_;
            (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar118 * 4);
            uVar12 = vmovlps_avx(auVar184);
            *(undefined8 *)&(ray->Ng).field_0 = uVar12;
            fVar202 = (float)vextractps_avx(auVar184,2);
            (ray->Ng).field_0.field_0.z = fVar202;
            ray->u = fVar193;
            ray->v = fVar209;
            ray->primID = uVar114;
            ray->geomID = (uint)local_7c0;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            goto LAB_007bb6aa;
          }
          goto LAB_007bb6bc;
        }
        auVar163 = ZEXT3264(auVar163._0_32_);
LAB_007bb40e:
        auVar285 = ZEXT3264(local_680);
        auVar270 = ZEXT3264(local_6e0);
        auVar314 = ZEXT3264(_local_620);
        auVar260 = ZEXT3264(_local_640);
        fVar151 = (float)local_600._0_4_;
        fVar164 = (float)local_600._4_4_;
        fVar166 = fStack_5f8;
        fVar168 = fStack_5f4;
        fVar193 = fStack_5f0;
        fVar209 = fStack_5ec;
        fVar202 = fStack_5e8;
        fVar217 = fStack_5e4;
        goto LAB_007bb417;
      }
    }
    fVar193 = (ray->super_RayK<1>).tfar;
    auVar127._4_4_ = fVar193;
    auVar127._0_4_ = fVar193;
    auVar127._8_4_ = fVar193;
    auVar127._12_4_ = fVar193;
    auVar232 = vcmpps_avx(local_270,auVar127,2);
    uVar114 = vmovmskps_avx(auVar232);
    uVar114 = (uint)uVar121 & uVar114;
  } while( true );
LAB_007bb9f3:
  auVar270 = ZEXT3264(local_6e0);
  auVar285 = ZEXT3264(local_680);
  auVar260 = ZEXT3264(_local_640);
  auVar314 = ZEXT3264(_local_620);
  pre = local_758;
  pPVar119 = (Primitive *)local_520._0_8_;
  fVar194 = (float)local_700._0_4_;
  fVar203 = (float)local_700._4_4_;
  fVar205 = fStack_6f8;
  fVar207 = fStack_6f4;
  fVar274 = fStack_6f0;
  fVar310 = fStack_6ec;
  fVar311 = fStack_6e8;
LAB_007bb6aa:
  fVar175 = (float)local_660._0_4_;
  fVar190 = (float)local_660._4_4_;
  fVar191 = fStack_658;
  fVar192 = fStack_654;
  fVar204 = fStack_650;
  fVar219 = fStack_64c;
  fVar206 = fStack_648;
LAB_007bb6bc:
  auVar163 = ZEXT3264(local_420);
  fVar151 = (float)local_600._0_4_;
  fVar164 = (float)local_600._4_4_;
  fVar166 = fStack_5f8;
  fVar168 = fStack_5f4;
  fVar193 = fStack_5f0;
  fVar209 = fStack_5ec;
  fVar202 = fStack_5e8;
  fVar217 = fStack_5e4;
LAB_007bb417:
  lVar122 = lVar122 + 8;
  lVar117 = local_5a0._0_8_;
  prim = (Primitive *)local_720._0_8_;
  fVar170 = (float)local_500._0_4_;
  fVar171 = (float)local_500._4_4_;
  fVar172 = fStack_4f8;
  fVar174 = fStack_4f4;
  fVar222 = fStack_4f0;
  fVar265 = fStack_4ec;
  fVar271 = fStack_4e8;
  fVar272 = fStack_4e4;
  goto LAB_007bab02;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }